

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall
embree::SceneGraphFlattener::convertGeometries
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node,Transformations *spaces)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float fVar6;
  undefined8 uVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  Node *pNVar11;
  size_t sVar12;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar13;
  long lVar14;
  Ref<embree::SceneGraph::Node> *pRVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  byte bVar57;
  undefined4 uVar58;
  long *plVar59;
  ostream *poVar60;
  undefined8 uVar61;
  ulong uVar62;
  TriangleMeshNode *pTVar63;
  BBox1f BVar64;
  QuadMeshNode *pQVar65;
  GridMeshNode *pGVar66;
  SubdivMeshNode *pSVar67;
  HairSetNode *pHVar68;
  PointSetNode *pPVar69;
  runtime_error *prVar70;
  byte bVar72;
  undefined8 extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  ulong extraout_RDX_16;
  ulong extraout_RDX_17;
  ulong extraout_RDX_18;
  ulong extraout_RDX_19;
  ulong extraout_RDX_20;
  ulong extraout_RDX_21;
  ulong extraout_RDX_22;
  size_t i_3;
  Ref<embree::SceneGraph::Node> *node_00;
  size_t i;
  ulong uVar73;
  ulong uVar74;
  long lVar75;
  undefined8 *puVar76;
  uint uVar77;
  int iVar78;
  uint uVar79;
  int iVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined4 uVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar142 [16];
  float local_198;
  float local_188;
  float fStack_184;
  undefined1 local_178 [16];
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> local_168;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  float fStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  SceneGraphFlattener *local_80;
  Ref<embree::SceneGraph::PointSetNode> local_78;
  Ref<embree::SceneGraph::HairSetNode> local_70;
  Ref<embree::SceneGraph::SubdivMeshNode> local_68;
  Ref<embree::SceneGraph::GridMeshNode> local_60;
  Ref<embree::SceneGraph::QuadMeshNode> local_58;
  Ref<embree::SceneGraph::TriangleMeshNode> local_50;
  long *local_48;
  Ref<embree::SceneGraph::Node> *local_40;
  ulong local_38;
  undefined7 uVar71;
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  
  pNVar11 = node->ptr;
  if (pNVar11 != (Node *)0x0) {
    local_168.p.field_0._8_8_ = group;
    local_80 = this;
    plVar59 = (long *)__dynamic_cast(pNVar11,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::TransformNode::typeinfo,0);
    if (plVar59 == (long *)0x0) {
      plVar59 = (long *)__dynamic_cast(pNVar11,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::MultiTransformNode::typeinfo,0);
      if (plVar59 == (long *)0x0) {
        plVar59 = (long *)__dynamic_cast(pNVar11,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::GroupNode::typeinfo,0);
        if (plVar59 == (long *)0x0) {
          pTVar63 = (TriangleMeshNode *)
                    __dynamic_cast(pNVar11,&SceneGraph::Node::typeinfo,
                                   &SceneGraph::TriangleMeshNode::typeinfo,0);
          if (pTVar63 == (TriangleMeshNode *)0x0) {
            pQVar65 = (QuadMeshNode *)
                      __dynamic_cast(pNVar11,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::QuadMeshNode::typeinfo,0);
            if (pQVar65 == (QuadMeshNode *)0x0) {
              pGVar66 = (GridMeshNode *)
                        __dynamic_cast(pNVar11,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::GridMeshNode::typeinfo,0);
              if (pGVar66 == (GridMeshNode *)0x0) {
                pSVar67 = (SubdivMeshNode *)
                          __dynamic_cast(pNVar11,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::SubdivMeshNode::typeinfo,0);
                if (pSVar67 == (SubdivMeshNode *)0x0) {
                  pHVar68 = (HairSetNode *)
                            __dynamic_cast(pNVar11,&SceneGraph::Node::typeinfo,
                                           &SceneGraph::HairSetNode::typeinfo,0);
                  if (pHVar68 == (HairSetNode *)0x0) {
                    pPVar69 = (PointSetNode *)
                              __dynamic_cast(pNVar11,&SceneGraph::Node::typeinfo,
                                             &SceneGraph::PointSetNode::typeinfo,0);
                    if (pPVar69 != (PointSetNode *)0x0) {
                      (*(pPVar69->super_Node).super_RefCount._vptr_RefCount[2])(pPVar69);
                      BVar64 = (BBox1f)::operator_new(0xb0);
                      local_78.ptr = pPVar69;
                      (*(pPVar69->super_Node).super_RefCount._vptr_RefCount[2])(pPVar69);
                      SceneGraph::PointSetNode::PointSetNode
                                ((PointSetNode *)BVar64,&local_78,spaces);
                      local_178._0_8_ = BVar64;
                      (**(code **)(*(long *)BVar64 + 0x10))(BVar64);
                      std::
                      vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                      ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                                ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                                  *)local_168.p.field_0._8_8_,
                                 (Ref<embree::SceneGraph::Node> *)local_178);
                      if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
                        (**(code **)(*(long *)local_178._0_8_ + 0x18))();
                      }
                      if (local_78.ptr != (PointSetNode *)0x0) {
                        (*((local_78.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
                      }
                      (*(pPVar69->super_Node).super_RefCount._vptr_RefCount[3])(pPVar69);
                    }
                  }
                  else {
                    (*(pHVar68->super_Node).super_RefCount._vptr_RefCount[2])(pHVar68);
                    BVar64 = (BBox1f)::operator_new(0x118);
                    local_70.ptr = pHVar68;
                    (*(pHVar68->super_Node).super_RefCount._vptr_RefCount[2])(pHVar68);
                    SceneGraph::HairSetNode::HairSetNode((HairSetNode *)BVar64,&local_70,spaces);
                    local_178._0_8_ = BVar64;
                    (**(code **)(*(long *)BVar64 + 0x10))(BVar64);
                    std::
                    vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                    ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                              ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                                *)local_168.p.field_0._8_8_,
                               (Ref<embree::SceneGraph::Node> *)local_178);
                    if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
                      (**(code **)(*(long *)local_178._0_8_ + 0x18))();
                    }
                    if (local_70.ptr != (HairSetNode *)0x0) {
                      (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
                    }
                    (*(pHVar68->super_Node).super_RefCount._vptr_RefCount[3])(pHVar68);
                  }
                }
                else {
                  (*(pSVar67->super_Node).super_RefCount._vptr_RefCount[2])(pSVar67);
                  BVar64 = (BBox1f)::operator_new(0x1b0);
                  local_68.ptr = pSVar67;
                  (*(pSVar67->super_Node).super_RefCount._vptr_RefCount[2])(pSVar67);
                  SceneGraph::SubdivMeshNode::SubdivMeshNode
                            ((SubdivMeshNode *)BVar64,&local_68,spaces);
                  local_178._0_8_ = BVar64;
                  (**(code **)(*(long *)BVar64 + 0x10))(BVar64);
                  std::
                  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                  ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                            ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                              *)local_168.p.field_0._8_8_,(Ref<embree::SceneGraph::Node> *)local_178
                            );
                  if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
                    (**(code **)(*(long *)local_178._0_8_ + 0x18))();
                  }
                  if (local_68.ptr != (SubdivMeshNode *)0x0) {
                    (*((local_68.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
                  }
                  (*(pSVar67->super_Node).super_RefCount._vptr_RefCount[3])(pSVar67);
                }
              }
              else {
                (*(pGVar66->super_Node).super_RefCount._vptr_RefCount[2])(pGVar66);
                BVar64 = (BBox1f)::operator_new(0xa8);
                local_60.ptr = pGVar66;
                (*(pGVar66->super_Node).super_RefCount._vptr_RefCount[2])(pGVar66);
                SceneGraph::GridMeshNode::GridMeshNode((GridMeshNode *)BVar64,&local_60,spaces);
                local_178._0_8_ = BVar64;
                (**(code **)(*(long *)BVar64 + 0x10))(BVar64);
                std::
                vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                          ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                            *)local_168.p.field_0._8_8_,(Ref<embree::SceneGraph::Node> *)local_178);
                if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
                  (**(code **)(*(long *)local_178._0_8_ + 0x18))();
                }
                if (local_60.ptr != (GridMeshNode *)0x0) {
                  (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
                }
                (*(pGVar66->super_Node).super_RefCount._vptr_RefCount[3])(pGVar66);
              }
            }
            else {
              (*(pQVar65->super_Node).super_RefCount._vptr_RefCount[2])(pQVar65);
              BVar64 = (BBox1f)::operator_new(0xd8);
              local_58.ptr = pQVar65;
              (*(pQVar65->super_Node).super_RefCount._vptr_RefCount[2])(pQVar65);
              SceneGraph::QuadMeshNode::QuadMeshNode((QuadMeshNode *)BVar64,&local_58,spaces);
              local_178._0_8_ = BVar64;
              (**(code **)(*(long *)BVar64 + 0x10))(BVar64);
              std::
              vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                        ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                          *)local_168.p.field_0._8_8_,(Ref<embree::SceneGraph::Node> *)local_178);
              if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
                (**(code **)(*(long *)local_178._0_8_ + 0x18))();
              }
              if (local_58.ptr != (QuadMeshNode *)0x0) {
                (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
              }
              (*(pQVar65->super_Node).super_RefCount._vptr_RefCount[3])(pQVar65);
            }
          }
          else {
            (*(pTVar63->super_Node).super_RefCount._vptr_RefCount[2])(pTVar63);
            BVar64 = (BBox1f)::operator_new(0xd8);
            local_50.ptr = pTVar63;
            (*(pTVar63->super_Node).super_RefCount._vptr_RefCount[2])(pTVar63);
            SceneGraph::TriangleMeshNode::TriangleMeshNode
                      ((TriangleMeshNode *)BVar64,&local_50,spaces);
            local_178._0_8_ = BVar64;
            (**(code **)(*(long *)BVar64 + 0x10))(BVar64);
            std::
            vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
            ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                      ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                        *)local_168.p.field_0._8_8_,(Ref<embree::SceneGraph::Node> *)local_178);
            if ((BBox1f)local_178._0_8_ != (BBox1f)0x0) {
              (**(code **)(*(long *)local_178._0_8_ + 0x18))();
            }
            if (local_50.ptr != (TriangleMeshNode *)0x0) {
              (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            (*(pTVar63->super_Node).super_RefCount._vptr_RefCount[3])(pTVar63);
          }
        }
        else {
          (**(code **)(*plVar59 + 0x10))(plVar59);
          pRVar15 = (Ref<embree::SceneGraph::Node> *)plVar59[0xe];
          for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar59[0xd]; node_00 != pRVar15;
              node_00 = node_00 + 1) {
            convertGeometries(local_80,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                        *)local_168.p.field_0._8_8_,node_00,spaces);
          }
          (**(code **)(*plVar59 + 0x18))(plVar59);
        }
      }
      else {
        (**(code **)(*plVar59 + 0x10))(plVar59);
        local_40 = (Ref<embree::SceneGraph::Node> *)(plVar59 + 0x10);
        uVar73 = 0;
        local_48 = plVar59;
        while( true ) {
          lVar75 = local_48[0xe] - local_48[0xd];
          uVar74 = lVar75 % 0x30;
          if ((ulong)(lVar75 / 0x30) <= uVar73) break;
          puVar76 = (undefined8 *)(local_48[0xd] + uVar73 * 0x30);
          sVar12 = (spaces->spaces).size_active;
          local_38 = uVar73;
          if (sVar12 == 1) {
            fVar81 = (spaces->time_range).lower;
            fVar83 = (spaces->time_range).upper;
            fVar102 = (float)*puVar76;
            fVar82 = (float)((ulong)*puVar76 >> 0x20);
            uVar77 = -(uint)(fVar81 < fVar102);
            uVar79 = -(uint)(fVar83 < fVar82);
            local_178._0_8_ =
                 CONCAT44(~uVar79 & (uint)fVar82,~uVar77 & (uint)fVar81) |
                 CONCAT44((uint)fVar83 & uVar79,(uint)fVar102 & uVar77);
            sVar12 = puVar76[2];
            uVar61 = &local_168;
            local_168.l.vy.field_0._0_8_ =
                 (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            local_168.l.vx.field_0._0_8_ = 0;
            local_168.l.vx.field_0._8_8_ = 0;
            if (sVar12 != 0) {
              uVar61 = alignedMalloc(sVar12 << 6,0x10);
              uVar74 = extraout_RDX_03;
              local_168.l.vx.field_0._8_8_ = sVar12;
              local_168.l.vy.field_0._0_8_ = uVar61;
            }
            local_168.l.vy.field_0._8_1_ = 0;
            lVar75 = 0x30;
            local_168.l.vx.field_0._0_8_ = local_168.l.vx.field_0._8_8_;
            for (uVar73 = 0; uVar77 = (uint)uVar74, uVar73 < (ulong)puVar76[2]; uVar73 = uVar73 + 1)
            {
              pAVar13 = (spaces->spaces).items;
              lVar14 = puVar76[4];
              bVar10 = spaces->quaternion;
              bVar57 = *(byte *)(puVar76 + 5);
              local_168.l.vy.field_0._8_1_ = 0;
              fVar81 = (pAVar13->l).vx.field_0.m128[0];
              uVar7 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + 4);
              fVar83 = (float)((ulong)uVar7 >> 0x20);
              local_198 = (float)uVar7;
              if (((((fVar81 != 1.0) || (NAN(fVar81))) || (local_198 != 0.0)) ||
                  ((NAN(local_198) || (fVar83 != 0.0)))) || (NAN(fVar83))) {
LAB_0015bce9:
                uVar7 = *(undefined8 *)(lVar14 + -0x30 + lVar75);
                fVar102 = (float)uVar7;
                fVar112 = (float)((ulong)uVar7 >> 0x20);
                iVar78 = -(uint)(fVar102 != 1.0);
                iVar80 = -(uint)(fVar112 != 0.0);
                auVar87._4_4_ = iVar80;
                auVar87._0_4_ = iVar78;
                auVar87._8_4_ = iVar80;
                auVar87._12_4_ = iVar80;
                auVar86._8_8_ = auVar87._8_8_;
                auVar86._4_4_ = iVar78;
                auVar86._0_4_ = iVar78;
                uVar77 = movmskpd(uVar77,auVar86);
                uVar74 = (ulong)uVar77;
                fVar81 = *(float *)(lVar14 + -0x28 + lVar75);
                if ((uVar77 & 1) == 0) {
                  bVar72 = (byte)uVar77 >> 1;
                  uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
                  uVar74 = (ulong)uVar77;
                  if (((bVar72 == 0) && (fVar81 == 0.0)) && (!NAN(fVar81))) {
                    pfVar1 = (float *)(lVar14 + -0x24 + lVar75);
                    auVar48._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar48._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar48._8_4_ = -(uint)(pfVar1[2] != 1.0);
                    auVar48._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar77 = movmskps(uVar77,auVar48);
                    uVar74 = (ulong)uVar77;
                    if ((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                       ((uVar77 & 4) == 0)) {
                      bVar72 = ((byte)uVar77 & 8) >> 3;
                      uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
                      uVar74 = (ulong)uVar77;
                      if (bVar72 == 0) {
                        pfVar1 = (float *)(lVar14 + -0x14 + lVar75);
                        auVar49._4_4_ = -(uint)(pfVar1[1] != 0.0);
                        auVar49._0_4_ = -(uint)(*pfVar1 != 0.0);
                        auVar49._8_4_ = -(uint)(pfVar1[2] != 0.0);
                        auVar49._12_4_ = -(uint)(pfVar1[3] != 1.0);
                        uVar77 = movmskps(uVar77,auVar49);
                        uVar74 = (ulong)uVar77;
                        if ((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                           ((uVar77 & 4) == 0)) {
                          bVar72 = ((byte)uVar77 & 8) >> 3;
                          uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
                          uVar74 = (ulong)uVar77;
                          if (bVar72 == 0) {
                            pfVar1 = (float *)(lVar14 + -4 + lVar75);
                            auVar50._4_4_ = -(uint)(pfVar1[1] != 0.0);
                            auVar50._0_4_ = -(uint)(*pfVar1 != 0.0);
                            auVar50._8_4_ = -(uint)(pfVar1[2] != 0.0);
                            auVar50._12_4_ = -(uint)(pfVar1[3] != 0.0);
                            uVar77 = movmskps(uVar77,auVar50);
                            uVar74 = (ulong)uVar77;
                            if ((((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                                 ((uVar77 & 4) == 0)) &&
                                (bVar72 = ((byte)uVar77 & 8) >> 3,
                                uVar74 = (ulong)CONCAT31((int3)(uVar77 >> 8),bVar72), bVar72 == 0))
                               && ((bVar57 == 0 ||
                                   ((fVar82 = *(float *)(lVar14 + 0xc + lVar75), fVar82 == 1.0 &&
                                    (!NAN(fVar82))))))) {
                              fVar108 = (pAVar13->l).vx.field_0.m128[0];
                              local_198 = (pAVar13->l).vx.field_0.m128[1];
                              fVar83 = (pAVar13->l).vx.field_0.m128[2];
                              fVar81 = (pAVar13->l).vx.field_0.m128[3];
                              uVar58 = (pAVar13->l).vy.field_0.m128[0];
                              uVar120 = (pAVar13->l).vy.field_0.m128[1];
                              fVar114 = (pAVar13->l).vy.field_0.m128[2];
                              fVar102 = (pAVar13->l).vy.field_0.m128[3];
                              fVar82 = (pAVar13->l).vz.field_0.m128[0];
                              fVar125 = (pAVar13->l).vz.field_0.m128[1];
                              fVar107 = (pAVar13->l).vz.field_0.m128[2];
                              fVar130 = (pAVar13->l).vz.field_0.m128[3];
                              fVar112 = (pAVar13->p).field_0.m128[0];
                              fVar103 = (pAVar13->p).field_0.m128[1];
                              fVar106 = (pAVar13->p).field_0.m128[2];
                              fVar96 = (pAVar13->p).field_0.m128[3];
                              local_168.l.vy.field_0._8_1_ = bVar10;
                              goto LAB_0015c736;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                if ((bVar10 == false) && (bVar57 == 0)) {
                  fVar131 = (pAVar13->l).vx.field_0.m128[0];
                  fVar137 = (pAVar13->l).vx.field_0.m128[1];
                  fVar140 = (pAVar13->l).vx.field_0.m128[2];
                  fVar97 = (pAVar13->l).vx.field_0.m128[3];
                  fVar98 = (pAVar13->l).vy.field_0.m128[0];
                  fVar99 = (pAVar13->l).vy.field_0.m128[1];
                  fVar133 = (pAVar13->l).vy.field_0.m128[2];
                  fVar100 = (pAVar13->l).vy.field_0.m128[3];
                  fVar101 = (pAVar13->l).vz.field_0.m128[0];
                  fVar138 = (pAVar13->l).vz.field_0.m128[1];
                  fVar104 = (pAVar13->l).vz.field_0.m128[2];
                  fVar139 = (pAVar13->l).vz.field_0.m128[3];
                  fVar108 = fVar102 * fVar131 + fVar112 * fVar98 + fVar81 * fVar101;
                  local_198 = fVar102 * fVar137 + fVar112 * fVar99 + fVar81 * fVar138;
                  fVar83 = fVar102 * fVar140 + fVar112 * fVar133 + fVar81 * fVar104;
                  fVar6 = *(float *)(lVar14 + -0x20 + lVar75);
                  fVar117 = *(float *)(lVar14 + -0x1c + lVar75);
                  fVar128 = *(float *)(lVar14 + -0x18 + lVar75);
                  fVar130 = *(float *)(lVar14 + -0x10 + lVar75);
                  fVar103 = *(float *)(lVar14 + -0xc + lVar75);
                  fVar106 = *(float *)(lVar14 + -8 + lVar75);
                  fVar82 = fVar130 * fVar131 + fVar103 * fVar98 + fVar106 * fVar101;
                  fVar125 = fVar130 * fVar137 + fVar103 * fVar99 + fVar106 * fVar138;
                  fVar107 = fVar130 * fVar140 + fVar103 * fVar133 + fVar106 * fVar104;
                  fVar96 = *(float *)(lVar14 + lVar75);
                  fVar114 = *(float *)(lVar14 + 4 + lVar75);
                  fVar129 = *(float *)(lVar14 + 8 + lVar75);
                  fVar130 = fVar130 * fVar97 + fVar103 * fVar100 + fVar106 * fVar139;
                  fVar81 = fVar102 * fVar97 + fVar112 * fVar100 + fVar81 * fVar139;
                  fVar112 = fVar96 * fVar131 + fVar114 * fVar98 + fVar129 * fVar101 +
                            (pAVar13->p).field_0.m128[0];
                  fVar103 = fVar96 * fVar137 + fVar114 * fVar99 + fVar129 * fVar138 +
                            (pAVar13->p).field_0.m128[1];
                  fVar106 = fVar96 * fVar140 + fVar114 * fVar133 + fVar129 * fVar104 +
                            (pAVar13->p).field_0.m128[2];
                  fVar96 = fVar96 * fVar97 + fVar114 * fVar100 + fVar129 * fVar139 +
                           (pAVar13->p).field_0.m128[3];
                  uVar58 = fVar6 * fVar131 + fVar117 * fVar98 + fVar128 * fVar101;
                  uVar120 = fVar6 * fVar137 + fVar117 * fVar99 + fVar128 * fVar138;
                  fVar114 = fVar6 * fVar140 + fVar117 * fVar133 + fVar128 * fVar104;
                  fVar102 = fVar6 * fVar97 + fVar117 * fVar100 + fVar128 * fVar139;
                }
                else if ((bVar10 == false) || (bVar57 == 0)) {
                  if ((bVar10 == false) || (bVar57 != 0)) {
                    if ((local_198 != 0.0) ||
                       ((((NAN(local_198) || (fVar83 != 0.0)) || (NAN(fVar83))) ||
                        (uVar7 = *(undefined8 *)&(pAVar13->l).vz.field_0,
                        auVar31._4_4_ = -(uint)((pAVar13->l).vy.field_0.m128[0] != 0.0),
                        auVar31._0_4_ = -(uint)((pAVar13->l).vy.field_0.m128[2] != 0.0),
                        auVar31._8_4_ = -(uint)((float)uVar7 != 0.0),
                        auVar31._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                        uVar58 = movmskps((int)CONCAT71((int7)((ulong)uVar61 >> 8),bVar57),auVar31),
                        (char)uVar58 != '\0')))) {
                      poVar60 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar60);
                      uVar74 = extraout_RDX_06;
                    }
                    pfVar2 = (float *)(lVar14 + -0x30 + lVar75);
                    fVar81 = pfVar2[3];
                    pfVar3 = (float *)(lVar14 + -0x20 + lVar75);
                    uVar58 = *pfVar3;
                    fVar102 = pfVar3[3];
                    pfVar4 = (float *)(lVar14 + -0x10 + lVar75);
                    fVar82 = *pfVar4;
                    fVar125 = pfVar4[1];
                    fVar130 = pfVar4[3];
                    pfVar1 = (float *)(lVar14 + lVar75);
                    fVar112 = *pfVar1;
                    fVar103 = pfVar1[1];
                    fVar106 = pfVar1[2];
                    fVar96 = pfVar1[3];
                    uVar61 = *(undefined8 *)&(pAVar13->p).field_0;
                    fVar108 = (pAVar13->l).vx.field_0.m128[0] * *pfVar2;
                    local_198 = pfVar2[1] + (float)uVar61;
                    fVar83 = pfVar2[2] + (float)((ulong)uVar61 >> 0x20);
                    fVar114 = pfVar3[2] + (pAVar13->p).field_0.m128[2];
                    uVar120 = pfVar3[1] * (pAVar13->l).vy.field_0.m128[1];
                    fVar107 = pfVar4[2] * (pAVar13->l).vz.field_0.m128[2];
                    local_168.l.vy.field_0._8_1_ = 1;
                  }
                  else {
                    local_e8 = ZEXT416((uint)(pAVar13->p).field_0.m128[3]);
                    local_c8 = ZEXT416((uint)(pAVar13->l).vx.field_0.m128[3]);
                    local_b8 = ZEXT416((uint)(pAVar13->l).vy.field_0.m128[3]);
                    local_f8 = ZEXT416((uint)(pAVar13->l).vz.field_0.m128[3]);
                    local_118 = (pAVar13->l).vy.field_0.m128[0];
                    fStack_114 = (pAVar13->l).vy.field_0.m128[1];
                    fStack_d0 = (pAVar13->l).vy.field_0.m128[2];
                    fStack_10c = (pAVar13->l).vy.field_0.m128[3];
                    local_108 = (pAVar13->l).vz.field_0.m128[0];
                    fStack_104 = (pAVar13->l).vz.field_0.m128[1];
                    fStack_100 = (pAVar13->l).vz.field_0.m128[2];
                    fStack_fc = (pAVar13->l).vz.field_0.m128[3];
                    local_98 = (pAVar13->l).vx.field_0.m128[0];
                    fStack_8c = (pAVar13->l).vx.field_0.m128[1];
                    pfVar1 = (float *)(lVar14 + -0x30 + lVar75);
                    fVar81 = *pfVar1;
                    fVar102 = pfVar1[1];
                    fVar82 = pfVar1[2];
                    pfVar1 = (float *)(lVar14 + -0x20 + lVar75);
                    fVar125 = *pfVar1;
                    fVar130 = pfVar1[1];
                    fVar112 = pfVar1[2];
                    puVar5 = (undefined8 *)(lVar14 + -0x10 + lVar75);
                    local_128 = *puVar5;
                    uStack_120 = puVar5[1];
                    pfVar1 = (float *)(lVar14 + lVar75);
                    fVar103 = *pfVar1;
                    fVar106 = pfVar1[1];
                    fVar96 = pfVar1[2];
                    fVar108 = fVar81 * local_98 + fVar102 * local_118 + fVar82 * local_108;
                    fVar114 = fVar81 * 0.0 + fVar102 * fStack_114 + fVar82 * fStack_104;
                    fVar81 = fVar81 * 0.0 + fVar102 * 0.0 + fVar82 * fStack_100;
                    local_168.l.vz.field_0.m128[0] =
                         fVar125 * local_98 + fVar130 * local_118 + fVar112 * local_108;
                    local_168.l.vz.field_0.m128[1] =
                         fVar125 * 0.0 + fVar130 * fStack_114 + fVar112 * fStack_104;
                    local_168.l.vz.field_0.m128[2] =
                         fVar125 * 0.0 + fVar130 * 0.0 + fVar112 * fStack_100;
                    local_168.l.vz.field_0.m128[3] =
                         fVar125 * fStack_8c + fVar130 * fStack_10c + fVar112 * fStack_fc;
                    fStack_110 = 0.0;
                    fStack_94 = 0.0;
                    fStack_90 = 0.0;
                    local_a8._0_4_ =
                         fVar103 * local_98 + fVar106 * local_118 + fVar96 * local_108 +
                         (pAVar13->p).field_0.m128[0];
                    local_a8._4_4_ =
                         fVar103 * 0.0 + fVar106 * fStack_114 + fVar96 * fStack_104 +
                         (pAVar13->p).field_0.m128[1];
                    fStack_a0 = fVar103 * 0.0 + fVar106 * 0.0 + fVar96 * fStack_100 +
                                (pAVar13->p).field_0.m128[2];
                    register0x0000128c =
                         fVar103 * fStack_8c + fVar106 * fStack_10c + fVar96 * fStack_fc +
                         (pAVar13->p).field_0.m128[3];
                    local_d8 = local_118;
                    fStack_d4 = fStack_114;
                    fStack_cc = fStack_10c;
                    if ((((fVar114 != 0.0) || (NAN(fVar114))) ||
                        ((fVar81 != 0.0 ||
                         ((NAN(fVar81) || (local_168.l.vz.field_0.m128[2] != 0.0)))))) ||
                       (NAN(local_168.l.vz.field_0.m128[2]))) {
                      poVar60 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar60);
                      uVar74 = extraout_RDX_05;
                    }
                    fVar82 = local_98 * (float)local_128 +
                             local_118 * local_128._4_4_ + local_108 * (float)uStack_120;
                    fVar125 = fStack_94 * (float)local_128 +
                              fStack_114 * local_128._4_4_ + fStack_104 * (float)uStack_120;
                    fVar107 = fStack_90 * (float)local_128 +
                              fStack_110 * local_128._4_4_ + fStack_100 * (float)uStack_120;
                    local_168.l.vy.field_0._8_1_ = 1;
                    fVar130 = (float)local_f8._0_4_;
                    fVar81 = (float)local_c8._0_4_;
                    fVar112 = (float)local_a8._0_4_;
                    fVar103 = (float)local_a8._4_4_;
                    fVar106 = fStack_a0;
                    fVar96 = (float)local_e8._0_4_;
                    uVar58 = local_168.l.vz.field_0.m128[0];
                    uVar120 = local_168.l.vz.field_0.m128[1];
                    fVar114 = fStack_d0;
                    fVar102 = (float)local_b8._0_4_;
                  }
                }
                else {
                  poVar60 = std::operator<<((ostream *)&std::cout,
                                            "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                           );
                  std::endl<char,std::char_traits<char>>(poVar60);
                  fVar81 = (pAVar13->p).field_0.m128[3];
                  fVar83 = (pAVar13->l).vx.field_0.m128[3];
                  fVar102 = (pAVar13->l).vy.field_0.m128[3];
                  fVar82 = (pAVar13->l).vz.field_0.m128[3];
                  aVar8 = (pAVar13->l).vx.field_0.field_1;
                  fVar125 = (pAVar13->l).vy.field_0.m128[0];
                  fVar130 = (pAVar13->l).vy.field_0.m128[1];
                  fVar112 = (pAVar13->l).vz.field_0.m128[0];
                  fVar103 = (pAVar13->l).vz.field_0.m128[1];
                  fVar106 = (pAVar13->l).vz.field_0.m128[2];
                  fVar131 = fVar83 * fVar102 + fVar81 * fVar82;
                  fVar107 = fVar83 * fVar102 - fVar81 * fVar82;
                  fVar117 = fVar81 * fVar81 + fVar83 * fVar83 + -fVar102 * fVar102 +
                            -fVar82 * fVar82;
                  fVar128 = fVar81 * fVar81 - fVar83 * fVar83;
                  fVar129 = fVar102 * fVar102 + fVar128 + -fVar82 * fVar82;
                  fVar140 = fVar83 * fVar82 - fVar81 * fVar102;
                  fVar108 = fVar81 * fVar102 + fVar83 * fVar82;
                  fVar137 = fVar102 * fVar82 + fVar81 * fVar83;
                  fVar81 = fVar102 * fVar82 - fVar81 * fVar83;
                  fVar96 = (pAVar13->p).field_0.m128[0];
                  fVar114 = (pAVar13->p).field_0.m128[1];
                  fVar6 = (pAVar13->p).field_0.m128[2];
                  fVar131 = fVar131 + fVar131;
                  fVar140 = fVar140 + fVar140;
                  fVar107 = fVar107 + fVar107;
                  fVar137 = fVar137 + fVar137;
                  fVar108 = fVar108 + fVar108;
                  fVar81 = fVar81 + fVar81;
                  fVar83 = fVar82 * fVar82 + fVar128 + -fVar102 * fVar102;
                  fVar115 = fVar117 * 1.0 + fVar131 * 0.0 + fVar140 * 0.0;
                  fVar118 = fVar117 * 0.0 + fVar131 * 1.0 + fVar140 * 0.0;
                  fVar121 = fVar117 * 0.0 + fVar131 * 0.0 + fVar140 * 1.0;
                  fVar122 = fVar117 * 0.0 + fVar131 * 0.0 + fVar140 * 0.0;
                  fVar109 = fVar107 * 1.0 + fVar129 * 0.0 + fVar137 * 0.0;
                  fVar110 = fVar107 * 0.0 + fVar129 * 1.0 + fVar137 * 0.0;
                  fVar111 = fVar107 * 0.0 + fVar129 * 0.0 + fVar137 * 1.0;
                  fVar113 = fVar107 * 0.0 + fVar129 * 0.0 + fVar137 * 0.0;
                  fVar117 = fVar108 * 1.0 + fVar81 * 0.0 + fVar83 * 0.0;
                  fVar129 = fVar108 * 0.0 + fVar81 * 1.0 + fVar83 * 0.0;
                  fVar137 = fVar108 * 0.0 + fVar81 * 0.0 + fVar83 * 1.0;
                  fVar97 = fVar108 * 0.0 + fVar81 * 0.0 + fVar83 * 0.0;
                  local_188 = aVar8.y;
                  fStack_184 = aVar8.z;
                  local_198 = aVar8.x;
                  fVar127 = local_198 * fVar115 + fVar109 * 0.0 + fVar117 * 0.0;
                  fVar132 = local_198 * fVar118 + fVar110 * 0.0 + fVar129 * 0.0;
                  fVar134 = local_198 * fVar121 + fVar111 * 0.0 + fVar137 * 0.0;
                  fVar135 = local_198 * fVar122 + fVar113 * 0.0 + fVar97 * 0.0;
                  fVar128 = fVar125 * fVar115 + fVar130 * fVar109 + fVar117 * 0.0;
                  fVar131 = fVar125 * fVar118 + fVar130 * fVar110 + fVar129 * 0.0;
                  fVar140 = fVar125 * fVar121 + fVar130 * fVar111 + fVar137 * 0.0;
                  fVar98 = fVar125 * fVar122 + fVar130 * fVar113 + fVar97 * 0.0;
                  local_168.l.vz.field_0.m128[0] =
                       fVar112 * fVar115 + fVar103 * fVar109 + fVar106 * fVar117;
                  local_168.l.vz.field_0.m128[1] =
                       fVar112 * fVar118 + fVar103 * fVar110 + fVar106 * fVar129;
                  local_168.l.vz.field_0.m128[2] =
                       fVar112 * fVar121 + fVar103 * fVar111 + fVar106 * fVar137;
                  local_168.l.vz.field_0.m128[3] =
                       fVar112 * fVar122 + fVar103 * fVar113 + fVar106 * fVar97;
                  fVar81 = *(float *)(lVar14 + 0xc + lVar75);
                  fVar83 = *(float *)(lVar14 + -0x24 + lVar75);
                  fVar102 = *(float *)(lVar14 + -0x14 + lVar75);
                  fVar82 = *(float *)(lVar14 + -4 + lVar75);
                  fVar133 = fVar83 * fVar102 + fVar81 * fVar82;
                  fVar107 = fVar83 * fVar102 - fVar81 * fVar82;
                  fVar99 = fVar81 * fVar81 + fVar83 * fVar83 + -fVar102 * fVar102 + -fVar82 * fVar82
                  ;
                  fVar130 = fVar81 * fVar81 - fVar83 * fVar83;
                  fVar139 = fVar102 * fVar102 + fVar130 + -fVar82 * fVar82;
                  fVar138 = fVar83 * fVar82 - fVar81 * fVar102;
                  fVar104 = fVar81 * fVar102 + fVar83 * fVar82;
                  fVar141 = fVar102 * fVar82 + fVar81 * fVar83;
                  fVar108 = fVar102 * fVar82 - fVar81 * fVar83;
                  pfVar2 = (float *)(lVar14 + -0x30 + lVar75);
                  fVar81 = *pfVar2;
                  pfVar3 = (float *)(lVar14 + -0x20 + lVar75);
                  fVar83 = *pfVar3;
                  fVar125 = pfVar3[1];
                  fVar124 = fVar82 * fVar82 + fVar130 + -fVar102 * fVar102;
                  pfVar1 = (float *)(lVar14 + -0x10 + lVar75);
                  fVar102 = *pfVar1;
                  fVar82 = pfVar1[1];
                  fVar130 = pfVar1[2];
                  fVar133 = fVar133 + fVar133;
                  fVar138 = fVar138 + fVar138;
                  pfVar1 = (float *)(lVar14 + lVar75);
                  fVar112 = *pfVar1;
                  fVar103 = pfVar1[1];
                  fVar106 = pfVar1[2];
                  fVar100 = fVar99 * 1.0 + fVar133 * 0.0 + fVar138 * 0.0;
                  fVar101 = fVar99 * 0.0 + fVar133 * 1.0 + fVar138 * 0.0;
                  fVar138 = fVar99 * 0.0 + fVar133 * 0.0 + fVar138 * 1.0;
                  fVar107 = fVar107 + fVar107;
                  fVar141 = fVar141 + fVar141;
                  fVar104 = fVar104 + fVar104;
                  fVar108 = fVar108 + fVar108;
                  fVar99 = fVar107 * 1.0 + fVar139 * 0.0 + fVar141 * 0.0;
                  fVar133 = fVar107 * 0.0 + fVar139 * 1.0 + fVar141 * 0.0;
                  fVar107 = fVar107 * 0.0 + fVar139 * 0.0 + fVar141 * 1.0;
                  fVar139 = fVar104 * 1.0 + fVar108 * 0.0 + fVar124 * 0.0;
                  fVar141 = fVar104 * 0.0 + fVar108 * 1.0 + fVar124 * 0.0;
                  fVar108 = fVar104 * 0.0 + fVar108 * 0.0 + fVar124 * 1.0;
                  fVar116 = fVar81 * fVar100 + fVar99 * 0.0 + fVar139 * 0.0;
                  fVar119 = fVar81 * fVar101 + fVar133 * 0.0 + fVar141 * 0.0;
                  fVar81 = fVar81 * fVar138 + fVar107 * 0.0 + fVar108 * 0.0;
                  fVar104 = fVar83 * fVar100 + fVar125 * fVar99 + fVar139 * 0.0;
                  fVar124 = fVar83 * fVar101 + fVar125 * fVar133 + fVar141 * 0.0;
                  fVar105 = fVar83 * fVar138 + fVar125 * fVar107 + fVar108 * 0.0;
                  fVar123 = fVar102 * fVar100 + fVar82 * fVar99 + fVar130 * fVar139;
                  fVar126 = fVar102 * fVar101 + fVar82 * fVar133 + fVar130 * fVar141;
                  fVar130 = fVar102 * fVar138 + fVar82 * fVar107 + fVar130 * fVar108;
                  fVar102 = fVar112 * fVar100 + fVar103 * fVar99 + fVar106 * fVar139 +
                            pfVar2[1] + 0.0;
                  fVar99 = fVar112 * fVar101 + fVar103 * fVar133 + fVar106 * fVar141 +
                           pfVar2[2] + 0.0;
                  fVar133 = fVar112 * fVar138 + fVar103 * fVar107 + fVar106 * fVar108 +
                            pfVar3[2] + 0.0;
                  fVar108 = fVar116 * fVar127 +
                            fVar119 * fVar128 + fVar81 * local_168.l.vz.field_0.m128[0];
                  local_198 = fVar116 * fVar132 +
                              fVar119 * fVar131 + fVar81 * local_168.l.vz.field_0.m128[1];
                  fVar83 = fVar116 * fVar134 +
                           fVar119 * fVar140 + fVar81 * local_168.l.vz.field_0.m128[2];
                  fVar82 = fVar123 * fVar127 +
                           fVar126 * fVar128 + fVar130 * local_168.l.vz.field_0.m128[0];
                  fVar125 = fVar123 * fVar132 +
                            fVar126 * fVar131 + fVar130 * local_168.l.vz.field_0.m128[1];
                  fVar107 = fVar123 * fVar134 +
                            fVar126 * fVar140 + fVar130 * local_168.l.vz.field_0.m128[2];
                  uVar74 = extraout_RDX_04;
                  fVar130 = fVar123 * fVar135 +
                            fVar126 * fVar98 + fVar130 * local_168.l.vz.field_0.m128[3];
                  fVar81 = fVar116 * fVar135 +
                           fVar119 * fVar98 + fVar81 * local_168.l.vz.field_0.m128[3];
                  fVar112 = fVar102 * fVar127 +
                            fVar99 * fVar128 + fVar133 * local_168.l.vz.field_0.m128[0] +
                            fVar96 * fVar115 + fVar114 * fVar109 + fVar6 * fVar117 + local_188 + 0.0
                  ;
                  fVar103 = fVar102 * fVar132 +
                            fVar99 * fVar131 + fVar133 * local_168.l.vz.field_0.m128[1] +
                            fVar96 * fVar118 + fVar114 * fVar110 + fVar6 * fVar129 +
                            fStack_184 + 0.0;
                  fVar106 = fVar102 * fVar134 +
                            fVar99 * fVar140 + fVar133 * local_168.l.vz.field_0.m128[2] +
                            fVar96 * fVar121 + fVar114 * fVar111 + fVar6 * fVar137 +
                            (pAVar13->l).vy.field_0.m128[2] + 0.0;
                  fVar96 = fVar102 * fVar135 +
                           fVar99 * fVar98 + fVar133 * local_168.l.vz.field_0.m128[3] +
                           fVar96 * fVar122 + fVar114 * fVar113 + fVar6 * fVar97 + 0.0;
                  uVar58 = fVar104 * fVar127 +
                           fVar124 * fVar128 + fVar105 * local_168.l.vz.field_0.m128[0];
                  uVar120 = fVar104 * fVar132 +
                            fVar124 * fVar131 + fVar105 * local_168.l.vz.field_0.m128[1];
                  fVar114 = fVar104 * fVar134 +
                            fVar124 * fVar140 + fVar105 * local_168.l.vz.field_0.m128[2];
                  fVar102 = fVar104 * fVar135 +
                            fVar124 * fVar98 + fVar105 * local_168.l.vz.field_0.m128[3];
                }
              }
              else {
                auVar28._4_4_ = -(uint)((pAVar13->l).vy.field_0.m128[0] != 0.0);
                auVar28._0_4_ = -(uint)((pAVar13->l).vx.field_0.m128[3] != 0.0);
                auVar28._8_4_ = -(uint)((pAVar13->l).vy.field_0.m128[1] != 1.0);
                auVar28._12_4_ = -(uint)((pAVar13->l).vy.field_0.m128[2] != 0.0);
                uVar77 = movmskps(uVar77,auVar28);
                if ((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) ||
                   (((uVar77 & 4) != 0 ||
                    (bVar72 = ((byte)uVar77 & 8) >> 3, uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72)
                    , bVar72 != 0)))) goto LAB_0015bce9;
                auVar29._4_4_ = -(uint)((pAVar13->l).vz.field_0.m128[0] != 0.0);
                auVar29._0_4_ = -(uint)((pAVar13->l).vy.field_0.m128[3] != 0.0);
                auVar29._8_4_ = -(uint)((pAVar13->l).vz.field_0.m128[1] != 0.0);
                auVar29._12_4_ = -(uint)((pAVar13->l).vz.field_0.m128[2] != 1.0);
                uVar77 = movmskps(uVar77,auVar29);
                if (((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) || ((uVar77 & 4) != 0))
                   || (bVar72 = ((byte)uVar77 & 8) >> 3,
                      uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72), bVar72 != 0))
                goto LAB_0015bce9;
                auVar30._4_4_ = -(uint)((pAVar13->p).field_0.m128[0] != 0.0);
                auVar30._0_4_ = -(uint)((pAVar13->l).vz.field_0.m128[3] != 0.0);
                auVar30._8_4_ = -(uint)((pAVar13->p).field_0.m128[1] != 0.0);
                auVar30._12_4_ = -(uint)((pAVar13->p).field_0.m128[2] != 0.0);
                uVar77 = movmskps(uVar77,auVar30);
                if ((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) || ((uVar77 & 4) != 0))
                goto LAB_0015bce9;
                bVar72 = ((byte)uVar77 & 8) >> 3;
                uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
                uVar74 = (ulong)uVar77;
                if ((bVar72 != 0) ||
                   ((bVar10 != false &&
                    ((fVar81 = (pAVar13->p).field_0.m128[3], fVar81 != 1.0 || (NAN(fVar81)))))))
                goto LAB_0015bce9;
                pfVar1 = (float *)(lVar14 + -0x30 + lVar75);
                fVar108 = *pfVar1;
                local_198 = pfVar1[1];
                fVar83 = pfVar1[2];
                fVar81 = pfVar1[3];
                pfVar1 = (float *)(lVar14 + -0x20 + lVar75);
                uVar58 = *pfVar1;
                uVar120 = pfVar1[1];
                fVar114 = pfVar1[2];
                fVar102 = pfVar1[3];
                pfVar1 = (float *)(lVar14 + -0x10 + lVar75);
                fVar82 = *pfVar1;
                fVar125 = pfVar1[1];
                fVar107 = pfVar1[2];
                fVar130 = pfVar1[3];
                pfVar1 = (float *)(lVar14 + lVar75);
                fVar112 = *pfVar1;
                fVar103 = pfVar1[1];
                fVar106 = pfVar1[2];
                fVar96 = pfVar1[3];
                local_168.l.vy.field_0._8_1_ = bVar57;
              }
LAB_0015c736:
              pfVar1 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x30))->field_0
                                + lVar75);
              *pfVar1 = fVar108;
              pfVar1[1] = local_198;
              pfVar1[2] = fVar83;
              pfVar1[3] = fVar81;
              pfVar1 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x20))->field_0
                                + lVar75);
              *pfVar1 = (float)uVar58;
              pfVar1[1] = (float)uVar120;
              pfVar1[2] = fVar114;
              pfVar1[3] = fVar102;
              pfVar1 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x10))->field_0
                                + lVar75);
              *pfVar1 = fVar82;
              pfVar1[1] = fVar125;
              pfVar1[2] = fVar107;
              pfVar1[3] = fVar130;
              pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + lVar75);
              *pfVar1 = fVar112;
              pfVar1[1] = fVar103;
              pfVar1[2] = fVar106;
              pfVar1[3] = fVar96;
              lVar75 = lVar75 + 0x40;
              uVar61 = local_168.l.vy.field_0._0_8_;
            }
          }
          else if (puVar76[2] == 1) {
            fVar81 = (spaces->time_range).lower;
            fVar83 = (spaces->time_range).upper;
            fVar102 = (float)*puVar76;
            fVar82 = (float)((ulong)*puVar76 >> 0x20);
            uVar77 = -(uint)(fVar81 < fVar102);
            uVar79 = -(uint)(fVar83 < fVar82);
            local_178._0_8_ =
                 CONCAT44(~uVar79 & (uint)fVar82,~uVar77 & (uint)fVar81) |
                 CONCAT44((uint)fVar83 & uVar79,(uint)fVar102 & uVar77);
            local_168.l.vy.field_0._0_8_ =
                 (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            local_168.l.vx.field_0._0_8_ = 0;
            local_168.l.vx.field_0._8_8_ = 0;
            if (sVar12 != 0) {
              local_168.l.vy.field_0._0_8_ = alignedMalloc(sVar12 << 6,0x10);
              uVar74 = extraout_RDX_07;
              local_168.l.vx.field_0._8_8_ = sVar12;
            }
            uVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
            if (spaces->quaternion == false) {
              uVar61 = ZEXT48(*(uint *)(puVar76 + 5));
            }
            local_168.l.vy.field_0._8_1_ = (undefined1)uVar61;
            lVar75 = 0x30;
            local_168.l.vx.field_0._0_8_ = local_168.l.vx.field_0._8_8_;
            for (uVar73 = 0; uVar77 = (uint)uVar74, uVar73 < (spaces->spaces).size_active;
                uVar73 = uVar73 + 1) {
              pAVar13 = (spaces->spaces).items;
              pfVar1 = (float *)puVar76[4];
              bVar10 = spaces->quaternion;
              bVar57 = *(byte *)(puVar76 + 5);
              local_168.l.vy.field_0._8_1_ = 0;
              fVar81 = *(float *)((long)pAVar13 + lVar75 + -0x30);
              uVar7 = *(undefined8 *)((long)pAVar13 + lVar75 + -0x2c);
              fVar83 = (float)((ulong)uVar7 >> 0x20);
              local_198 = (float)uVar7;
              if (((((fVar81 != 1.0) || (NAN(fVar81))) || (local_198 != 0.0)) ||
                  ((NAN(local_198) || (fVar83 != 0.0)))) || (NAN(fVar83))) {
LAB_0015c92b:
                fVar102 = (float)*(undefined8 *)pfVar1;
                fVar112 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
                iVar78 = -(uint)(fVar102 != 1.0);
                iVar80 = -(uint)(fVar112 != 0.0);
                auVar89._4_4_ = iVar80;
                auVar89._0_4_ = iVar78;
                auVar89._8_4_ = iVar80;
                auVar89._12_4_ = iVar80;
                auVar88._8_8_ = auVar89._8_8_;
                auVar88._4_4_ = iVar78;
                auVar88._0_4_ = iVar78;
                uVar77 = movmskpd(uVar77,auVar88);
                uVar74 = (ulong)uVar77;
                fVar81 = pfVar1[2];
                if ((uVar77 & 1) == 0) {
                  bVar72 = (byte)uVar77 >> 1;
                  uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
                  uVar74 = (ulong)uVar77;
                  if (((bVar72 == 0) && (fVar81 == 0.0)) && (!NAN(fVar81))) {
                    auVar51._4_4_ = -(uint)(pfVar1[4] != 0.0);
                    auVar51._0_4_ = -(uint)(pfVar1[3] != 0.0);
                    auVar51._8_4_ = -(uint)(pfVar1[5] != 1.0);
                    auVar51._12_4_ = -(uint)(pfVar1[6] != 0.0);
                    uVar77 = movmskps(uVar77,auVar51);
                    uVar74 = (ulong)uVar77;
                    if ((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                       ((uVar77 & 4) == 0)) {
                      bVar72 = ((byte)uVar77 & 8) >> 3;
                      uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
                      uVar74 = (ulong)uVar77;
                      if (bVar72 == 0) {
                        auVar52._4_4_ = -(uint)(pfVar1[8] != 0.0);
                        auVar52._0_4_ = -(uint)(pfVar1[7] != 0.0);
                        auVar52._8_4_ = -(uint)(pfVar1[9] != 0.0);
                        auVar52._12_4_ = -(uint)(pfVar1[10] != 1.0);
                        uVar77 = movmskps(uVar77,auVar52);
                        uVar74 = (ulong)uVar77;
                        if ((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                           ((uVar77 & 4) == 0)) {
                          bVar72 = ((byte)uVar77 & 8) >> 3;
                          uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
                          uVar74 = (ulong)uVar77;
                          if (bVar72 == 0) {
                            auVar53._4_4_ = -(uint)(pfVar1[0xc] != 0.0);
                            auVar53._0_4_ = -(uint)(pfVar1[0xb] != 0.0);
                            auVar53._8_4_ = -(uint)(pfVar1[0xd] != 0.0);
                            auVar53._12_4_ = -(uint)(pfVar1[0xe] != 0.0);
                            uVar77 = movmskps(uVar77,auVar53);
                            uVar74 = (ulong)uVar77;
                            if (((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                                ((uVar77 & 4) == 0)) &&
                               ((bVar72 = ((byte)uVar77 & 8) >> 3,
                                uVar74 = (ulong)CONCAT31((int3)(uVar77 >> 8),bVar72), bVar72 == 0 &&
                                ((bVar57 == 0 || ((pfVar1[0xf] == 1.0 && (!NAN(pfVar1[0xf])))))))))
                            {
                              pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x30);
                              fVar108 = *pfVar1;
                              local_198 = pfVar1[1];
                              fVar83 = pfVar1[2];
                              fVar81 = pfVar1[3];
                              pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x20);
                              uVar58 = *pfVar1;
                              uVar120 = pfVar1[1];
                              fVar114 = pfVar1[2];
                              fVar102 = pfVar1[3];
                              pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x10);
                              fVar82 = *pfVar1;
                              fVar125 = pfVar1[1];
                              fVar107 = pfVar1[2];
                              fVar130 = pfVar1[3];
                              pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                              fVar112 = *pfVar1;
                              fVar103 = pfVar1[1];
                              fVar106 = pfVar1[2];
                              fVar96 = pfVar1[3];
                              local_168.l.vy.field_0._8_1_ = bVar10;
                              goto LAB_0015d390;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                if ((bVar10 == false) && (bVar57 == 0)) {
                  pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x30);
                  fVar131 = *pfVar2;
                  fVar137 = pfVar2[1];
                  fVar140 = pfVar2[2];
                  fVar97 = pfVar2[3];
                  pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x20);
                  fVar98 = *pfVar2;
                  fVar99 = pfVar2[1];
                  fVar133 = pfVar2[2];
                  fVar100 = pfVar2[3];
                  pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x10);
                  fVar101 = *pfVar2;
                  fVar138 = pfVar2[1];
                  fVar104 = pfVar2[2];
                  fVar139 = pfVar2[3];
                  fVar108 = fVar102 * fVar131 + fVar112 * fVar98 + fVar81 * fVar101;
                  local_198 = fVar102 * fVar137 + fVar112 * fVar99 + fVar81 * fVar138;
                  fVar83 = fVar102 * fVar140 + fVar112 * fVar133 + fVar81 * fVar104;
                  fVar6 = pfVar1[4];
                  fVar117 = pfVar1[5];
                  fVar128 = pfVar1[6];
                  fVar130 = pfVar1[8];
                  fVar103 = pfVar1[9];
                  fVar106 = pfVar1[10];
                  fVar82 = fVar130 * fVar131 + fVar103 * fVar98 + fVar106 * fVar101;
                  fVar125 = fVar130 * fVar137 + fVar103 * fVar99 + fVar106 * fVar138;
                  fVar107 = fVar130 * fVar140 + fVar103 * fVar133 + fVar106 * fVar104;
                  fVar96 = pfVar1[0xc];
                  fVar114 = pfVar1[0xd];
                  fVar129 = pfVar1[0xe];
                  pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                  fVar130 = fVar130 * fVar97 + fVar103 * fVar100 + fVar106 * fVar139;
                  fVar81 = fVar102 * fVar97 + fVar112 * fVar100 + fVar81 * fVar139;
                  fVar112 = fVar96 * fVar131 + fVar114 * fVar98 + fVar129 * fVar101 + *pfVar1;
                  fVar103 = fVar96 * fVar137 + fVar114 * fVar99 + fVar129 * fVar138 + pfVar1[1];
                  fVar106 = fVar96 * fVar140 + fVar114 * fVar133 + fVar129 * fVar104 + pfVar1[2];
                  fVar96 = fVar96 * fVar97 + fVar114 * fVar100 + fVar129 * fVar139 + pfVar1[3];
                  uVar58 = fVar6 * fVar131 + fVar117 * fVar98 + fVar128 * fVar101;
                  uVar120 = fVar6 * fVar137 + fVar117 * fVar99 + fVar128 * fVar138;
                  fVar114 = fVar6 * fVar140 + fVar117 * fVar133 + fVar128 * fVar104;
                  fVar102 = fVar6 * fVar97 + fVar117 * fVar100 + fVar128 * fVar139;
                }
                else if ((bVar10 == false) || (bVar57 == 0)) {
                  if ((bVar10 == false) || (bVar57 != 0)) {
                    if ((local_198 != 0.0) ||
                       ((((NAN(local_198) || (fVar83 != 0.0)) || (NAN(fVar83))) ||
                        (uVar7 = *(undefined8 *)((long)pAVar13 + lVar75 + -0x10),
                        auVar35._4_4_ = -(uint)(*(float *)((long)pAVar13 + lVar75 + -0x20) != 0.0),
                        auVar35._0_4_ = -(uint)(*(float *)((long)pAVar13 + lVar75 + -0x18) != 0.0),
                        auVar35._8_4_ = -(uint)((float)uVar7 != 0.0),
                        auVar35._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                        uVar58 = movmskps((int)CONCAT71((int7)((ulong)uVar61 >> 8),bVar57),auVar35),
                        (char)uVar58 != '\0')))) {
                      poVar60 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar60);
                      uVar74 = extraout_RDX_10;
                    }
                    fVar81 = pfVar1[3];
                    uVar58 = pfVar1[4];
                    fVar102 = pfVar1[7];
                    fVar82 = pfVar1[8];
                    fVar125 = pfVar1[9];
                    fVar130 = pfVar1[0xb];
                    fVar112 = pfVar1[0xc];
                    fVar103 = pfVar1[0xd];
                    fVar106 = pfVar1[0xe];
                    fVar96 = pfVar1[0xf];
                    uVar61 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                    fVar108 = *(float *)((long)pAVar13 + lVar75 + -0x30) * *pfVar1;
                    local_198 = pfVar1[1] + (float)uVar61;
                    fVar83 = pfVar1[2] + (float)((ulong)uVar61 >> 0x20);
                    fVar114 = pfVar1[6] + *(float *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 8);
                    uVar120 = pfVar1[5] * *(float *)((long)pAVar13 + lVar75 + -0x1c);
                    fVar107 = pfVar1[10] * *(float *)((long)pAVar13 + lVar75 + -8);
                    local_168.l.vy.field_0._8_1_ = 1;
                  }
                  else {
                    local_e8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 0xc));
                    local_c8 = ZEXT416(*(uint *)((long)pAVar13 + lVar75 + -0x24));
                    local_b8 = ZEXT416(*(uint *)((long)pAVar13 + lVar75 + -0x14));
                    local_f8 = ZEXT416(*(uint *)((long)pAVar13 + lVar75 + -4));
                    pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x20);
                    local_118 = *pfVar2;
                    fStack_114 = pfVar2[1];
                    fStack_d0 = pfVar2[2];
                    fStack_10c = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x10);
                    local_108 = *pfVar2;
                    fStack_104 = pfVar2[1];
                    fStack_100 = pfVar2[2];
                    fStack_fc = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x30);
                    local_98 = *pfVar2;
                    fStack_8c = pfVar2[1];
                    fVar81 = *pfVar1;
                    fVar102 = pfVar1[1];
                    fVar82 = pfVar1[2];
                    fVar125 = pfVar1[4];
                    fVar130 = pfVar1[5];
                    fVar112 = pfVar1[6];
                    local_128 = *(undefined8 *)(pfVar1 + 8);
                    uStack_120 = *(undefined8 *)(pfVar1 + 10);
                    fVar103 = pfVar1[0xc];
                    fVar106 = pfVar1[0xd];
                    fVar96 = pfVar1[0xe];
                    fVar108 = fVar81 * local_98 + fVar102 * local_118 + fVar82 * local_108;
                    fVar114 = fVar81 * 0.0 + fVar102 * fStack_114 + fVar82 * fStack_104;
                    fVar81 = fVar81 * 0.0 + fVar102 * 0.0 + fVar82 * fStack_100;
                    local_168.l.vz.field_0.m128[0] =
                         fVar125 * local_98 + fVar130 * local_118 + fVar112 * local_108;
                    local_168.l.vz.field_0.m128[1] =
                         fVar125 * 0.0 + fVar130 * fStack_114 + fVar112 * fStack_104;
                    local_168.l.vz.field_0.m128[2] =
                         fVar125 * 0.0 + fVar130 * 0.0 + fVar112 * fStack_100;
                    local_168.l.vz.field_0.m128[3] =
                         fVar125 * fStack_8c + fVar130 * fStack_10c + fVar112 * fStack_fc;
                    fStack_110 = 0.0;
                    fStack_94 = 0.0;
                    fStack_90 = 0.0;
                    pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                    local_a8._0_4_ =
                         fVar103 * local_98 + fVar106 * local_118 + fVar96 * local_108 + *pfVar1;
                    local_a8._4_4_ =
                         fVar103 * 0.0 + fVar106 * fStack_114 + fVar96 * fStack_104 + pfVar1[1];
                    fStack_a0 = fVar103 * 0.0 + fVar106 * 0.0 + fVar96 * fStack_100 + pfVar1[2];
                    register0x0000128c =
                         fVar103 * fStack_8c + fVar106 * fStack_10c + fVar96 * fStack_fc + pfVar1[3]
                    ;
                    local_d8 = local_118;
                    fStack_d4 = fStack_114;
                    fStack_cc = fStack_10c;
                    if ((((fVar114 != 0.0) || (NAN(fVar114))) ||
                        ((fVar81 != 0.0 ||
                         ((NAN(fVar81) || (local_168.l.vz.field_0.m128[2] != 0.0)))))) ||
                       (NAN(local_168.l.vz.field_0.m128[2]))) {
                      poVar60 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar60);
                      uVar74 = extraout_RDX_09;
                    }
                    fVar82 = local_98 * (float)local_128 +
                             local_118 * local_128._4_4_ + local_108 * (float)uStack_120;
                    fVar125 = fStack_94 * (float)local_128 +
                              fStack_114 * local_128._4_4_ + fStack_104 * (float)uStack_120;
                    fVar107 = fStack_90 * (float)local_128 +
                              fStack_110 * local_128._4_4_ + fStack_100 * (float)uStack_120;
                    local_168.l.vy.field_0._8_1_ = 1;
                    fVar130 = (float)local_f8._0_4_;
                    fVar81 = (float)local_c8._0_4_;
                    fVar112 = (float)local_a8._0_4_;
                    fVar103 = (float)local_a8._4_4_;
                    fVar106 = fStack_a0;
                    fVar96 = (float)local_e8._0_4_;
                    uVar58 = local_168.l.vz.field_0.m128[0];
                    uVar120 = local_168.l.vz.field_0.m128[1];
                    fVar114 = fStack_d0;
                    fVar102 = (float)local_b8._0_4_;
                  }
                }
                else {
                  poVar60 = std::operator<<((ostream *)&std::cout,
                                            "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                           );
                  std::endl<char,std::char_traits<char>>(poVar60);
                  fVar81 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 0xc);
                  fVar83 = *(float *)((long)pAVar13 + lVar75 + -0x24);
                  fVar102 = *(float *)((long)pAVar13 + lVar75 + -0x14);
                  fVar82 = *(float *)((long)pAVar13 + lVar75 + -4);
                  auVar9 = *(undefined1 (*) [16])((long)pAVar13 + lVar75 + -0x30);
                  pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x20);
                  fVar125 = *pfVar2;
                  fVar130 = pfVar2[1];
                  pfVar3 = (float *)((long)pAVar13 + lVar75 + -0x10);
                  fVar112 = *pfVar3;
                  fVar103 = pfVar3[1];
                  fVar106 = pfVar3[2];
                  fVar131 = fVar83 * fVar102 + fVar81 * fVar82;
                  fVar107 = fVar83 * fVar102 - fVar81 * fVar82;
                  fVar117 = fVar81 * fVar81 + fVar83 * fVar83 + -fVar102 * fVar102 +
                            -fVar82 * fVar82;
                  fVar128 = fVar81 * fVar81 - fVar83 * fVar83;
                  fVar129 = fVar102 * fVar102 + fVar128 + -fVar82 * fVar82;
                  fVar140 = fVar83 * fVar82 - fVar81 * fVar102;
                  fVar108 = fVar81 * fVar102 + fVar83 * fVar82;
                  fVar137 = fVar102 * fVar82 + fVar81 * fVar83;
                  fVar81 = fVar102 * fVar82 - fVar81 * fVar83;
                  pfVar3 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                  fVar96 = *pfVar3;
                  fVar114 = pfVar3[1];
                  fVar6 = pfVar3[2];
                  fVar131 = fVar131 + fVar131;
                  fVar140 = fVar140 + fVar140;
                  fVar107 = fVar107 + fVar107;
                  fVar137 = fVar137 + fVar137;
                  fVar108 = fVar108 + fVar108;
                  fVar81 = fVar81 + fVar81;
                  fVar83 = fVar82 * fVar82 + fVar128 + -fVar102 * fVar102;
                  fVar115 = fVar117 * 1.0 + fVar131 * 0.0 + fVar140 * 0.0;
                  fVar118 = fVar117 * 0.0 + fVar131 * 1.0 + fVar140 * 0.0;
                  fVar121 = fVar117 * 0.0 + fVar131 * 0.0 + fVar140 * 1.0;
                  fVar122 = fVar117 * 0.0 + fVar131 * 0.0 + fVar140 * 0.0;
                  fVar109 = fVar107 * 1.0 + fVar129 * 0.0 + fVar137 * 0.0;
                  fVar110 = fVar107 * 0.0 + fVar129 * 1.0 + fVar137 * 0.0;
                  fVar111 = fVar107 * 0.0 + fVar129 * 0.0 + fVar137 * 1.0;
                  fVar113 = fVar107 * 0.0 + fVar129 * 0.0 + fVar137 * 0.0;
                  fVar117 = fVar108 * 1.0 + fVar81 * 0.0 + fVar83 * 0.0;
                  fVar129 = fVar108 * 0.0 + fVar81 * 1.0 + fVar83 * 0.0;
                  fVar137 = fVar108 * 0.0 + fVar81 * 0.0 + fVar83 * 1.0;
                  fVar97 = fVar108 * 0.0 + fVar81 * 0.0 + fVar83 * 0.0;
                  local_188 = auVar9._4_4_;
                  fStack_184 = auVar9._8_4_;
                  local_198 = auVar9._0_4_;
                  fVar127 = local_198 * fVar115 + fVar109 * 0.0 + fVar117 * 0.0;
                  fVar132 = local_198 * fVar118 + fVar110 * 0.0 + fVar129 * 0.0;
                  fVar134 = local_198 * fVar121 + fVar111 * 0.0 + fVar137 * 0.0;
                  fVar135 = local_198 * fVar122 + fVar113 * 0.0 + fVar97 * 0.0;
                  fVar128 = fVar125 * fVar115 + fVar130 * fVar109 + fVar117 * 0.0;
                  fVar131 = fVar125 * fVar118 + fVar130 * fVar110 + fVar129 * 0.0;
                  fVar140 = fVar125 * fVar121 + fVar130 * fVar111 + fVar137 * 0.0;
                  fVar98 = fVar125 * fVar122 + fVar130 * fVar113 + fVar97 * 0.0;
                  local_168.l.vz.field_0.m128[0] =
                       fVar112 * fVar115 + fVar103 * fVar109 + fVar106 * fVar117;
                  local_168.l.vz.field_0.m128[1] =
                       fVar112 * fVar118 + fVar103 * fVar110 + fVar106 * fVar129;
                  local_168.l.vz.field_0.m128[2] =
                       fVar112 * fVar121 + fVar103 * fVar111 + fVar106 * fVar137;
                  local_168.l.vz.field_0.m128[3] =
                       fVar112 * fVar122 + fVar103 * fVar113 + fVar106 * fVar97;
                  fVar81 = pfVar1[0xf];
                  fVar83 = pfVar1[3];
                  fVar102 = pfVar1[7];
                  fVar82 = pfVar1[0xb];
                  fVar133 = fVar83 * fVar102 + fVar81 * fVar82;
                  fVar107 = fVar83 * fVar102 - fVar81 * fVar82;
                  fVar99 = fVar81 * fVar81 + fVar83 * fVar83 + -fVar102 * fVar102 + -fVar82 * fVar82
                  ;
                  fVar130 = fVar81 * fVar81 - fVar83 * fVar83;
                  fVar139 = fVar102 * fVar102 + fVar130 + -fVar82 * fVar82;
                  fVar138 = fVar83 * fVar82 - fVar81 * fVar102;
                  fVar104 = fVar81 * fVar102 + fVar83 * fVar82;
                  fVar141 = fVar102 * fVar82 + fVar81 * fVar83;
                  fVar108 = fVar102 * fVar82 - fVar81 * fVar83;
                  fVar81 = *pfVar1;
                  fVar83 = pfVar1[4];
                  fVar125 = pfVar1[5];
                  fVar124 = fVar82 * fVar82 + fVar130 + -fVar102 * fVar102;
                  fVar102 = pfVar1[8];
                  fVar82 = pfVar1[9];
                  fVar130 = pfVar1[10];
                  fVar133 = fVar133 + fVar133;
                  fVar138 = fVar138 + fVar138;
                  fVar112 = pfVar1[0xc];
                  fVar103 = pfVar1[0xd];
                  fVar106 = pfVar1[0xe];
                  fVar100 = fVar99 * 1.0 + fVar133 * 0.0 + fVar138 * 0.0;
                  fVar101 = fVar99 * 0.0 + fVar133 * 1.0 + fVar138 * 0.0;
                  fVar138 = fVar99 * 0.0 + fVar133 * 0.0 + fVar138 * 1.0;
                  fVar107 = fVar107 + fVar107;
                  fVar141 = fVar141 + fVar141;
                  fVar104 = fVar104 + fVar104;
                  fVar108 = fVar108 + fVar108;
                  fVar99 = fVar107 * 1.0 + fVar139 * 0.0 + fVar141 * 0.0;
                  fVar133 = fVar107 * 0.0 + fVar139 * 1.0 + fVar141 * 0.0;
                  fVar107 = fVar107 * 0.0 + fVar139 * 0.0 + fVar141 * 1.0;
                  fVar139 = fVar104 * 1.0 + fVar108 * 0.0 + fVar124 * 0.0;
                  fVar141 = fVar104 * 0.0 + fVar108 * 1.0 + fVar124 * 0.0;
                  fVar108 = fVar104 * 0.0 + fVar108 * 0.0 + fVar124 * 1.0;
                  fVar116 = fVar81 * fVar100 + fVar99 * 0.0 + fVar139 * 0.0;
                  fVar119 = fVar81 * fVar101 + fVar133 * 0.0 + fVar141 * 0.0;
                  fVar81 = fVar81 * fVar138 + fVar107 * 0.0 + fVar108 * 0.0;
                  fVar104 = fVar83 * fVar100 + fVar125 * fVar99 + fVar139 * 0.0;
                  fVar124 = fVar83 * fVar101 + fVar125 * fVar133 + fVar141 * 0.0;
                  fVar105 = fVar83 * fVar138 + fVar125 * fVar107 + fVar108 * 0.0;
                  fVar123 = fVar102 * fVar100 + fVar82 * fVar99 + fVar130 * fVar139;
                  fVar126 = fVar102 * fVar101 + fVar82 * fVar133 + fVar130 * fVar141;
                  fVar130 = fVar102 * fVar138 + fVar82 * fVar107 + fVar130 * fVar108;
                  fVar102 = fVar112 * fVar100 + fVar103 * fVar99 + fVar106 * fVar139 +
                            pfVar1[1] + 0.0;
                  fVar99 = fVar112 * fVar101 + fVar103 * fVar133 + fVar106 * fVar141 +
                           pfVar1[2] + 0.0;
                  fVar133 = fVar112 * fVar138 + fVar103 * fVar107 + fVar106 * fVar108 +
                            pfVar1[6] + 0.0;
                  fVar108 = fVar116 * fVar127 +
                            fVar119 * fVar128 + fVar81 * local_168.l.vz.field_0.m128[0];
                  local_198 = fVar116 * fVar132 +
                              fVar119 * fVar131 + fVar81 * local_168.l.vz.field_0.m128[1];
                  fVar83 = fVar116 * fVar134 +
                           fVar119 * fVar140 + fVar81 * local_168.l.vz.field_0.m128[2];
                  fVar82 = fVar123 * fVar127 +
                           fVar126 * fVar128 + fVar130 * local_168.l.vz.field_0.m128[0];
                  fVar125 = fVar123 * fVar132 +
                            fVar126 * fVar131 + fVar130 * local_168.l.vz.field_0.m128[1];
                  fVar107 = fVar123 * fVar134 +
                            fVar126 * fVar140 + fVar130 * local_168.l.vz.field_0.m128[2];
                  uVar74 = extraout_RDX_08;
                  fVar130 = fVar123 * fVar135 +
                            fVar126 * fVar98 + fVar130 * local_168.l.vz.field_0.m128[3];
                  fVar81 = fVar116 * fVar135 +
                           fVar119 * fVar98 + fVar81 * local_168.l.vz.field_0.m128[3];
                  fVar112 = fVar102 * fVar127 +
                            fVar99 * fVar128 + fVar133 * local_168.l.vz.field_0.m128[0] +
                            fVar96 * fVar115 + fVar114 * fVar109 + fVar6 * fVar117 + local_188 + 0.0
                  ;
                  fVar103 = fVar102 * fVar132 +
                            fVar99 * fVar131 + fVar133 * local_168.l.vz.field_0.m128[1] +
                            fVar96 * fVar118 + fVar114 * fVar110 + fVar6 * fVar129 +
                            fStack_184 + 0.0;
                  fVar106 = fVar102 * fVar134 +
                            fVar99 * fVar140 + fVar133 * local_168.l.vz.field_0.m128[2] +
                            fVar96 * fVar121 + fVar114 * fVar111 + fVar6 * fVar137 + pfVar2[2] + 0.0
                  ;
                  fVar96 = fVar102 * fVar135 +
                           fVar99 * fVar98 + fVar133 * local_168.l.vz.field_0.m128[3] +
                           fVar96 * fVar122 + fVar114 * fVar113 + fVar6 * fVar97 + 0.0;
                  uVar58 = fVar104 * fVar127 +
                           fVar124 * fVar128 + fVar105 * local_168.l.vz.field_0.m128[0];
                  uVar120 = fVar104 * fVar132 +
                            fVar124 * fVar131 + fVar105 * local_168.l.vz.field_0.m128[1];
                  fVar114 = fVar104 * fVar134 +
                            fVar124 * fVar140 + fVar105 * local_168.l.vz.field_0.m128[2];
                  fVar102 = fVar104 * fVar135 +
                            fVar124 * fVar98 + fVar105 * local_168.l.vz.field_0.m128[3];
                }
              }
              else {
                pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x24);
                auVar32._4_4_ = -(uint)(pfVar2[1] != 0.0);
                auVar32._0_4_ = -(uint)(*pfVar2 != 0.0);
                auVar32._8_4_ = -(uint)(pfVar2[2] != 1.0);
                auVar32._12_4_ = -(uint)(pfVar2[3] != 0.0);
                uVar77 = movmskps(uVar77,auVar32);
                if ((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) ||
                   (((uVar77 & 4) != 0 ||
                    (bVar72 = ((byte)uVar77 & 8) >> 3, uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72)
                    , bVar72 != 0)))) goto LAB_0015c92b;
                pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x14);
                auVar33._4_4_ = -(uint)(pfVar2[1] != 0.0);
                auVar33._0_4_ = -(uint)(*pfVar2 != 0.0);
                auVar33._8_4_ = -(uint)(pfVar2[2] != 0.0);
                auVar33._12_4_ = -(uint)(pfVar2[3] != 1.0);
                uVar77 = movmskps(uVar77,auVar33);
                if (((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) || ((uVar77 & 4) != 0))
                   || (bVar72 = ((byte)uVar77 & 8) >> 3,
                      uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72), bVar72 != 0))
                goto LAB_0015c92b;
                pfVar2 = (float *)((long)pAVar13 + lVar75 + -4);
                auVar34._4_4_ = -(uint)(pfVar2[1] != 0.0);
                auVar34._0_4_ = -(uint)(*pfVar2 != 0.0);
                auVar34._8_4_ = -(uint)(pfVar2[2] != 0.0);
                auVar34._12_4_ = -(uint)(pfVar2[3] != 0.0);
                uVar77 = movmskps(uVar77,auVar34);
                if ((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) || ((uVar77 & 4) != 0))
                goto LAB_0015c92b;
                bVar72 = ((byte)uVar77 & 8) >> 3;
                uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
                uVar74 = (ulong)uVar77;
                if ((bVar72 != 0) ||
                   ((bVar10 != false &&
                    ((fVar81 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 0xc),
                     fVar81 != 1.0 || (NAN(fVar81))))))) goto LAB_0015c92b;
                fVar108 = *pfVar1;
                local_198 = pfVar1[1];
                fVar83 = pfVar1[2];
                fVar81 = pfVar1[3];
                uVar58 = pfVar1[4];
                uVar120 = pfVar1[5];
                fVar114 = pfVar1[6];
                fVar102 = pfVar1[7];
                fVar82 = pfVar1[8];
                fVar125 = pfVar1[9];
                fVar107 = pfVar1[10];
                fVar130 = pfVar1[0xb];
                fVar112 = pfVar1[0xc];
                fVar103 = pfVar1[0xd];
                fVar106 = pfVar1[0xe];
                fVar96 = pfVar1[0xf];
                local_168.l.vy.field_0._8_1_ = bVar57;
              }
LAB_0015d390:
              pfVar1 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x30))->field_0
                                + lVar75);
              *pfVar1 = fVar108;
              pfVar1[1] = local_198;
              pfVar1[2] = fVar83;
              pfVar1[3] = fVar81;
              pfVar1 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x20))->field_0
                                + lVar75);
              *pfVar1 = (float)uVar58;
              pfVar1[1] = (float)uVar120;
              pfVar1[2] = fVar114;
              pfVar1[3] = fVar102;
              pfVar1 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x10))->field_0
                                + lVar75);
              *pfVar1 = fVar82;
              pfVar1[1] = fVar125;
              pfVar1[2] = fVar107;
              pfVar1[3] = fVar130;
              pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + lVar75);
              *pfVar1 = fVar112;
              pfVar1[1] = fVar103;
              pfVar1[2] = fVar106;
              pfVar1[3] = fVar96;
              lVar75 = lVar75 + 0x40;
              uVar61 = local_168.l.vy.field_0._0_8_;
            }
          }
          else {
            if (sVar12 != puVar76[2]) {
              prVar70 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar70,"number of transformations does not match");
              __cxa_throw(prVar70,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            fVar81 = (spaces->time_range).lower;
            fVar83 = (spaces->time_range).upper;
            fVar102 = (float)*puVar76;
            fVar82 = (float)((ulong)*puVar76 >> 0x20);
            uVar77 = -(uint)(fVar81 < fVar102);
            uVar79 = -(uint)(fVar83 < fVar82);
            local_178._0_8_ =
                 CONCAT44(~uVar79 & (uint)fVar82,~uVar77 & (uint)fVar81) |
                 CONCAT44((uint)fVar83 & uVar79,(uint)fVar102 & uVar77);
            local_168.l.vy.field_0._0_8_ =
                 (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            local_168.l.vx.field_0._0_8_ = 0;
            local_168.l.vx.field_0._8_8_ = 0;
            if (sVar12 != 0) {
              local_168.l.vy.field_0._0_8_ = alignedMalloc(sVar12 << 6,0x10);
              uVar74 = extraout_RDX_11;
              local_168.l.vx.field_0._8_8_ = sVar12;
            }
            uVar61 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
            if (spaces->quaternion == false) {
              uVar61 = ZEXT48(*(uint *)(puVar76 + 5));
            }
            local_168.l.vy.field_0._8_1_ = (undefined1)uVar61;
            lVar75 = 0x30;
            local_168.l.vx.field_0._0_8_ = local_168.l.vx.field_0._8_8_;
            for (uVar73 = 0; uVar77 = (uint)uVar74, uVar73 < (spaces->spaces).size_active;
                uVar73 = uVar73 + 1) {
              pAVar13 = (spaces->spaces).items;
              lVar14 = puVar76[4];
              bVar10 = spaces->quaternion;
              bVar57 = *(byte *)(puVar76 + 5);
              local_168.l.vy.field_0._8_1_ = 0;
              fVar81 = *(float *)((long)pAVar13 + lVar75 + -0x30);
              uVar7 = *(undefined8 *)((long)pAVar13 + lVar75 + -0x2c);
              fVar83 = (float)((ulong)uVar7 >> 0x20);
              local_198 = (float)uVar7;
              if (((((fVar81 != 1.0) || (NAN(fVar81))) || (local_198 != 0.0)) ||
                  ((NAN(local_198) || (fVar83 != 0.0)))) || (NAN(fVar83))) {
LAB_0015d580:
                uVar7 = *(undefined8 *)(lVar14 + -0x30 + lVar75);
                fVar102 = (float)uVar7;
                fVar112 = (float)((ulong)uVar7 >> 0x20);
                iVar78 = -(uint)(fVar102 != 1.0);
                iVar80 = -(uint)(fVar112 != 0.0);
                auVar91._4_4_ = iVar80;
                auVar91._0_4_ = iVar78;
                auVar91._8_4_ = iVar80;
                auVar91._12_4_ = iVar80;
                auVar90._8_8_ = auVar91._8_8_;
                auVar90._4_4_ = iVar78;
                auVar90._0_4_ = iVar78;
                uVar77 = movmskpd(uVar77,auVar90);
                uVar74 = (ulong)uVar77;
                fVar81 = *(float *)(lVar14 + -0x28 + lVar75);
                if ((uVar77 & 1) == 0) {
                  bVar72 = (byte)uVar77 >> 1;
                  uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
                  uVar74 = (ulong)uVar77;
                  if (((bVar72 == 0) && (fVar81 == 0.0)) && (!NAN(fVar81))) {
                    pfVar1 = (float *)(lVar14 + -0x24 + lVar75);
                    auVar54._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar54._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar54._8_4_ = -(uint)(pfVar1[2] != 1.0);
                    auVar54._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar77 = movmskps(uVar77,auVar54);
                    uVar74 = (ulong)uVar77;
                    if ((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                       ((uVar77 & 4) == 0)) {
                      bVar72 = ((byte)uVar77 & 8) >> 3;
                      uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
                      uVar74 = (ulong)uVar77;
                      if (bVar72 == 0) {
                        pfVar1 = (float *)(lVar14 + -0x14 + lVar75);
                        auVar55._4_4_ = -(uint)(pfVar1[1] != 0.0);
                        auVar55._0_4_ = -(uint)(*pfVar1 != 0.0);
                        auVar55._8_4_ = -(uint)(pfVar1[2] != 0.0);
                        auVar55._12_4_ = -(uint)(pfVar1[3] != 1.0);
                        uVar77 = movmskps(uVar77,auVar55);
                        uVar74 = (ulong)uVar77;
                        if ((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                           ((uVar77 & 4) == 0)) {
                          bVar72 = ((byte)uVar77 & 8) >> 3;
                          uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
                          uVar74 = (ulong)uVar77;
                          if (bVar72 == 0) {
                            pfVar1 = (float *)(lVar14 + -4 + lVar75);
                            auVar56._4_4_ = -(uint)(pfVar1[1] != 0.0);
                            auVar56._0_4_ = -(uint)(*pfVar1 != 0.0);
                            auVar56._8_4_ = -(uint)(pfVar1[2] != 0.0);
                            auVar56._12_4_ = -(uint)(pfVar1[3] != 0.0);
                            uVar77 = movmskps(uVar77,auVar56);
                            uVar74 = (ulong)uVar77;
                            if ((((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                                 ((uVar77 & 4) == 0)) &&
                                (bVar72 = ((byte)uVar77 & 8) >> 3,
                                uVar74 = (ulong)CONCAT31((int3)(uVar77 >> 8),bVar72), bVar72 == 0))
                               && ((bVar57 == 0 ||
                                   ((fVar82 = *(float *)(lVar14 + 0xc + lVar75), fVar82 == 1.0 &&
                                    (!NAN(fVar82))))))) {
                              pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x30);
                              fVar108 = *pfVar1;
                              local_198 = pfVar1[1];
                              fVar83 = pfVar1[2];
                              fVar81 = pfVar1[3];
                              pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x20);
                              uVar58 = *pfVar1;
                              uVar120 = pfVar1[1];
                              fVar114 = pfVar1[2];
                              fVar102 = pfVar1[3];
                              pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x10);
                              fVar82 = *pfVar1;
                              fVar125 = pfVar1[1];
                              fVar107 = pfVar1[2];
                              fVar130 = pfVar1[3];
                              pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                              fVar112 = *pfVar1;
                              fVar103 = pfVar1[1];
                              fVar106 = pfVar1[2];
                              fVar96 = pfVar1[3];
                              local_168.l.vy.field_0._8_1_ = bVar10;
                              goto LAB_0015e008;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                if ((bVar10 == false) && (bVar57 == 0)) {
                  pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x30);
                  fVar131 = *pfVar1;
                  fVar137 = pfVar1[1];
                  fVar140 = pfVar1[2];
                  fVar97 = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x20);
                  fVar98 = *pfVar1;
                  fVar99 = pfVar1[1];
                  fVar133 = pfVar1[2];
                  fVar100 = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x10);
                  fVar101 = *pfVar1;
                  fVar138 = pfVar1[1];
                  fVar104 = pfVar1[2];
                  fVar139 = pfVar1[3];
                  fVar108 = fVar102 * fVar131 + fVar112 * fVar98 + fVar81 * fVar101;
                  local_198 = fVar102 * fVar137 + fVar112 * fVar99 + fVar81 * fVar138;
                  fVar83 = fVar102 * fVar140 + fVar112 * fVar133 + fVar81 * fVar104;
                  fVar6 = *(float *)(lVar14 + -0x20 + lVar75);
                  fVar117 = *(float *)(lVar14 + -0x1c + lVar75);
                  fVar128 = *(float *)(lVar14 + -0x18 + lVar75);
                  fVar130 = *(float *)(lVar14 + -0x10 + lVar75);
                  fVar103 = *(float *)(lVar14 + -0xc + lVar75);
                  fVar106 = *(float *)(lVar14 + -8 + lVar75);
                  fVar82 = fVar130 * fVar131 + fVar103 * fVar98 + fVar106 * fVar101;
                  fVar125 = fVar130 * fVar137 + fVar103 * fVar99 + fVar106 * fVar138;
                  fVar107 = fVar130 * fVar140 + fVar103 * fVar133 + fVar106 * fVar104;
                  fVar96 = *(float *)(lVar14 + lVar75);
                  fVar114 = *(float *)(lVar14 + 4 + lVar75);
                  fVar129 = *(float *)(lVar14 + 8 + lVar75);
                  pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                  fVar130 = fVar130 * fVar97 + fVar103 * fVar100 + fVar106 * fVar139;
                  fVar81 = fVar102 * fVar97 + fVar112 * fVar100 + fVar81 * fVar139;
                  fVar112 = fVar96 * fVar131 + fVar114 * fVar98 + fVar129 * fVar101 + *pfVar1;
                  fVar103 = fVar96 * fVar137 + fVar114 * fVar99 + fVar129 * fVar138 + pfVar1[1];
                  fVar106 = fVar96 * fVar140 + fVar114 * fVar133 + fVar129 * fVar104 + pfVar1[2];
                  fVar96 = fVar96 * fVar97 + fVar114 * fVar100 + fVar129 * fVar139 + pfVar1[3];
                  uVar58 = fVar6 * fVar131 + fVar117 * fVar98 + fVar128 * fVar101;
                  uVar120 = fVar6 * fVar137 + fVar117 * fVar99 + fVar128 * fVar138;
                  fVar114 = fVar6 * fVar140 + fVar117 * fVar133 + fVar128 * fVar104;
                  fVar102 = fVar6 * fVar97 + fVar117 * fVar100 + fVar128 * fVar139;
                }
                else if ((bVar10 == false) || (bVar57 == 0)) {
                  if ((bVar10 == false) || (bVar57 != 0)) {
                    if (((local_198 != 0.0) ||
                        (((NAN(local_198) || (fVar83 != 0.0)) || (NAN(fVar83))))) ||
                       (uVar7 = *(undefined8 *)((long)pAVar13 + lVar75 + -0x10),
                       auVar38._4_4_ = -(uint)(*(float *)((long)pAVar13 + lVar75 + -0x20) != 0.0),
                       auVar38._0_4_ = -(uint)(*(float *)((long)pAVar13 + lVar75 + -0x18) != 0.0),
                       auVar38._8_4_ = -(uint)((float)uVar7 != 0.0),
                       auVar38._12_4_ = -(uint)((float)((ulong)uVar7 >> 0x20) != 0.0),
                       uVar58 = movmskps((int)CONCAT71((int7)((ulong)uVar61 >> 8),bVar57),auVar38),
                       (char)uVar58 != '\0')) {
                      poVar60 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar60);
                      uVar74 = extraout_RDX_14;
                    }
                    pfVar2 = (float *)(lVar14 + -0x30 + lVar75);
                    fVar81 = pfVar2[3];
                    pfVar3 = (float *)(lVar14 + -0x20 + lVar75);
                    uVar58 = *pfVar3;
                    fVar102 = pfVar3[3];
                    pfVar4 = (float *)(lVar14 + -0x10 + lVar75);
                    fVar82 = *pfVar4;
                    fVar125 = pfVar4[1];
                    fVar130 = pfVar4[3];
                    pfVar1 = (float *)(lVar14 + lVar75);
                    fVar112 = *pfVar1;
                    fVar103 = pfVar1[1];
                    fVar106 = pfVar1[2];
                    fVar96 = pfVar1[3];
                    uVar61 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                    fVar108 = *(float *)((long)pAVar13 + lVar75 + -0x30) * *pfVar2;
                    local_198 = pfVar2[1] + (float)uVar61;
                    fVar83 = pfVar2[2] + (float)((ulong)uVar61 >> 0x20);
                    fVar114 = pfVar3[2] + *(float *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 8);
                    uVar120 = pfVar3[1] * *(float *)((long)pAVar13 + lVar75 + -0x1c);
                    fVar107 = pfVar4[2] * *(float *)((long)pAVar13 + lVar75 + -8);
                    local_168.l.vy.field_0._8_1_ = 1;
                  }
                  else {
                    local_e8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 0xc));
                    local_c8 = ZEXT416(*(uint *)((long)pAVar13 + lVar75 + -0x24));
                    local_b8 = ZEXT416(*(uint *)((long)pAVar13 + lVar75 + -0x14));
                    local_f8 = ZEXT416(*(uint *)((long)pAVar13 + lVar75 + -4));
                    pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x20);
                    local_118 = *pfVar1;
                    fStack_114 = pfVar1[1];
                    fStack_d0 = pfVar1[2];
                    fStack_10c = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x10);
                    local_108 = *pfVar1;
                    fStack_104 = pfVar1[1];
                    fStack_100 = pfVar1[2];
                    fStack_fc = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x30);
                    local_98 = *pfVar1;
                    fStack_8c = pfVar1[1];
                    pfVar1 = (float *)(lVar14 + -0x30 + lVar75);
                    fVar81 = *pfVar1;
                    fVar102 = pfVar1[1];
                    fVar82 = pfVar1[2];
                    pfVar1 = (float *)(lVar14 + -0x20 + lVar75);
                    fVar125 = *pfVar1;
                    fVar130 = pfVar1[1];
                    fVar112 = pfVar1[2];
                    puVar5 = (undefined8 *)(lVar14 + -0x10 + lVar75);
                    local_128 = *puVar5;
                    uStack_120 = puVar5[1];
                    pfVar1 = (float *)(lVar14 + lVar75);
                    fVar103 = *pfVar1;
                    fVar106 = pfVar1[1];
                    fVar96 = pfVar1[2];
                    fVar108 = fVar81 * local_98 + fVar102 * local_118 + fVar82 * local_108;
                    fVar114 = fVar81 * 0.0 + fVar102 * fStack_114 + fVar82 * fStack_104;
                    fVar81 = fVar81 * 0.0 + fVar102 * 0.0 + fVar82 * fStack_100;
                    local_168.l.vz.field_0.m128[0] =
                         fVar125 * local_98 + fVar130 * local_118 + fVar112 * local_108;
                    local_168.l.vz.field_0.m128[1] =
                         fVar125 * 0.0 + fVar130 * fStack_114 + fVar112 * fStack_104;
                    local_168.l.vz.field_0.m128[2] =
                         fVar125 * 0.0 + fVar130 * 0.0 + fVar112 * fStack_100;
                    local_168.l.vz.field_0.m128[3] =
                         fVar125 * fStack_8c + fVar130 * fStack_10c + fVar112 * fStack_fc;
                    fStack_110 = 0.0;
                    fStack_94 = 0.0;
                    fStack_90 = 0.0;
                    pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                    local_a8._0_4_ =
                         fVar103 * local_98 + fVar106 * local_118 + fVar96 * local_108 + *pfVar1;
                    local_a8._4_4_ =
                         fVar103 * 0.0 + fVar106 * fStack_114 + fVar96 * fStack_104 + pfVar1[1];
                    fStack_a0 = fVar103 * 0.0 + fVar106 * 0.0 + fVar96 * fStack_100 + pfVar1[2];
                    register0x0000128c =
                         fVar103 * fStack_8c + fVar106 * fStack_10c + fVar96 * fStack_fc + pfVar1[3]
                    ;
                    local_d8 = local_118;
                    fStack_d4 = fStack_114;
                    fStack_cc = fStack_10c;
                    if ((((fVar114 != 0.0) || (NAN(fVar114))) ||
                        ((fVar81 != 0.0 ||
                         ((NAN(fVar81) || (local_168.l.vz.field_0.m128[2] != 0.0)))))) ||
                       (NAN(local_168.l.vz.field_0.m128[2]))) {
                      poVar60 = std::operator<<((ostream *)&std::cout,
                                                "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                               );
                      std::endl<char,std::char_traits<char>>(poVar60);
                      uVar74 = extraout_RDX_13;
                    }
                    fVar82 = local_98 * (float)local_128 +
                             local_118 * local_128._4_4_ + local_108 * (float)uStack_120;
                    fVar125 = fStack_94 * (float)local_128 +
                              fStack_114 * local_128._4_4_ + fStack_104 * (float)uStack_120;
                    fVar107 = fStack_90 * (float)local_128 +
                              fStack_110 * local_128._4_4_ + fStack_100 * (float)uStack_120;
                    local_168.l.vy.field_0._8_1_ = 1;
                    fVar130 = (float)local_f8._0_4_;
                    fVar81 = (float)local_c8._0_4_;
                    fVar112 = (float)local_a8._0_4_;
                    fVar103 = (float)local_a8._4_4_;
                    fVar106 = fStack_a0;
                    fVar96 = (float)local_e8._0_4_;
                    uVar58 = local_168.l.vz.field_0.m128[0];
                    uVar120 = local_168.l.vz.field_0.m128[1];
                    fVar114 = fStack_d0;
                    fVar102 = (float)local_b8._0_4_;
                  }
                }
                else {
                  poVar60 = std::operator<<((ostream *)&std::cout,
                                            "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                           );
                  std::endl<char,std::char_traits<char>>(poVar60);
                  fVar81 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 0xc);
                  fVar83 = *(float *)((long)pAVar13 + lVar75 + -0x24);
                  fVar102 = *(float *)((long)pAVar13 + lVar75 + -0x14);
                  fVar82 = *(float *)((long)pAVar13 + lVar75 + -4);
                  auVar9 = *(undefined1 (*) [16])((long)pAVar13 + lVar75 + -0x30);
                  pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x20);
                  fVar125 = *pfVar2;
                  fVar130 = pfVar2[1];
                  pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x10);
                  fVar112 = *pfVar1;
                  fVar103 = pfVar1[1];
                  fVar106 = pfVar1[2];
                  fVar131 = fVar83 * fVar102 + fVar81 * fVar82;
                  fVar107 = fVar83 * fVar102 - fVar81 * fVar82;
                  fVar117 = fVar81 * fVar81 + fVar83 * fVar83 + -fVar102 * fVar102 +
                            -fVar82 * fVar82;
                  fVar128 = fVar81 * fVar81 - fVar83 * fVar83;
                  fVar129 = fVar102 * fVar102 + fVar128 + -fVar82 * fVar82;
                  fVar140 = fVar83 * fVar82 - fVar81 * fVar102;
                  fVar108 = fVar81 * fVar102 + fVar83 * fVar82;
                  fVar137 = fVar102 * fVar82 + fVar81 * fVar83;
                  fVar81 = fVar102 * fVar82 - fVar81 * fVar83;
                  pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                  fVar96 = *pfVar1;
                  fVar114 = pfVar1[1];
                  fVar6 = pfVar1[2];
                  fVar131 = fVar131 + fVar131;
                  fVar140 = fVar140 + fVar140;
                  fVar107 = fVar107 + fVar107;
                  fVar137 = fVar137 + fVar137;
                  fVar108 = fVar108 + fVar108;
                  fVar81 = fVar81 + fVar81;
                  fVar83 = fVar82 * fVar82 + fVar128 + -fVar102 * fVar102;
                  fVar115 = fVar117 * 1.0 + fVar131 * 0.0 + fVar140 * 0.0;
                  fVar118 = fVar117 * 0.0 + fVar131 * 1.0 + fVar140 * 0.0;
                  fVar121 = fVar117 * 0.0 + fVar131 * 0.0 + fVar140 * 1.0;
                  fVar122 = fVar117 * 0.0 + fVar131 * 0.0 + fVar140 * 0.0;
                  fVar109 = fVar107 * 1.0 + fVar129 * 0.0 + fVar137 * 0.0;
                  fVar110 = fVar107 * 0.0 + fVar129 * 1.0 + fVar137 * 0.0;
                  fVar111 = fVar107 * 0.0 + fVar129 * 0.0 + fVar137 * 1.0;
                  fVar113 = fVar107 * 0.0 + fVar129 * 0.0 + fVar137 * 0.0;
                  fVar117 = fVar108 * 1.0 + fVar81 * 0.0 + fVar83 * 0.0;
                  fVar129 = fVar108 * 0.0 + fVar81 * 1.0 + fVar83 * 0.0;
                  fVar137 = fVar108 * 0.0 + fVar81 * 0.0 + fVar83 * 1.0;
                  fVar97 = fVar108 * 0.0 + fVar81 * 0.0 + fVar83 * 0.0;
                  local_188 = auVar9._4_4_;
                  fStack_184 = auVar9._8_4_;
                  local_198 = auVar9._0_4_;
                  fVar127 = local_198 * fVar115 + fVar109 * 0.0 + fVar117 * 0.0;
                  fVar132 = local_198 * fVar118 + fVar110 * 0.0 + fVar129 * 0.0;
                  fVar134 = local_198 * fVar121 + fVar111 * 0.0 + fVar137 * 0.0;
                  fVar135 = local_198 * fVar122 + fVar113 * 0.0 + fVar97 * 0.0;
                  fVar128 = fVar125 * fVar115 + fVar130 * fVar109 + fVar117 * 0.0;
                  fVar131 = fVar125 * fVar118 + fVar130 * fVar110 + fVar129 * 0.0;
                  fVar140 = fVar125 * fVar121 + fVar130 * fVar111 + fVar137 * 0.0;
                  fVar98 = fVar125 * fVar122 + fVar130 * fVar113 + fVar97 * 0.0;
                  local_168.l.vz.field_0.m128[0] =
                       fVar112 * fVar115 + fVar103 * fVar109 + fVar106 * fVar117;
                  local_168.l.vz.field_0.m128[1] =
                       fVar112 * fVar118 + fVar103 * fVar110 + fVar106 * fVar129;
                  local_168.l.vz.field_0.m128[2] =
                       fVar112 * fVar121 + fVar103 * fVar111 + fVar106 * fVar137;
                  local_168.l.vz.field_0.m128[3] =
                       fVar112 * fVar122 + fVar103 * fVar113 + fVar106 * fVar97;
                  fVar81 = *(float *)(lVar14 + 0xc + lVar75);
                  fVar83 = *(float *)(lVar14 + -0x24 + lVar75);
                  fVar102 = *(float *)(lVar14 + -0x14 + lVar75);
                  fVar82 = *(float *)(lVar14 + -4 + lVar75);
                  fVar133 = fVar83 * fVar102 + fVar81 * fVar82;
                  fVar107 = fVar83 * fVar102 - fVar81 * fVar82;
                  fVar99 = fVar81 * fVar81 + fVar83 * fVar83 + -fVar102 * fVar102 + -fVar82 * fVar82
                  ;
                  fVar130 = fVar81 * fVar81 - fVar83 * fVar83;
                  fVar139 = fVar102 * fVar102 + fVar130 + -fVar82 * fVar82;
                  fVar138 = fVar83 * fVar82 - fVar81 * fVar102;
                  fVar104 = fVar81 * fVar102 + fVar83 * fVar82;
                  fVar141 = fVar102 * fVar82 + fVar81 * fVar83;
                  fVar108 = fVar102 * fVar82 - fVar81 * fVar83;
                  pfVar3 = (float *)(lVar14 + -0x30 + lVar75);
                  fVar81 = *pfVar3;
                  pfVar4 = (float *)(lVar14 + -0x20 + lVar75);
                  fVar83 = *pfVar4;
                  fVar125 = pfVar4[1];
                  fVar124 = fVar82 * fVar82 + fVar130 + -fVar102 * fVar102;
                  pfVar1 = (float *)(lVar14 + -0x10 + lVar75);
                  fVar102 = *pfVar1;
                  fVar82 = pfVar1[1];
                  fVar130 = pfVar1[2];
                  fVar133 = fVar133 + fVar133;
                  fVar138 = fVar138 + fVar138;
                  pfVar1 = (float *)(lVar14 + lVar75);
                  fVar112 = *pfVar1;
                  fVar103 = pfVar1[1];
                  fVar106 = pfVar1[2];
                  fVar100 = fVar99 * 1.0 + fVar133 * 0.0 + fVar138 * 0.0;
                  fVar101 = fVar99 * 0.0 + fVar133 * 1.0 + fVar138 * 0.0;
                  fVar138 = fVar99 * 0.0 + fVar133 * 0.0 + fVar138 * 1.0;
                  fVar107 = fVar107 + fVar107;
                  fVar141 = fVar141 + fVar141;
                  fVar104 = fVar104 + fVar104;
                  fVar108 = fVar108 + fVar108;
                  fVar99 = fVar107 * 1.0 + fVar139 * 0.0 + fVar141 * 0.0;
                  fVar133 = fVar107 * 0.0 + fVar139 * 1.0 + fVar141 * 0.0;
                  fVar107 = fVar107 * 0.0 + fVar139 * 0.0 + fVar141 * 1.0;
                  fVar139 = fVar104 * 1.0 + fVar108 * 0.0 + fVar124 * 0.0;
                  fVar141 = fVar104 * 0.0 + fVar108 * 1.0 + fVar124 * 0.0;
                  fVar108 = fVar104 * 0.0 + fVar108 * 0.0 + fVar124 * 1.0;
                  fVar116 = fVar81 * fVar100 + fVar99 * 0.0 + fVar139 * 0.0;
                  fVar119 = fVar81 * fVar101 + fVar133 * 0.0 + fVar141 * 0.0;
                  fVar81 = fVar81 * fVar138 + fVar107 * 0.0 + fVar108 * 0.0;
                  fVar104 = fVar83 * fVar100 + fVar125 * fVar99 + fVar139 * 0.0;
                  fVar124 = fVar83 * fVar101 + fVar125 * fVar133 + fVar141 * 0.0;
                  fVar105 = fVar83 * fVar138 + fVar125 * fVar107 + fVar108 * 0.0;
                  fVar123 = fVar102 * fVar100 + fVar82 * fVar99 + fVar130 * fVar139;
                  fVar126 = fVar102 * fVar101 + fVar82 * fVar133 + fVar130 * fVar141;
                  fVar130 = fVar102 * fVar138 + fVar82 * fVar107 + fVar130 * fVar108;
                  fVar102 = fVar112 * fVar100 + fVar103 * fVar99 + fVar106 * fVar139 +
                            pfVar3[1] + 0.0;
                  fVar99 = fVar112 * fVar101 + fVar103 * fVar133 + fVar106 * fVar141 +
                           pfVar3[2] + 0.0;
                  fVar133 = fVar112 * fVar138 + fVar103 * fVar107 + fVar106 * fVar108 +
                            pfVar4[2] + 0.0;
                  fVar108 = fVar116 * fVar127 +
                            fVar119 * fVar128 + fVar81 * local_168.l.vz.field_0.m128[0];
                  local_198 = fVar116 * fVar132 +
                              fVar119 * fVar131 + fVar81 * local_168.l.vz.field_0.m128[1];
                  fVar83 = fVar116 * fVar134 +
                           fVar119 * fVar140 + fVar81 * local_168.l.vz.field_0.m128[2];
                  fVar82 = fVar123 * fVar127 +
                           fVar126 * fVar128 + fVar130 * local_168.l.vz.field_0.m128[0];
                  fVar125 = fVar123 * fVar132 +
                            fVar126 * fVar131 + fVar130 * local_168.l.vz.field_0.m128[1];
                  fVar107 = fVar123 * fVar134 +
                            fVar126 * fVar140 + fVar130 * local_168.l.vz.field_0.m128[2];
                  uVar74 = extraout_RDX_12;
                  fVar130 = fVar123 * fVar135 +
                            fVar126 * fVar98 + fVar130 * local_168.l.vz.field_0.m128[3];
                  fVar81 = fVar116 * fVar135 +
                           fVar119 * fVar98 + fVar81 * local_168.l.vz.field_0.m128[3];
                  fVar112 = fVar102 * fVar127 +
                            fVar99 * fVar128 + fVar133 * local_168.l.vz.field_0.m128[0] +
                            fVar96 * fVar115 + fVar114 * fVar109 + fVar6 * fVar117 + local_188 + 0.0
                  ;
                  fVar103 = fVar102 * fVar132 +
                            fVar99 * fVar131 + fVar133 * local_168.l.vz.field_0.m128[1] +
                            fVar96 * fVar118 + fVar114 * fVar110 + fVar6 * fVar129 +
                            fStack_184 + 0.0;
                  fVar106 = fVar102 * fVar134 +
                            fVar99 * fVar140 + fVar133 * local_168.l.vz.field_0.m128[2] +
                            fVar96 * fVar121 + fVar114 * fVar111 + fVar6 * fVar137 + pfVar2[2] + 0.0
                  ;
                  fVar96 = fVar102 * fVar135 +
                           fVar99 * fVar98 + fVar133 * local_168.l.vz.field_0.m128[3] +
                           fVar96 * fVar122 + fVar114 * fVar113 + fVar6 * fVar97 + 0.0;
                  uVar58 = fVar104 * fVar127 +
                           fVar124 * fVar128 + fVar105 * local_168.l.vz.field_0.m128[0];
                  uVar120 = fVar104 * fVar132 +
                            fVar124 * fVar131 + fVar105 * local_168.l.vz.field_0.m128[1];
                  fVar114 = fVar104 * fVar134 +
                            fVar124 * fVar140 + fVar105 * local_168.l.vz.field_0.m128[2];
                  fVar102 = fVar104 * fVar135 +
                            fVar124 * fVar98 + fVar105 * local_168.l.vz.field_0.m128[3];
                }
              }
              else {
                pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x24);
                auVar9._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar9._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar9._8_4_ = -(uint)(pfVar1[2] != 1.0);
                auVar9._12_4_ = -(uint)(pfVar1[3] != 0.0);
                uVar77 = movmskps(uVar77,auVar9);
                if ((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) ||
                   (((uVar77 & 4) != 0 ||
                    (bVar72 = ((byte)uVar77 & 8) >> 3, uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72)
                    , bVar72 != 0)))) goto LAB_0015d580;
                pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x14);
                auVar36._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar36._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar36._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar36._12_4_ = -(uint)(pfVar1[3] != 1.0);
                uVar77 = movmskps(uVar77,auVar36);
                if (((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) || ((uVar77 & 4) != 0))
                   || (bVar72 = ((byte)uVar77 & 8) >> 3,
                      uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72), bVar72 != 0))
                goto LAB_0015d580;
                pfVar1 = (float *)((long)pAVar13 + lVar75 + -4);
                auVar37._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar37._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar37._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar37._12_4_ = -(uint)(pfVar1[3] != 0.0);
                uVar77 = movmskps(uVar77,auVar37);
                if ((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) || ((uVar77 & 4) != 0))
                goto LAB_0015d580;
                bVar72 = ((byte)uVar77 & 8) >> 3;
                uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
                uVar74 = (ulong)uVar77;
                if ((bVar72 != 0) ||
                   ((bVar10 != false &&
                    ((fVar81 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 0xc),
                     fVar81 != 1.0 || (NAN(fVar81))))))) goto LAB_0015d580;
                pfVar1 = (float *)(lVar14 + -0x30 + lVar75);
                fVar108 = *pfVar1;
                local_198 = pfVar1[1];
                fVar83 = pfVar1[2];
                fVar81 = pfVar1[3];
                pfVar1 = (float *)(lVar14 + -0x20 + lVar75);
                uVar58 = *pfVar1;
                uVar120 = pfVar1[1];
                fVar114 = pfVar1[2];
                fVar102 = pfVar1[3];
                pfVar1 = (float *)(lVar14 + -0x10 + lVar75);
                fVar82 = *pfVar1;
                fVar125 = pfVar1[1];
                fVar107 = pfVar1[2];
                fVar130 = pfVar1[3];
                pfVar1 = (float *)(lVar14 + lVar75);
                fVar112 = *pfVar1;
                fVar103 = pfVar1[1];
                fVar106 = pfVar1[2];
                fVar96 = pfVar1[3];
                local_168.l.vy.field_0._8_1_ = bVar57;
              }
LAB_0015e008:
              pfVar1 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x30))->field_0
                                + lVar75);
              *pfVar1 = fVar108;
              pfVar1[1] = local_198;
              pfVar1[2] = fVar83;
              pfVar1[3] = fVar81;
              pfVar1 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x20))->field_0
                                + lVar75);
              *pfVar1 = (float)uVar58;
              pfVar1[1] = (float)uVar120;
              pfVar1[2] = fVar114;
              pfVar1[3] = fVar102;
              pfVar1 = (float *)((long)&((Vector *)(local_168.l.vy.field_0._0_8_ + -0x10))->field_0
                                + lVar75);
              *pfVar1 = fVar82;
              pfVar1[1] = fVar125;
              pfVar1[2] = fVar107;
              pfVar1[3] = fVar130;
              pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + lVar75);
              *pfVar1 = fVar112;
              pfVar1[1] = fVar103;
              pfVar1[2] = fVar106;
              pfVar1[3] = fVar96;
              lVar75 = lVar75 + 0x40;
              uVar61 = local_168.l.vy.field_0._0_8_;
            }
          }
          convertGeometries(local_80,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                      *)local_168.p.field_0._8_8_,local_40,
                            (Transformations *)local_178);
          SceneGraph::Transformations::~Transformations((Transformations *)local_178);
          uVar73 = local_38 + 1;
        }
        (**(code **)(*local_48 + 0x18))(local_48);
      }
    }
    else {
      auVar142 = (**(code **)(*plVar59 + 0x10))(plVar59);
      uVar73 = auVar142._8_8_;
      sVar12 = (spaces->spaces).size_active;
      if (sVar12 == 1) {
        fVar81 = (spaces->time_range).lower;
        fVar83 = (spaces->time_range).upper;
        fVar102 = (float)plVar59[0xd];
        fVar82 = (float)((ulong)plVar59[0xd] >> 0x20);
        uVar77 = -(uint)(fVar81 < fVar102);
        uVar79 = -(uint)(fVar83 < fVar82);
        local_178._0_8_ =
             CONCAT44(~uVar79 & (uint)fVar82,~uVar77 & (uint)fVar81) |
             CONCAT44((uint)fVar83 & uVar79,(uint)fVar102 & uVar77);
        sVar12 = plVar59[0xf];
        local_168.l.vy.field_0._0_8_ = (void *)0x0;
        local_168.l.vx.field_0._0_8_ = 0;
        local_168.l.vx.field_0._8_8_ = 0;
        if (sVar12 != 0) {
          local_168.l.vy.field_0._0_8_ = alignedMalloc(sVar12 << 6,0x10);
          auVar142._8_8_ = extraout_RDX;
          auVar142._0_8_ = local_168.l.vy.field_0._0_8_;
          local_168.l.vx.field_0._8_8_ = sVar12;
        }
        local_168.l.vy.field_0._8_1_ = 0;
        lVar75 = 0x30;
        local_168.l.vx.field_0._0_8_ = local_168.l.vx.field_0._8_8_;
        for (uVar73 = 0; uVar77 = auVar142._8_4_, uVar73 < (ulong)plVar59[0xf]; uVar73 = uVar73 + 1)
        {
          pAVar13 = (spaces->spaces).items;
          lVar14 = plVar59[0x11];
          bVar10 = spaces->quaternion;
          uVar74 = CONCAT71(auVar142._1_7_,bVar10);
          bVar57 = *(byte *)(plVar59 + 0x12);
          local_168.l.vy.field_0._8_1_ = 0;
          fVar81 = (pAVar13->l).vx.field_0.m128[0];
          uVar61 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + 4);
          fVar83 = (float)((ulong)uVar61 >> 0x20);
          local_198 = (float)uVar61;
          if ((((fVar81 != 1.0) || (NAN(fVar81))) || (local_198 != 0.0)) ||
             (((NAN(local_198) || (fVar83 != 0.0)) || (NAN(fVar83))))) {
LAB_0015b05d:
            uVar61 = *(undefined8 *)(lVar14 + -0x30 + lVar75);
            fVar102 = (float)uVar61;
            fVar125 = (float)((ulong)uVar61 >> 0x20);
            iVar78 = -(uint)(fVar102 != 1.0);
            iVar80 = -(uint)(fVar125 != 0.0);
            auVar85._4_4_ = iVar80;
            auVar85._0_4_ = iVar78;
            auVar85._8_4_ = iVar80;
            auVar85._12_4_ = iVar80;
            auVar84._8_8_ = auVar85._8_8_;
            auVar84._4_4_ = iVar78;
            auVar84._0_4_ = iVar78;
            uVar77 = movmskpd(uVar77,auVar84);
            fVar81 = *(float *)(lVar14 + -0x28 + lVar75);
            if (((((uVar77 & 1) == 0) && (bVar72 = (byte)uVar77 >> 1, bVar72 == 0)) &&
                (fVar81 == 0.0)) && (!NAN(fVar81))) {
              pfVar1 = (float *)(lVar14 + -0x24 + lVar75);
              auVar39._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar39._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar39._8_4_ = -(uint)(pfVar1[2] != 1.0);
              auVar39._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar77 = movmskps(CONCAT31((int3)(uVar77 >> 8),bVar72),auVar39);
              if ((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                 (((uVar77 & 4) == 0 && (bVar72 = ((byte)uVar77 & 8) >> 3, bVar72 == 0)))) {
                pfVar1 = (float *)(lVar14 + -0x14 + lVar75);
                auVar40._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar40._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar40._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar40._12_4_ = -(uint)(pfVar1[3] != 1.0);
                uVar77 = movmskps(CONCAT31((int3)(uVar77 >> 8),bVar72),auVar40);
                if ((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                   (((uVar77 & 4) == 0 && (bVar72 = ((byte)uVar77 & 8) >> 3, bVar72 == 0)))) {
                  pfVar1 = (float *)(lVar14 + -4 + lVar75);
                  auVar41._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar41._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar41._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar41._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar77 = movmskps(CONCAT31((int3)(uVar77 >> 8),bVar72),auVar41);
                  if ((((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                       ((uVar77 & 4) == 0)) &&
                      (bVar72 = ((byte)uVar77 & 8) >> 3,
                      uVar62 = (ulong)CONCAT31((int3)(uVar77 >> 8),bVar72), bVar72 == 0)) &&
                     ((bVar57 == 0 ||
                      ((fVar82 = *(float *)(lVar14 + 0xc + lVar75), fVar82 == 1.0 && (!NAN(fVar82)))
                      )))) {
                    fVar82 = (pAVar13->l).vx.field_0.m128[0];
                    local_198 = (pAVar13->l).vx.field_0.m128[1];
                    fVar83 = (pAVar13->l).vx.field_0.m128[2];
                    fVar125 = (pAVar13->l).vx.field_0.m128[3];
                    uVar58 = (pAVar13->l).vy.field_0.m128[0];
                    uVar120 = (pAVar13->l).vy.field_0.m128[1];
                    fVar130 = (pAVar13->l).vy.field_0.m128[2];
                    fVar112 = (pAVar13->l).vy.field_0.m128[3];
                    fVar81 = (pAVar13->l).vz.field_0.m128[0];
                    fVar102 = (pAVar13->l).vz.field_0.m128[1];
                    fVar103 = (pAVar13->l).vz.field_0.m128[2];
                    fVar106 = (pAVar13->l).vz.field_0.m128[3];
                    fVar96 = (pAVar13->p).field_0.m128[0];
                    fVar108 = (pAVar13->p).field_0.m128[1];
                    fVar114 = (pAVar13->p).field_0.m128[2];
                    fVar107 = (pAVar13->p).field_0.m128[3];
                    local_168.l.vy.field_0._8_1_ = bVar10;
                    goto LAB_0015b779;
                  }
                }
              }
            }
            uVar62 = uVar74 & 0xffffffff;
            bVar72 = (byte)uVar62 | bVar57;
            uVar62 = CONCAT71((int7)(uVar62 >> 8),bVar72);
            if (bVar72 == 0) {
              fVar114 = (pAVar13->l).vx.field_0.m128[0];
              fVar128 = (pAVar13->l).vx.field_0.m128[1];
              fVar129 = (pAVar13->l).vx.field_0.m128[2];
              fVar131 = (pAVar13->l).vx.field_0.m128[3];
              fVar137 = (pAVar13->l).vy.field_0.m128[0];
              fVar140 = (pAVar13->l).vy.field_0.m128[1];
              fVar97 = (pAVar13->l).vy.field_0.m128[2];
              fVar98 = (pAVar13->l).vy.field_0.m128[3];
              fVar99 = (pAVar13->l).vz.field_0.m128[0];
              fVar133 = (pAVar13->l).vz.field_0.m128[1];
              fVar100 = (pAVar13->l).vz.field_0.m128[2];
              fVar101 = (pAVar13->l).vz.field_0.m128[3];
              fVar82 = fVar102 * fVar114 + fVar125 * fVar137 + fVar81 * fVar99;
              local_198 = fVar102 * fVar128 + fVar125 * fVar140 + fVar81 * fVar133;
              fVar83 = fVar102 * fVar129 + fVar125 * fVar97 + fVar81 * fVar100;
              fVar125 = fVar102 * fVar131 + fVar125 * fVar98 + fVar81 * fVar101;
              fVar81 = *(float *)(lVar14 + -0x20 + lVar75);
              fVar102 = *(float *)(lVar14 + -0x1c + lVar75);
              fVar112 = *(float *)(lVar14 + -0x18 + lVar75);
              fVar106 = *(float *)(lVar14 + -0x10 + lVar75);
              uVar58 = fVar81 * fVar114 + fVar102 * fVar137 + fVar112 * fVar99;
              uVar120 = fVar81 * fVar128 + fVar102 * fVar140 + fVar112 * fVar133;
              fVar130 = fVar81 * fVar129 + fVar102 * fVar97 + fVar112 * fVar100;
              fVar112 = fVar81 * fVar131 + fVar102 * fVar98 + fVar112 * fVar101;
              fVar96 = *(float *)(lVar14 + -0xc + lVar75);
              fVar108 = *(float *)(lVar14 + -8 + lVar75);
              fVar81 = fVar106 * fVar114 + fVar96 * fVar137 + fVar108 * fVar99;
              fVar102 = fVar106 * fVar128 + fVar96 * fVar140 + fVar108 * fVar133;
              fVar103 = fVar106 * fVar129 + fVar96 * fVar97 + fVar108 * fVar100;
              fVar106 = fVar106 * fVar131 + fVar96 * fVar98 + fVar108 * fVar101;
              fVar107 = *(float *)(lVar14 + lVar75);
              fVar6 = *(float *)(lVar14 + 4 + lVar75);
              fVar117 = *(float *)(lVar14 + 8 + lVar75);
              fVar96 = fVar107 * fVar114 + fVar6 * fVar137 + fVar117 * fVar99 +
                       (pAVar13->p).field_0.m128[0];
              fVar108 = fVar107 * fVar128 + fVar6 * fVar140 + fVar117 * fVar133 +
                        (pAVar13->p).field_0.m128[1];
              fVar114 = fVar107 * fVar129 + fVar6 * fVar97 + fVar117 * fVar100 +
                        (pAVar13->p).field_0.m128[2];
              fVar107 = fVar107 * fVar131 + fVar6 * fVar98 + fVar117 * fVar101 +
                        (pAVar13->p).field_0.m128[3];
            }
            else {
              uVar74 = uVar74 & 0xffffffff;
              bVar72 = (byte)uVar74 & bVar57;
              uVar62 = CONCAT71((int7)(uVar74 >> 8),bVar72);
              if (bVar72 == 1) {
                poVar60 = std::operator<<((ostream *)&std::cout,
                                          "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                         );
                std::endl<char,std::char_traits<char>>(poVar60);
                fVar81 = (pAVar13->p).field_0.m128[3];
                fVar83 = (pAVar13->l).vx.field_0.m128[3];
                fVar102 = (pAVar13->l).vy.field_0.m128[3];
                fVar82 = (pAVar13->l).vz.field_0.m128[3];
                aVar8 = (pAVar13->l).vx.field_0.field_1;
                fVar125 = (pAVar13->l).vy.field_0.m128[0];
                fVar130 = (pAVar13->l).vy.field_0.m128[1];
                fVar112 = (pAVar13->l).vz.field_0.m128[0];
                fVar103 = (pAVar13->l).vz.field_0.m128[1];
                fVar106 = (pAVar13->l).vz.field_0.m128[2];
                fVar131 = fVar83 * fVar102 + fVar81 * fVar82;
                fVar108 = fVar83 * fVar102 - fVar81 * fVar82;
                fVar114 = fVar81 * fVar81 + fVar83 * fVar83 + -fVar102 * fVar102 + -fVar82 * fVar82;
                fVar128 = fVar81 * fVar81 - fVar83 * fVar83;
                fVar129 = fVar102 * fVar102 + fVar128 + -fVar82 * fVar82;
                fVar140 = fVar83 * fVar82 - fVar81 * fVar102;
                fVar96 = fVar81 * fVar102 + fVar83 * fVar82;
                fVar137 = fVar102 * fVar82 + fVar81 * fVar83;
                fVar81 = fVar102 * fVar82 - fVar81 * fVar83;
                fVar107 = (pAVar13->p).field_0.m128[0];
                fVar6 = (pAVar13->p).field_0.m128[1];
                fVar117 = (pAVar13->p).field_0.m128[2];
                fVar131 = fVar131 + fVar131;
                fVar140 = fVar140 + fVar140;
                fVar108 = fVar108 + fVar108;
                fVar137 = fVar137 + fVar137;
                fVar96 = fVar96 + fVar96;
                fVar81 = fVar81 + fVar81;
                fVar83 = fVar82 * fVar82 + fVar128 + -fVar102 * fVar102;
                fVar115 = fVar114 * 1.0 + fVar131 * 0.0 + fVar140 * 0.0;
                fVar118 = fVar114 * 0.0 + fVar131 * 1.0 + fVar140 * 0.0;
                fVar121 = fVar114 * 0.0 + fVar131 * 0.0 + fVar140 * 1.0;
                fVar123 = fVar114 * 0.0 + fVar131 * 0.0 + fVar140 * 0.0;
                fVar109 = fVar108 * 1.0 + fVar129 * 0.0 + fVar137 * 0.0;
                fVar110 = fVar108 * 0.0 + fVar129 * 1.0 + fVar137 * 0.0;
                fVar111 = fVar108 * 0.0 + fVar129 * 0.0 + fVar137 * 1.0;
                fVar113 = fVar108 * 0.0 + fVar129 * 0.0 + fVar137 * 0.0;
                fVar108 = fVar96 * 1.0 + fVar81 * 0.0 + fVar83 * 0.0;
                fVar114 = fVar96 * 0.0 + fVar81 * 1.0 + fVar83 * 0.0;
                fVar131 = fVar96 * 0.0 + fVar81 * 0.0 + fVar83 * 1.0;
                fVar140 = fVar96 * 0.0 + fVar81 * 0.0 + fVar83 * 0.0;
                local_188 = aVar8.y;
                fStack_184 = aVar8.z;
                local_198 = aVar8.x;
                fVar132 = local_198 * fVar115 + fVar109 * 0.0 + fVar108 * 0.0;
                fVar134 = local_198 * fVar118 + fVar110 * 0.0 + fVar114 * 0.0;
                fVar135 = local_198 * fVar121 + fVar111 * 0.0 + fVar131 * 0.0;
                fVar136 = local_198 * fVar123 + fVar113 * 0.0 + fVar140 * 0.0;
                fVar128 = fVar125 * fVar115 + fVar130 * fVar109 + fVar108 * 0.0;
                fVar129 = fVar125 * fVar118 + fVar130 * fVar110 + fVar114 * 0.0;
                fVar137 = fVar125 * fVar121 + fVar130 * fVar111 + fVar131 * 0.0;
                fVar97 = fVar125 * fVar123 + fVar130 * fVar113 + fVar140 * 0.0;
                local_168.l.vz.field_0.m128[0] =
                     fVar112 * fVar115 + fVar103 * fVar109 + fVar106 * fVar108;
                local_168.l.vz.field_0.m128[1] =
                     fVar112 * fVar118 + fVar103 * fVar110 + fVar106 * fVar114;
                local_168.l.vz.field_0.m128[2] =
                     fVar112 * fVar121 + fVar103 * fVar111 + fVar106 * fVar131;
                local_168.l.vz.field_0.m128[3] =
                     fVar112 * fVar123 + fVar103 * fVar113 + fVar106 * fVar140;
                fVar81 = *(float *)(lVar14 + 0xc + lVar75);
                fVar83 = *(float *)(lVar14 + -0x24 + lVar75);
                fVar102 = *(float *)(lVar14 + -0x14 + lVar75);
                fVar82 = *(float *)(lVar14 + -4 + lVar75);
                fVar133 = fVar83 * fVar102 + fVar81 * fVar82;
                fVar98 = fVar83 * fVar102 - fVar81 * fVar82;
                fVar99 = fVar81 * fVar81 + fVar83 * fVar83 + -fVar102 * fVar102 + -fVar82 * fVar82;
                fVar130 = fVar81 * fVar81 - fVar83 * fVar83;
                fVar139 = fVar102 * fVar102 + fVar130 + -fVar82 * fVar82;
                fVar138 = fVar83 * fVar82 - fVar81 * fVar102;
                fVar104 = fVar81 * fVar102 + fVar83 * fVar82;
                fVar141 = fVar102 * fVar82 + fVar81 * fVar83;
                fVar96 = fVar102 * fVar82 - fVar81 * fVar83;
                pfVar2 = (float *)(lVar14 + -0x30 + lVar75);
                fVar81 = *pfVar2;
                pfVar3 = (float *)(lVar14 + -0x20 + lVar75);
                fVar83 = *pfVar3;
                fVar125 = pfVar3[1];
                fVar124 = fVar82 * fVar82 + fVar130 + -fVar102 * fVar102;
                pfVar1 = (float *)(lVar14 + -0x10 + lVar75);
                fVar102 = *pfVar1;
                fVar82 = pfVar1[1];
                fVar130 = pfVar1[2];
                fVar133 = fVar133 + fVar133;
                fVar138 = fVar138 + fVar138;
                pfVar1 = (float *)(lVar14 + lVar75);
                fVar112 = *pfVar1;
                fVar103 = pfVar1[1];
                fVar106 = pfVar1[2];
                fVar100 = fVar99 * 1.0 + fVar133 * 0.0 + fVar138 * 0.0;
                fVar101 = fVar99 * 0.0 + fVar133 * 1.0 + fVar138 * 0.0;
                fVar138 = fVar99 * 0.0 + fVar133 * 0.0 + fVar138 * 1.0;
                fVar98 = fVar98 + fVar98;
                fVar141 = fVar141 + fVar141;
                fVar104 = fVar104 + fVar104;
                fVar96 = fVar96 + fVar96;
                fVar99 = fVar98 * 1.0 + fVar139 * 0.0 + fVar141 * 0.0;
                fVar133 = fVar98 * 0.0 + fVar139 * 1.0 + fVar141 * 0.0;
                fVar98 = fVar98 * 0.0 + fVar139 * 0.0 + fVar141 * 1.0;
                fVar139 = fVar104 * 1.0 + fVar96 * 0.0 + fVar124 * 0.0;
                fVar141 = fVar104 * 0.0 + fVar96 * 1.0 + fVar124 * 0.0;
                fVar96 = fVar104 * 0.0 + fVar96 * 0.0 + fVar124 * 1.0;
                fVar116 = fVar81 * fVar100 + fVar99 * 0.0 + fVar139 * 0.0;
                fVar119 = fVar81 * fVar101 + fVar133 * 0.0 + fVar141 * 0.0;
                fVar122 = fVar81 * fVar138 + fVar98 * 0.0 + fVar96 * 0.0;
                fVar104 = fVar83 * fVar100 + fVar125 * fVar99 + fVar139 * 0.0;
                fVar124 = fVar83 * fVar101 + fVar125 * fVar133 + fVar141 * 0.0;
                fVar105 = fVar83 * fVar138 + fVar125 * fVar98 + fVar96 * 0.0;
                fVar125 = fVar102 * fVar100 + fVar82 * fVar99 + fVar130 * fVar139;
                fVar126 = fVar102 * fVar101 + fVar82 * fVar133 + fVar130 * fVar141;
                fVar127 = fVar102 * fVar138 + fVar82 * fVar98 + fVar130 * fVar96;
                fVar130 = fVar112 * fVar100 + fVar103 * fVar99 + fVar106 * fVar139 + pfVar2[1] + 0.0
                ;
                fVar99 = fVar112 * fVar101 + fVar103 * fVar133 + fVar106 * fVar141 + pfVar2[2] + 0.0
                ;
                fVar112 = fVar112 * fVar138 + fVar103 * fVar98 + fVar106 * fVar96 + pfVar3[2] + 0.0;
                fVar82 = fVar116 * fVar132 +
                         fVar119 * fVar128 + fVar122 * local_168.l.vz.field_0.m128[0];
                local_198 = fVar116 * fVar134 +
                            fVar119 * fVar129 + fVar122 * local_168.l.vz.field_0.m128[1];
                fVar83 = fVar116 * fVar135 +
                         fVar119 * fVar137 + fVar122 * local_168.l.vz.field_0.m128[2];
                fVar81 = fVar125 * fVar132 +
                         fVar126 * fVar128 + fVar127 * local_168.l.vz.field_0.m128[0];
                fVar102 = fVar125 * fVar134 +
                          fVar126 * fVar129 + fVar127 * local_168.l.vz.field_0.m128[1];
                fVar103 = fVar125 * fVar135 +
                          fVar126 * fVar137 + fVar127 * local_168.l.vz.field_0.m128[2];
                uVar62 = extraout_RDX_00;
                fVar106 = fVar125 * fVar136 +
                          fVar126 * fVar97 + fVar127 * local_168.l.vz.field_0.m128[3];
                fVar125 = fVar116 * fVar136 +
                          fVar119 * fVar97 + fVar122 * local_168.l.vz.field_0.m128[3];
                fVar96 = fVar130 * fVar132 +
                         fVar99 * fVar128 + fVar112 * local_168.l.vz.field_0.m128[0] +
                         fVar107 * fVar115 + fVar6 * fVar109 + fVar117 * fVar108 + local_188 + 0.0;
                fVar108 = fVar130 * fVar134 +
                          fVar99 * fVar129 + fVar112 * local_168.l.vz.field_0.m128[1] +
                          fVar107 * fVar118 + fVar6 * fVar110 + fVar117 * fVar114 + fStack_184 + 0.0
                ;
                fVar114 = fVar130 * fVar135 +
                          fVar99 * fVar137 + fVar112 * local_168.l.vz.field_0.m128[2] +
                          fVar107 * fVar121 + fVar6 * fVar111 + fVar117 * fVar131 +
                          (pAVar13->l).vy.field_0.m128[2] + 0.0;
                fVar107 = fVar130 * fVar136 +
                          fVar99 * fVar97 + fVar112 * local_168.l.vz.field_0.m128[3] +
                          fVar107 * fVar123 + fVar6 * fVar113 + fVar117 * fVar140 + 0.0;
                uVar58 = fVar104 * fVar132 +
                         fVar124 * fVar128 + fVar105 * local_168.l.vz.field_0.m128[0];
                uVar120 = fVar104 * fVar134 +
                          fVar124 * fVar129 + fVar105 * local_168.l.vz.field_0.m128[1];
                fVar130 = fVar104 * fVar135 +
                          fVar124 * fVar137 + fVar105 * local_168.l.vz.field_0.m128[2];
                fVar112 = fVar104 * fVar136 +
                          fVar124 * fVar97 + fVar105 * local_168.l.vz.field_0.m128[3];
              }
              else {
                bVar57 = bVar10 ^ 1U | bVar57;
                if (bVar57 == 0) {
                  local_e8 = ZEXT416((uint)(pAVar13->p).field_0.m128[3]);
                  local_c8 = ZEXT416((uint)(pAVar13->l).vx.field_0.m128[3]);
                  local_b8 = ZEXT416((uint)(pAVar13->l).vy.field_0.m128[3]);
                  local_f8 = ZEXT416((uint)(pAVar13->l).vz.field_0.m128[3]);
                  local_118 = (pAVar13->l).vy.field_0.m128[0];
                  fStack_114 = (pAVar13->l).vy.field_0.m128[1];
                  fStack_d0 = (pAVar13->l).vy.field_0.m128[2];
                  fStack_10c = (pAVar13->l).vy.field_0.m128[3];
                  local_108 = (pAVar13->l).vz.field_0.m128[0];
                  fStack_104 = (pAVar13->l).vz.field_0.m128[1];
                  fStack_100 = (pAVar13->l).vz.field_0.m128[2];
                  fStack_fc = (pAVar13->l).vz.field_0.m128[3];
                  local_98 = (pAVar13->l).vx.field_0.m128[0];
                  fStack_8c = (pAVar13->l).vx.field_0.m128[1];
                  pfVar1 = (float *)(lVar14 + -0x30 + lVar75);
                  fVar81 = *pfVar1;
                  fVar102 = pfVar1[1];
                  fVar125 = pfVar1[2];
                  pfVar1 = (float *)(lVar14 + -0x20 + lVar75);
                  fVar130 = *pfVar1;
                  fVar112 = pfVar1[1];
                  fVar103 = pfVar1[2];
                  puVar76 = (undefined8 *)(lVar14 + -0x10 + lVar75);
                  local_128 = *puVar76;
                  uStack_120 = puVar76[1];
                  pfVar1 = (float *)(lVar14 + lVar75);
                  fVar106 = *pfVar1;
                  fVar96 = pfVar1[1];
                  fVar108 = pfVar1[2];
                  fVar82 = fVar81 * local_98 + fVar102 * local_118 + fVar125 * local_108;
                  fVar114 = fVar81 * 0.0 + fVar102 * fStack_114 + fVar125 * fStack_104;
                  fVar81 = fVar81 * 0.0 + fVar102 * 0.0 + fVar125 * fStack_100;
                  local_168.l.vz.field_0.m128[0] =
                       fVar130 * local_98 + fVar112 * local_118 + fVar103 * local_108;
                  local_168.l.vz.field_0.m128[1] =
                       fVar130 * 0.0 + fVar112 * fStack_114 + fVar103 * fStack_104;
                  local_168.l.vz.field_0.m128[2] =
                       fVar130 * 0.0 + fVar112 * 0.0 + fVar103 * fStack_100;
                  local_168.l.vz.field_0.m128[3] =
                       fVar130 * fStack_8c + fVar112 * fStack_10c + fVar103 * fStack_fc;
                  fStack_110 = 0.0;
                  fStack_94 = 0.0;
                  fStack_90 = 0.0;
                  local_a8._0_4_ =
                       fVar106 * local_98 + fVar96 * local_118 + fVar108 * local_108 +
                       (pAVar13->p).field_0.m128[0];
                  local_a8._4_4_ =
                       fVar106 * 0.0 + fVar96 * fStack_114 + fVar108 * fStack_104 +
                       (pAVar13->p).field_0.m128[1];
                  fStack_a0 = fVar106 * 0.0 + fVar96 * 0.0 + fVar108 * fStack_100 +
                              (pAVar13->p).field_0.m128[2];
                  register0x0000128c =
                       fVar106 * fStack_8c + fVar96 * fStack_10c + fVar108 * fStack_fc +
                       (pAVar13->p).field_0.m128[3];
                  local_d8 = local_118;
                  fStack_d4 = fStack_114;
                  fStack_cc = fStack_10c;
                  if (((fVar114 != 0.0) || (NAN(fVar114))) ||
                     ((fVar81 != 0.0 ||
                      (((NAN(fVar81) || (local_168.l.vz.field_0.m128[2] != 0.0)) ||
                       (NAN(local_168.l.vz.field_0.m128[2]))))))) {
                    poVar60 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar60);
                    uVar62 = extraout_RDX_02;
                  }
                  fVar81 = local_98 * (float)local_128 +
                           local_118 * local_128._4_4_ + local_108 * (float)uStack_120;
                  fVar102 = fStack_94 * (float)local_128 +
                            fStack_114 * local_128._4_4_ + fStack_104 * (float)uStack_120;
                  fVar103 = fStack_90 * (float)local_128 +
                            fStack_110 * local_128._4_4_ + fStack_100 * (float)uStack_120;
                  local_168.l.vy.field_0._8_1_ = 1;
                  fVar106 = (float)local_f8._0_4_;
                  fVar125 = (float)local_c8._0_4_;
                  fVar96 = (float)local_a8._0_4_;
                  fVar108 = (float)local_a8._4_4_;
                  fVar114 = fStack_a0;
                  fVar107 = (float)local_e8._0_4_;
                  uVar58 = local_168.l.vz.field_0.m128[0];
                  uVar120 = local_168.l.vz.field_0.m128[1];
                  fVar130 = fStack_d0;
                  fVar112 = (float)local_b8._0_4_;
                }
                else {
                  if (((local_198 != 0.0) || (NAN(local_198))) ||
                     ((fVar83 != 0.0 ||
                      ((NAN(fVar83) ||
                       (uVar61 = *(undefined8 *)&(pAVar13->l).vz.field_0,
                       auVar19._4_4_ = -(uint)((pAVar13->l).vy.field_0.m128[0] != 0.0),
                       auVar19._0_4_ = -(uint)((pAVar13->l).vy.field_0.m128[2] != 0.0),
                       auVar19._8_4_ = -(uint)((float)uVar61 != 0.0),
                       auVar19._12_4_ = -(uint)((float)((ulong)uVar61 >> 0x20) != 0.0),
                       uVar58 = movmskps((int)CONCAT71(auVar142._1_7_,bVar57),auVar19),
                       (char)uVar58 != '\0')))))) {
                    poVar60 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar60);
                    uVar62 = extraout_RDX_01;
                  }
                  pfVar2 = (float *)(lVar14 + -0x30 + lVar75);
                  pfVar3 = (float *)(lVar14 + -0x20 + lVar75);
                  pfVar4 = (float *)(lVar14 + -0x10 + lVar75);
                  fVar81 = *pfVar4;
                  fVar102 = pfVar4[1];
                  pfVar1 = (float *)(lVar14 + lVar75);
                  uVar61 = *(undefined8 *)&(pAVar13->p).field_0;
                  fVar82 = (pAVar13->l).vx.field_0.m128[0] * *pfVar2;
                  local_198 = pfVar2[1] + (float)uVar61;
                  fVar83 = pfVar2[2] + (float)((ulong)uVar61 >> 0x20);
                  fVar103 = pfVar4[2] * (pAVar13->l).vz.field_0.m128[2];
                  local_168.l.vy.field_0._8_1_ = 1;
                  fVar106 = pfVar4[3];
                  fVar125 = pfVar2[3];
                  fVar96 = *pfVar1;
                  fVar108 = pfVar1[1];
                  fVar114 = pfVar1[2];
                  fVar107 = pfVar1[3];
                  uVar58 = *pfVar3;
                  uVar120 = pfVar3[1] * (pAVar13->l).vy.field_0.m128[1];
                  fVar130 = pfVar3[2] + (pAVar13->p).field_0.m128[2];
                  fVar112 = pfVar3[3];
                }
              }
            }
          }
          else {
            auVar16._4_4_ = -(uint)((pAVar13->l).vy.field_0.m128[0] != 0.0);
            auVar16._0_4_ = -(uint)((pAVar13->l).vx.field_0.m128[3] != 0.0);
            auVar16._8_4_ = -(uint)((pAVar13->l).vy.field_0.m128[1] != 1.0);
            auVar16._12_4_ = -(uint)((pAVar13->l).vy.field_0.m128[2] != 0.0);
            uVar77 = movmskps(uVar77,auVar16);
            if ((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) ||
               (((uVar77 & 4) != 0 ||
                (bVar72 = ((byte)uVar77 & 8) >> 3, uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72),
                bVar72 != 0)))) goto LAB_0015b05d;
            auVar17._4_4_ = -(uint)((pAVar13->l).vz.field_0.m128[0] != 0.0);
            auVar17._0_4_ = -(uint)((pAVar13->l).vy.field_0.m128[3] != 0.0);
            auVar17._8_4_ = -(uint)((pAVar13->l).vz.field_0.m128[1] != 0.0);
            auVar17._12_4_ = -(uint)((pAVar13->l).vz.field_0.m128[2] != 1.0);
            uVar77 = movmskps(uVar77,auVar17);
            if (((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) || ((uVar77 & 4) != 0)) ||
               (bVar72 = ((byte)uVar77 & 8) >> 3, uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72),
               bVar72 != 0)) goto LAB_0015b05d;
            auVar18._4_4_ = -(uint)((pAVar13->p).field_0.m128[0] != 0.0);
            auVar18._0_4_ = -(uint)((pAVar13->l).vz.field_0.m128[3] != 0.0);
            auVar18._8_4_ = -(uint)((pAVar13->p).field_0.m128[1] != 0.0);
            auVar18._12_4_ = -(uint)((pAVar13->p).field_0.m128[2] != 0.0);
            uVar77 = movmskps(uVar77,auVar18);
            if ((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) || ((uVar77 & 4) != 0))
            goto LAB_0015b05d;
            bVar72 = ((byte)uVar77 & 8) >> 3;
            uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
            uVar62 = (ulong)uVar77;
            if ((bVar72 != 0) ||
               ((bVar10 != false &&
                ((fVar81 = (pAVar13->p).field_0.m128[3], fVar81 != 1.0 || (NAN(fVar81)))))))
            goto LAB_0015b05d;
            pfVar1 = (float *)(lVar14 + -0x30 + lVar75);
            fVar82 = *pfVar1;
            local_198 = pfVar1[1];
            fVar83 = pfVar1[2];
            fVar125 = pfVar1[3];
            pfVar1 = (float *)(lVar14 + -0x20 + lVar75);
            uVar58 = *pfVar1;
            uVar120 = pfVar1[1];
            fVar130 = pfVar1[2];
            fVar112 = pfVar1[3];
            pfVar1 = (float *)(lVar14 + -0x10 + lVar75);
            fVar81 = *pfVar1;
            fVar102 = pfVar1[1];
            fVar103 = pfVar1[2];
            fVar106 = pfVar1[3];
            pfVar1 = (float *)(lVar14 + lVar75);
            fVar96 = *pfVar1;
            fVar108 = pfVar1[1];
            fVar114 = pfVar1[2];
            fVar107 = pfVar1[3];
            local_168.l.vy.field_0._8_1_ = bVar57;
          }
LAB_0015b779:
          auVar142._8_8_ = uVar62;
          auVar142._0_8_ = local_168.l.vy.field_0._0_8_;
          pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + -0x30 + lVar75);
          *pfVar1 = fVar82;
          pfVar1[1] = local_198;
          pfVar1[2] = fVar83;
          pfVar1[3] = fVar125;
          pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + -0x20 + lVar75);
          *pfVar1 = (float)uVar58;
          pfVar1[1] = (float)uVar120;
          pfVar1[2] = fVar130;
          pfVar1[3] = fVar112;
          pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + -0x10 + lVar75);
          *pfVar1 = fVar81;
          pfVar1[1] = fVar102;
          pfVar1[2] = fVar103;
          pfVar1[3] = fVar106;
          pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + lVar75);
          *pfVar1 = fVar96;
          pfVar1[1] = fVar108;
          pfVar1[2] = fVar114;
          pfVar1[3] = fVar107;
          lVar75 = lVar75 + 0x40;
        }
      }
      else if (plVar59[0xf] == 1) {
        fVar81 = (spaces->time_range).lower;
        fVar83 = (spaces->time_range).upper;
        fVar102 = (float)plVar59[0xd];
        fVar82 = (float)((ulong)plVar59[0xd] >> 0x20);
        uVar77 = -(uint)(fVar81 < fVar102);
        uVar79 = -(uint)(fVar83 < fVar82);
        local_178._0_8_ =
             CONCAT44(~uVar79 & (uint)fVar82,~uVar77 & (uint)fVar81) |
             CONCAT44((uint)fVar83 & uVar79,(uint)fVar102 & uVar77);
        local_168.l.vy.field_0._0_8_ = (void *)0x0;
        local_168.l.vx.field_0._0_8_ = 0;
        local_168.l.vx.field_0._8_8_ = 0;
        if (sVar12 != 0) {
          local_168.l.vy.field_0._0_8_ = alignedMalloc(sVar12 << 6,0x10);
          uVar73 = extraout_RDX_15;
          local_168.l.vx.field_0._8_8_ = sVar12;
        }
        if (spaces->quaternion == false) {
          uVar61 = ZEXT48(*(uint *)(plVar59 + 0x12));
        }
        else {
          uVar61 = (void *)0x1;
        }
        local_168.l.vy.field_0._8_1_ = (undefined1)uVar61;
        lVar75 = 0x30;
        local_168.l.vx.field_0._0_8_ = local_168.l.vx.field_0._8_8_;
        for (uVar74 = 0; uVar77 = (uint)uVar73, uVar74 < (spaces->spaces).size_active;
            uVar74 = uVar74 + 1) {
          pAVar13 = (spaces->spaces).items;
          pfVar1 = (float *)plVar59[0x11];
          bVar10 = spaces->quaternion;
          uVar71 = (undefined7)((ulong)uVar61 >> 8);
          uVar62 = CONCAT71(uVar71,bVar10);
          bVar57 = *(byte *)(plVar59 + 0x12);
          local_168.l.vy.field_0._8_1_ = 0;
          fVar81 = *(float *)((long)pAVar13 + lVar75 + -0x30);
          uVar61 = *(undefined8 *)((long)pAVar13 + lVar75 + -0x2c);
          fVar83 = (float)((ulong)uVar61 >> 0x20);
          local_198 = (float)uVar61;
          if (((((fVar81 != 1.0) || (NAN(fVar81))) || (local_198 != 0.0)) ||
              ((NAN(local_198) || (fVar83 != 0.0)))) || (NAN(fVar83))) {
LAB_0015e349:
            fVar102 = (float)*(undefined8 *)pfVar1;
            fVar125 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
            iVar78 = -(uint)(fVar102 != 1.0);
            iVar80 = -(uint)(fVar125 != 0.0);
            auVar93._4_4_ = iVar80;
            auVar93._0_4_ = iVar78;
            auVar93._8_4_ = iVar80;
            auVar93._12_4_ = iVar80;
            auVar92._8_8_ = auVar93._8_8_;
            auVar92._4_4_ = iVar78;
            auVar92._0_4_ = iVar78;
            uVar77 = movmskpd(uVar77,auVar92);
            fVar81 = pfVar1[2];
            if (((((uVar77 & 1) == 0) && (bVar72 = (byte)uVar77 >> 1, bVar72 == 0)) &&
                (fVar81 == 0.0)) && (!NAN(fVar81))) {
              auVar42._4_4_ = -(uint)(pfVar1[4] != 0.0);
              auVar42._0_4_ = -(uint)(pfVar1[3] != 0.0);
              auVar42._8_4_ = -(uint)(pfVar1[5] != 1.0);
              auVar42._12_4_ = -(uint)(pfVar1[6] != 0.0);
              uVar77 = movmskps(CONCAT31((int3)(uVar77 >> 8),bVar72),auVar42);
              if ((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                 (((uVar77 & 4) == 0 && (bVar72 = ((byte)uVar77 & 8) >> 3, bVar72 == 0)))) {
                auVar43._4_4_ = -(uint)(pfVar1[8] != 0.0);
                auVar43._0_4_ = -(uint)(pfVar1[7] != 0.0);
                auVar43._8_4_ = -(uint)(pfVar1[9] != 0.0);
                auVar43._12_4_ = -(uint)(pfVar1[10] != 1.0);
                uVar77 = movmskps(CONCAT31((int3)(uVar77 >> 8),bVar72),auVar43);
                if ((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                   (((uVar77 & 4) == 0 && (bVar72 = ((byte)uVar77 & 8) >> 3, bVar72 == 0)))) {
                  auVar44._4_4_ = -(uint)(pfVar1[0xc] != 0.0);
                  auVar44._0_4_ = -(uint)(pfVar1[0xb] != 0.0);
                  auVar44._8_4_ = -(uint)(pfVar1[0xd] != 0.0);
                  auVar44._12_4_ = -(uint)(pfVar1[0xe] != 0.0);
                  uVar77 = movmskps(CONCAT31((int3)(uVar77 >> 8),bVar72),auVar44);
                  if ((((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                       ((uVar77 & 4) == 0)) &&
                      (bVar72 = ((byte)uVar77 & 8) >> 3,
                      uVar73 = (ulong)CONCAT31((int3)(uVar77 >> 8),bVar72), bVar72 == 0)) &&
                     ((bVar57 == 0 || ((pfVar1[0xf] == 1.0 && (!NAN(pfVar1[0xf]))))))) {
                    pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x30);
                    fVar82 = *pfVar1;
                    local_198 = pfVar1[1];
                    fVar83 = pfVar1[2];
                    fVar125 = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x20);
                    uVar58 = *pfVar1;
                    uVar120 = pfVar1[1];
                    fVar130 = pfVar1[2];
                    fVar112 = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x10);
                    fVar81 = *pfVar1;
                    fVar102 = pfVar1[1];
                    fVar103 = pfVar1[2];
                    fVar106 = pfVar1[3];
                    pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                    fVar96 = *pfVar1;
                    fVar108 = pfVar1[1];
                    fVar114 = pfVar1[2];
                    fVar107 = pfVar1[3];
                    local_168.l.vy.field_0._8_1_ = bVar10;
                    goto LAB_0015ea63;
                  }
                }
              }
            }
            uVar73 = uVar62 & 0xffffffff;
            bVar72 = (byte)uVar73 | bVar57;
            uVar73 = CONCAT71((int7)(uVar73 >> 8),bVar72);
            if (bVar72 == 0) {
              pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x30);
              fVar114 = *pfVar2;
              fVar128 = pfVar2[1];
              fVar129 = pfVar2[2];
              fVar131 = pfVar2[3];
              pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x20);
              fVar137 = *pfVar2;
              fVar140 = pfVar2[1];
              fVar97 = pfVar2[2];
              fVar98 = pfVar2[3];
              pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x10);
              fVar99 = *pfVar2;
              fVar133 = pfVar2[1];
              fVar100 = pfVar2[2];
              fVar101 = pfVar2[3];
              fVar82 = fVar102 * fVar114 + fVar125 * fVar137 + fVar81 * fVar99;
              local_198 = fVar102 * fVar128 + fVar125 * fVar140 + fVar81 * fVar133;
              fVar83 = fVar102 * fVar129 + fVar125 * fVar97 + fVar81 * fVar100;
              fVar125 = fVar102 * fVar131 + fVar125 * fVar98 + fVar81 * fVar101;
              fVar81 = pfVar1[4];
              fVar102 = pfVar1[5];
              fVar112 = pfVar1[6];
              fVar106 = pfVar1[8];
              uVar58 = fVar81 * fVar114 + fVar102 * fVar137 + fVar112 * fVar99;
              uVar120 = fVar81 * fVar128 + fVar102 * fVar140 + fVar112 * fVar133;
              fVar130 = fVar81 * fVar129 + fVar102 * fVar97 + fVar112 * fVar100;
              fVar112 = fVar81 * fVar131 + fVar102 * fVar98 + fVar112 * fVar101;
              fVar96 = pfVar1[9];
              fVar108 = pfVar1[10];
              fVar81 = fVar106 * fVar114 + fVar96 * fVar137 + fVar108 * fVar99;
              fVar102 = fVar106 * fVar128 + fVar96 * fVar140 + fVar108 * fVar133;
              fVar103 = fVar106 * fVar129 + fVar96 * fVar97 + fVar108 * fVar100;
              fVar106 = fVar106 * fVar131 + fVar96 * fVar98 + fVar108 * fVar101;
              fVar107 = pfVar1[0xc];
              fVar6 = pfVar1[0xd];
              fVar117 = pfVar1[0xe];
              pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
              fVar96 = fVar107 * fVar114 + fVar6 * fVar137 + fVar117 * fVar99 + *pfVar1;
              fVar108 = fVar107 * fVar128 + fVar6 * fVar140 + fVar117 * fVar133 + pfVar1[1];
              fVar114 = fVar107 * fVar129 + fVar6 * fVar97 + fVar117 * fVar100 + pfVar1[2];
              fVar107 = fVar107 * fVar131 + fVar6 * fVar98 + fVar117 * fVar101 + pfVar1[3];
            }
            else {
              uVar62 = uVar62 & 0xffffffff;
              bVar72 = (byte)uVar62 & bVar57;
              uVar73 = CONCAT71((int7)(uVar62 >> 8),bVar72);
              if (bVar72 == 1) {
                poVar60 = std::operator<<((ostream *)&std::cout,
                                          "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                         );
                std::endl<char,std::char_traits<char>>(poVar60);
                fVar81 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 0xc);
                fVar83 = *(float *)((long)pAVar13 + lVar75 + -0x24);
                fVar102 = *(float *)((long)pAVar13 + lVar75 + -0x14);
                fVar82 = *(float *)((long)pAVar13 + lVar75 + -4);
                auVar9 = *(undefined1 (*) [16])((long)pAVar13 + lVar75 + -0x30);
                pfVar3 = (float *)((long)pAVar13 + lVar75 + -0x20);
                fVar125 = *pfVar3;
                fVar130 = pfVar3[1];
                pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x10);
                fVar112 = *pfVar2;
                fVar103 = pfVar2[1];
                fVar106 = pfVar2[2];
                fVar131 = fVar83 * fVar102 + fVar81 * fVar82;
                fVar108 = fVar83 * fVar102 - fVar81 * fVar82;
                fVar114 = fVar81 * fVar81 + fVar83 * fVar83 + -fVar102 * fVar102 + -fVar82 * fVar82;
                fVar128 = fVar81 * fVar81 - fVar83 * fVar83;
                fVar129 = fVar102 * fVar102 + fVar128 + -fVar82 * fVar82;
                fVar140 = fVar83 * fVar82 - fVar81 * fVar102;
                fVar96 = fVar81 * fVar102 + fVar83 * fVar82;
                fVar137 = fVar102 * fVar82 + fVar81 * fVar83;
                fVar81 = fVar102 * fVar82 - fVar81 * fVar83;
                pfVar2 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                fVar107 = *pfVar2;
                fVar6 = pfVar2[1];
                fVar117 = pfVar2[2];
                fVar131 = fVar131 + fVar131;
                fVar140 = fVar140 + fVar140;
                fVar108 = fVar108 + fVar108;
                fVar137 = fVar137 + fVar137;
                fVar96 = fVar96 + fVar96;
                fVar81 = fVar81 + fVar81;
                fVar83 = fVar82 * fVar82 + fVar128 + -fVar102 * fVar102;
                fVar115 = fVar114 * 1.0 + fVar131 * 0.0 + fVar140 * 0.0;
                fVar118 = fVar114 * 0.0 + fVar131 * 1.0 + fVar140 * 0.0;
                fVar121 = fVar114 * 0.0 + fVar131 * 0.0 + fVar140 * 1.0;
                fVar123 = fVar114 * 0.0 + fVar131 * 0.0 + fVar140 * 0.0;
                fVar109 = fVar108 * 1.0 + fVar129 * 0.0 + fVar137 * 0.0;
                fVar110 = fVar108 * 0.0 + fVar129 * 1.0 + fVar137 * 0.0;
                fVar111 = fVar108 * 0.0 + fVar129 * 0.0 + fVar137 * 1.0;
                fVar113 = fVar108 * 0.0 + fVar129 * 0.0 + fVar137 * 0.0;
                fVar108 = fVar96 * 1.0 + fVar81 * 0.0 + fVar83 * 0.0;
                fVar114 = fVar96 * 0.0 + fVar81 * 1.0 + fVar83 * 0.0;
                fVar131 = fVar96 * 0.0 + fVar81 * 0.0 + fVar83 * 1.0;
                fVar140 = fVar96 * 0.0 + fVar81 * 0.0 + fVar83 * 0.0;
                local_188 = auVar9._4_4_;
                fStack_184 = auVar9._8_4_;
                local_198 = auVar9._0_4_;
                fVar132 = local_198 * fVar115 + fVar109 * 0.0 + fVar108 * 0.0;
                fVar134 = local_198 * fVar118 + fVar110 * 0.0 + fVar114 * 0.0;
                fVar135 = local_198 * fVar121 + fVar111 * 0.0 + fVar131 * 0.0;
                fVar136 = local_198 * fVar123 + fVar113 * 0.0 + fVar140 * 0.0;
                fVar128 = fVar125 * fVar115 + fVar130 * fVar109 + fVar108 * 0.0;
                fVar129 = fVar125 * fVar118 + fVar130 * fVar110 + fVar114 * 0.0;
                fVar137 = fVar125 * fVar121 + fVar130 * fVar111 + fVar131 * 0.0;
                fVar97 = fVar125 * fVar123 + fVar130 * fVar113 + fVar140 * 0.0;
                local_168.l.vz.field_0.m128[0] =
                     fVar112 * fVar115 + fVar103 * fVar109 + fVar106 * fVar108;
                local_168.l.vz.field_0.m128[1] =
                     fVar112 * fVar118 + fVar103 * fVar110 + fVar106 * fVar114;
                local_168.l.vz.field_0.m128[2] =
                     fVar112 * fVar121 + fVar103 * fVar111 + fVar106 * fVar131;
                local_168.l.vz.field_0.m128[3] =
                     fVar112 * fVar123 + fVar103 * fVar113 + fVar106 * fVar140;
                fVar81 = pfVar1[0xf];
                fVar83 = pfVar1[3];
                fVar102 = pfVar1[7];
                fVar82 = pfVar1[0xb];
                fVar133 = fVar83 * fVar102 + fVar81 * fVar82;
                fVar98 = fVar83 * fVar102 - fVar81 * fVar82;
                fVar99 = fVar81 * fVar81 + fVar83 * fVar83 + -fVar102 * fVar102 + -fVar82 * fVar82;
                fVar130 = fVar81 * fVar81 - fVar83 * fVar83;
                fVar139 = fVar102 * fVar102 + fVar130 + -fVar82 * fVar82;
                fVar138 = fVar83 * fVar82 - fVar81 * fVar102;
                fVar104 = fVar81 * fVar102 + fVar83 * fVar82;
                fVar141 = fVar102 * fVar82 + fVar81 * fVar83;
                fVar96 = fVar102 * fVar82 - fVar81 * fVar83;
                fVar81 = *pfVar1;
                fVar83 = pfVar1[4];
                fVar125 = pfVar1[5];
                fVar124 = fVar82 * fVar82 + fVar130 + -fVar102 * fVar102;
                fVar102 = pfVar1[8];
                fVar82 = pfVar1[9];
                fVar130 = pfVar1[10];
                fVar133 = fVar133 + fVar133;
                fVar138 = fVar138 + fVar138;
                fVar112 = pfVar1[0xc];
                fVar103 = pfVar1[0xd];
                fVar106 = pfVar1[0xe];
                fVar100 = fVar99 * 1.0 + fVar133 * 0.0 + fVar138 * 0.0;
                fVar101 = fVar99 * 0.0 + fVar133 * 1.0 + fVar138 * 0.0;
                fVar138 = fVar99 * 0.0 + fVar133 * 0.0 + fVar138 * 1.0;
                fVar98 = fVar98 + fVar98;
                fVar141 = fVar141 + fVar141;
                fVar104 = fVar104 + fVar104;
                fVar96 = fVar96 + fVar96;
                fVar99 = fVar98 * 1.0 + fVar139 * 0.0 + fVar141 * 0.0;
                fVar133 = fVar98 * 0.0 + fVar139 * 1.0 + fVar141 * 0.0;
                fVar98 = fVar98 * 0.0 + fVar139 * 0.0 + fVar141 * 1.0;
                fVar139 = fVar104 * 1.0 + fVar96 * 0.0 + fVar124 * 0.0;
                fVar141 = fVar104 * 0.0 + fVar96 * 1.0 + fVar124 * 0.0;
                fVar96 = fVar104 * 0.0 + fVar96 * 0.0 + fVar124 * 1.0;
                fVar116 = fVar81 * fVar100 + fVar99 * 0.0 + fVar139 * 0.0;
                fVar119 = fVar81 * fVar101 + fVar133 * 0.0 + fVar141 * 0.0;
                fVar122 = fVar81 * fVar138 + fVar98 * 0.0 + fVar96 * 0.0;
                fVar104 = fVar83 * fVar100 + fVar125 * fVar99 + fVar139 * 0.0;
                fVar124 = fVar83 * fVar101 + fVar125 * fVar133 + fVar141 * 0.0;
                fVar105 = fVar83 * fVar138 + fVar125 * fVar98 + fVar96 * 0.0;
                fVar125 = fVar102 * fVar100 + fVar82 * fVar99 + fVar130 * fVar139;
                fVar126 = fVar102 * fVar101 + fVar82 * fVar133 + fVar130 * fVar141;
                fVar127 = fVar102 * fVar138 + fVar82 * fVar98 + fVar130 * fVar96;
                fVar130 = fVar112 * fVar100 + fVar103 * fVar99 + fVar106 * fVar139 + pfVar1[1] + 0.0
                ;
                fVar99 = fVar112 * fVar101 + fVar103 * fVar133 + fVar106 * fVar141 + pfVar1[2] + 0.0
                ;
                fVar112 = fVar112 * fVar138 + fVar103 * fVar98 + fVar106 * fVar96 + pfVar1[6] + 0.0;
                fVar82 = fVar116 * fVar132 +
                         fVar119 * fVar128 + fVar122 * local_168.l.vz.field_0.m128[0];
                local_198 = fVar116 * fVar134 +
                            fVar119 * fVar129 + fVar122 * local_168.l.vz.field_0.m128[1];
                fVar83 = fVar116 * fVar135 +
                         fVar119 * fVar137 + fVar122 * local_168.l.vz.field_0.m128[2];
                fVar81 = fVar125 * fVar132 +
                         fVar126 * fVar128 + fVar127 * local_168.l.vz.field_0.m128[0];
                fVar102 = fVar125 * fVar134 +
                          fVar126 * fVar129 + fVar127 * local_168.l.vz.field_0.m128[1];
                fVar103 = fVar125 * fVar135 +
                          fVar126 * fVar137 + fVar127 * local_168.l.vz.field_0.m128[2];
                uVar73 = extraout_RDX_17;
                fVar106 = fVar125 * fVar136 +
                          fVar126 * fVar97 + fVar127 * local_168.l.vz.field_0.m128[3];
                fVar125 = fVar116 * fVar136 +
                          fVar119 * fVar97 + fVar122 * local_168.l.vz.field_0.m128[3];
                fVar96 = fVar130 * fVar132 +
                         fVar99 * fVar128 + fVar112 * local_168.l.vz.field_0.m128[0] +
                         fVar107 * fVar115 + fVar6 * fVar109 + fVar117 * fVar108 + local_188 + 0.0;
                fVar108 = fVar130 * fVar134 +
                          fVar99 * fVar129 + fVar112 * local_168.l.vz.field_0.m128[1] +
                          fVar107 * fVar118 + fVar6 * fVar110 + fVar117 * fVar114 + fStack_184 + 0.0
                ;
                fVar114 = fVar130 * fVar135 +
                          fVar99 * fVar137 + fVar112 * local_168.l.vz.field_0.m128[2] +
                          fVar107 * fVar121 + fVar6 * fVar111 + fVar117 * fVar131 + pfVar3[2] + 0.0;
                fVar107 = fVar130 * fVar136 +
                          fVar99 * fVar97 + fVar112 * local_168.l.vz.field_0.m128[3] +
                          fVar107 * fVar123 + fVar6 * fVar113 + fVar117 * fVar140 + 0.0;
                uVar58 = fVar104 * fVar132 +
                         fVar124 * fVar128 + fVar105 * local_168.l.vz.field_0.m128[0];
                uVar120 = fVar104 * fVar134 +
                          fVar124 * fVar129 + fVar105 * local_168.l.vz.field_0.m128[1];
                fVar130 = fVar104 * fVar135 +
                          fVar124 * fVar137 + fVar105 * local_168.l.vz.field_0.m128[2];
                fVar112 = fVar104 * fVar136 +
                          fVar124 * fVar97 + fVar105 * local_168.l.vz.field_0.m128[3];
              }
              else {
                bVar57 = bVar10 ^ 1U | bVar57;
                if (bVar57 == 0) {
                  local_e8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 0xc));
                  local_c8 = ZEXT416(*(uint *)((long)pAVar13 + lVar75 + -0x24));
                  local_b8 = ZEXT416(*(uint *)((long)pAVar13 + lVar75 + -0x14));
                  local_f8 = ZEXT416(*(uint *)((long)pAVar13 + lVar75 + -4));
                  pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x20);
                  local_118 = *pfVar2;
                  fStack_114 = pfVar2[1];
                  fStack_d0 = pfVar2[2];
                  fStack_10c = pfVar2[3];
                  pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x10);
                  local_108 = *pfVar2;
                  fStack_104 = pfVar2[1];
                  fStack_100 = pfVar2[2];
                  fStack_fc = pfVar2[3];
                  pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x30);
                  local_98 = *pfVar2;
                  fStack_8c = pfVar2[1];
                  fVar81 = *pfVar1;
                  fVar102 = pfVar1[1];
                  fVar125 = pfVar1[2];
                  fVar130 = pfVar1[4];
                  fVar112 = pfVar1[5];
                  fVar103 = pfVar1[6];
                  local_128 = *(undefined8 *)(pfVar1 + 8);
                  uStack_120 = *(undefined8 *)(pfVar1 + 10);
                  fVar106 = pfVar1[0xc];
                  fVar96 = pfVar1[0xd];
                  fVar108 = pfVar1[0xe];
                  fVar82 = fVar81 * local_98 + fVar102 * local_118 + fVar125 * local_108;
                  fVar114 = fVar81 * 0.0 + fVar102 * fStack_114 + fVar125 * fStack_104;
                  fVar81 = fVar81 * 0.0 + fVar102 * 0.0 + fVar125 * fStack_100;
                  local_168.l.vz.field_0.m128[0] =
                       fVar130 * local_98 + fVar112 * local_118 + fVar103 * local_108;
                  local_168.l.vz.field_0.m128[1] =
                       fVar130 * 0.0 + fVar112 * fStack_114 + fVar103 * fStack_104;
                  local_168.l.vz.field_0.m128[2] =
                       fVar130 * 0.0 + fVar112 * 0.0 + fVar103 * fStack_100;
                  local_168.l.vz.field_0.m128[3] =
                       fVar130 * fStack_8c + fVar112 * fStack_10c + fVar103 * fStack_fc;
                  fStack_110 = 0.0;
                  fStack_94 = 0.0;
                  fStack_90 = 0.0;
                  pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                  local_a8._0_4_ =
                       fVar106 * local_98 + fVar96 * local_118 + fVar108 * local_108 + *pfVar1;
                  local_a8._4_4_ =
                       fVar106 * 0.0 + fVar96 * fStack_114 + fVar108 * fStack_104 + pfVar1[1];
                  fStack_a0 = fVar106 * 0.0 + fVar96 * 0.0 + fVar108 * fStack_100 + pfVar1[2];
                  register0x0000128c =
                       fVar106 * fStack_8c + fVar96 * fStack_10c + fVar108 * fStack_fc + pfVar1[3];
                  local_d8 = local_118;
                  fStack_d4 = fStack_114;
                  fStack_cc = fStack_10c;
                  if (((fVar114 != 0.0) || (NAN(fVar114))) ||
                     ((fVar81 != 0.0 ||
                      (((NAN(fVar81) || (local_168.l.vz.field_0.m128[2] != 0.0)) ||
                       (NAN(local_168.l.vz.field_0.m128[2]))))))) {
                    poVar60 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar60);
                    uVar73 = extraout_RDX_19;
                  }
                  fVar81 = local_98 * (float)local_128 +
                           local_118 * local_128._4_4_ + local_108 * (float)uStack_120;
                  fVar102 = fStack_94 * (float)local_128 +
                            fStack_114 * local_128._4_4_ + fStack_104 * (float)uStack_120;
                  fVar103 = fStack_90 * (float)local_128 +
                            fStack_110 * local_128._4_4_ + fStack_100 * (float)uStack_120;
                  local_168.l.vy.field_0._8_1_ = 1;
                  fVar106 = (float)local_f8._0_4_;
                  fVar125 = (float)local_c8._0_4_;
                  fVar96 = (float)local_a8._0_4_;
                  fVar108 = (float)local_a8._4_4_;
                  fVar114 = fStack_a0;
                  fVar107 = (float)local_e8._0_4_;
                  uVar58 = local_168.l.vz.field_0.m128[0];
                  uVar120 = local_168.l.vz.field_0.m128[1];
                  fVar130 = fStack_d0;
                  fVar112 = (float)local_b8._0_4_;
                }
                else {
                  if (((local_198 != 0.0) || (NAN(local_198))) ||
                     ((fVar83 != 0.0 ||
                      ((NAN(fVar83) ||
                       (uVar61 = *(undefined8 *)((long)pAVar13 + lVar75 + -0x10),
                       auVar23._4_4_ = -(uint)(*(float *)((long)pAVar13 + lVar75 + -0x20) != 0.0),
                       auVar23._0_4_ = -(uint)(*(float *)((long)pAVar13 + lVar75 + -0x18) != 0.0),
                       auVar23._8_4_ = -(uint)((float)uVar61 != 0.0),
                       auVar23._12_4_ = -(uint)((float)((ulong)uVar61 >> 0x20) != 0.0),
                       uVar58 = movmskps((int)CONCAT71(uVar71,bVar57),auVar23), (char)uVar58 != '\0'
                       )))))) {
                    poVar60 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar60);
                    uVar73 = extraout_RDX_18;
                  }
                  fVar81 = pfVar1[8];
                  fVar102 = pfVar1[9];
                  uVar61 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                  fVar82 = *(float *)((long)pAVar13 + lVar75 + -0x30) * *pfVar1;
                  local_198 = pfVar1[1] + (float)uVar61;
                  fVar83 = pfVar1[2] + (float)((ulong)uVar61 >> 0x20);
                  fVar103 = pfVar1[10] * *(float *)((long)pAVar13 + lVar75 + -8);
                  local_168.l.vy.field_0._8_1_ = 1;
                  fVar106 = pfVar1[0xb];
                  fVar125 = pfVar1[3];
                  fVar96 = pfVar1[0xc];
                  fVar108 = pfVar1[0xd];
                  fVar114 = pfVar1[0xe];
                  fVar107 = pfVar1[0xf];
                  uVar58 = pfVar1[4];
                  uVar120 = pfVar1[5] * *(float *)((long)pAVar13 + lVar75 + -0x1c);
                  fVar130 = pfVar1[6] + *(float *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 8);
                  fVar112 = pfVar1[7];
                }
              }
            }
          }
          else {
            pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x24);
            auVar20._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar20._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar20._8_4_ = -(uint)(pfVar2[2] != 1.0);
            auVar20._12_4_ = -(uint)(pfVar2[3] != 0.0);
            uVar77 = movmskps(uVar77,auVar20);
            if ((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) ||
               (((uVar77 & 4) != 0 ||
                (bVar72 = ((byte)uVar77 & 8) >> 3, uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72),
                bVar72 != 0)))) goto LAB_0015e349;
            pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x14);
            auVar21._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar21._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar21._8_4_ = -(uint)(pfVar2[2] != 0.0);
            auVar21._12_4_ = -(uint)(pfVar2[3] != 1.0);
            uVar77 = movmskps(uVar77,auVar21);
            if (((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) || ((uVar77 & 4) != 0)) ||
               (bVar72 = ((byte)uVar77 & 8) >> 3, uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72),
               bVar72 != 0)) goto LAB_0015e349;
            pfVar2 = (float *)((long)pAVar13 + lVar75 + -4);
            auVar22._4_4_ = -(uint)(pfVar2[1] != 0.0);
            auVar22._0_4_ = -(uint)(*pfVar2 != 0.0);
            auVar22._8_4_ = -(uint)(pfVar2[2] != 0.0);
            auVar22._12_4_ = -(uint)(pfVar2[3] != 0.0);
            uVar77 = movmskps(uVar77,auVar22);
            if ((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) || ((uVar77 & 4) != 0))
            goto LAB_0015e349;
            bVar72 = ((byte)uVar77 & 8) >> 3;
            uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
            uVar73 = (ulong)uVar77;
            if ((bVar72 != 0) ||
               ((bVar10 != false &&
                ((fVar81 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 0xc), fVar81 != 1.0
                 || (NAN(fVar81))))))) goto LAB_0015e349;
            fVar82 = *pfVar1;
            local_198 = pfVar1[1];
            fVar83 = pfVar1[2];
            fVar125 = pfVar1[3];
            uVar58 = pfVar1[4];
            uVar120 = pfVar1[5];
            fVar130 = pfVar1[6];
            fVar112 = pfVar1[7];
            fVar81 = pfVar1[8];
            fVar102 = pfVar1[9];
            fVar103 = pfVar1[10];
            fVar106 = pfVar1[0xb];
            fVar96 = pfVar1[0xc];
            fVar108 = pfVar1[0xd];
            fVar114 = pfVar1[0xe];
            fVar107 = pfVar1[0xf];
            local_168.l.vy.field_0._8_1_ = bVar57;
          }
LAB_0015ea63:
          pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + -0x30 + lVar75);
          *pfVar1 = fVar82;
          pfVar1[1] = local_198;
          pfVar1[2] = fVar83;
          pfVar1[3] = fVar125;
          pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + -0x20 + lVar75);
          *pfVar1 = (float)uVar58;
          pfVar1[1] = (float)uVar120;
          pfVar1[2] = fVar130;
          pfVar1[3] = fVar112;
          pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + -0x10 + lVar75);
          *pfVar1 = fVar81;
          pfVar1[1] = fVar102;
          pfVar1[2] = fVar103;
          pfVar1[3] = fVar106;
          pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + lVar75);
          *pfVar1 = fVar96;
          pfVar1[1] = fVar108;
          pfVar1[2] = fVar114;
          pfVar1[3] = fVar107;
          lVar75 = lVar75 + 0x40;
          uVar61 = local_168.l.vy.field_0._0_8_;
        }
      }
      else {
        if (sVar12 != plVar59[0xf]) {
          prVar70 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar70,"number of transformations does not match");
          __cxa_throw(prVar70,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        fVar81 = (spaces->time_range).lower;
        fVar83 = (spaces->time_range).upper;
        fVar102 = (float)plVar59[0xd];
        fVar82 = (float)((ulong)plVar59[0xd] >> 0x20);
        uVar77 = -(uint)(fVar81 < fVar102);
        uVar79 = -(uint)(fVar83 < fVar82);
        local_178._0_8_ =
             CONCAT44(~uVar79 & (uint)fVar82,~uVar77 & (uint)fVar81) |
             CONCAT44((uint)fVar83 & uVar79,(uint)fVar102 & uVar77);
        local_168.l.vy.field_0._0_8_ = (void *)0x0;
        local_168.l.vx.field_0._0_8_ = 0;
        local_168.l.vx.field_0._8_8_ = 0;
        if (sVar12 != 0) {
          local_168.l.vy.field_0._0_8_ = alignedMalloc(sVar12 << 6,0x10);
          uVar73 = extraout_RDX_16;
          local_168.l.vx.field_0._8_8_ = sVar12;
        }
        if (spaces->quaternion == false) {
          uVar61 = ZEXT48(*(uint *)(plVar59 + 0x12));
        }
        else {
          uVar61 = (void *)0x1;
        }
        lVar75 = 0x30;
        local_168.l.vy.field_0._8_1_ = (undefined1)uVar61;
        local_168.l.vx.field_0._0_8_ = local_168.l.vx.field_0._8_8_;
        for (uVar74 = 0; uVar77 = (uint)uVar73, uVar74 < (spaces->spaces).size_active;
            uVar74 = uVar74 + 1) {
          pAVar13 = (spaces->spaces).items;
          lVar14 = plVar59[0x11];
          bVar10 = spaces->quaternion;
          uVar71 = (undefined7)((ulong)uVar61 >> 8);
          uVar62 = CONCAT71(uVar71,bVar10);
          bVar57 = *(byte *)(plVar59 + 0x12);
          local_168.l.vy.field_0._8_1_ = 0;
          fVar81 = *(float *)((long)pAVar13 + lVar75 + -0x30);
          uVar61 = *(undefined8 *)((long)pAVar13 + lVar75 + -0x2c);
          fVar83 = (float)((ulong)uVar61 >> 0x20);
          local_198 = (float)uVar61;
          if ((((fVar81 != 1.0) || (NAN(fVar81))) || (local_198 != 0.0)) ||
             (((NAN(local_198) || (fVar83 != 0.0)) || (NAN(fVar83))))) {
LAB_0015ef19:
            uVar61 = *(undefined8 *)(lVar14 + -0x30 + lVar75);
            fVar102 = (float)uVar61;
            fVar125 = (float)((ulong)uVar61 >> 0x20);
            iVar78 = -(uint)(fVar102 != 1.0);
            iVar80 = -(uint)(fVar125 != 0.0);
            auVar95._4_4_ = iVar80;
            auVar95._0_4_ = iVar78;
            auVar95._8_4_ = iVar80;
            auVar95._12_4_ = iVar80;
            auVar94._8_8_ = auVar95._8_8_;
            auVar94._4_4_ = iVar78;
            auVar94._0_4_ = iVar78;
            uVar77 = movmskpd(uVar77,auVar94);
            fVar81 = *(float *)(lVar14 + -0x28 + lVar75);
            if (((((uVar77 & 1) == 0) && (bVar72 = (byte)uVar77 >> 1, bVar72 == 0)) &&
                (fVar81 == 0.0)) && (!NAN(fVar81))) {
              pfVar1 = (float *)(lVar14 + -0x24 + lVar75);
              auVar45._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar45._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar45._8_4_ = -(uint)(pfVar1[2] != 1.0);
              auVar45._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar77 = movmskps(CONCAT31((int3)(uVar77 >> 8),bVar72),auVar45);
              if ((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                 (((uVar77 & 4) == 0 && (bVar72 = ((byte)uVar77 & 8) >> 3, bVar72 == 0)))) {
                pfVar1 = (float *)(lVar14 + -0x14 + lVar75);
                auVar46._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar46._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar46._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar46._12_4_ = -(uint)(pfVar1[3] != 1.0);
                uVar77 = movmskps(CONCAT31((int3)(uVar77 >> 8),bVar72),auVar46);
                if ((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                   (((uVar77 & 4) == 0 && (bVar72 = ((byte)uVar77 & 8) >> 3, bVar72 == 0)))) {
                  pfVar1 = (float *)(lVar14 + -4 + lVar75);
                  auVar47._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar47._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar47._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar47._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar77 = movmskps(CONCAT31((int3)(uVar77 >> 8),bVar72),auVar47);
                  if ((((((bVar57 & (byte)uVar77) == 0) && ((uVar77 & 2) == 0)) &&
                       ((uVar77 & 4) == 0)) &&
                      (bVar72 = ((byte)uVar77 & 8) >> 3,
                      uVar73 = (ulong)CONCAT31((int3)(uVar77 >> 8),bVar72), bVar72 == 0)) &&
                     ((bVar57 == 0 ||
                      ((fVar82 = *(float *)(lVar14 + 0xc + lVar75), fVar82 == 1.0 && (!NAN(fVar82)))
                      )))) {
                    pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x30);
                    fVar82 = *pfVar1;
                    local_198 = pfVar1[1];
                    fVar83 = pfVar1[2];
                    fVar125 = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x20);
                    uVar58 = *pfVar1;
                    uVar120 = pfVar1[1];
                    fVar130 = pfVar1[2];
                    fVar112 = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x10);
                    fVar81 = *pfVar1;
                    fVar102 = pfVar1[1];
                    fVar103 = pfVar1[2];
                    fVar106 = pfVar1[3];
                    pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                    fVar96 = *pfVar1;
                    fVar108 = pfVar1[1];
                    fVar114 = pfVar1[2];
                    fVar107 = pfVar1[3];
                    local_168.l.vy.field_0._8_1_ = bVar10;
                    goto LAB_0015f64a;
                  }
                }
              }
            }
            uVar73 = uVar62 & 0xffffffff;
            bVar72 = (byte)uVar73 | bVar57;
            uVar73 = CONCAT71((int7)(uVar73 >> 8),bVar72);
            if (bVar72 == 0) {
              pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x30);
              fVar114 = *pfVar1;
              fVar128 = pfVar1[1];
              fVar129 = pfVar1[2];
              fVar131 = pfVar1[3];
              pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x20);
              fVar137 = *pfVar1;
              fVar140 = pfVar1[1];
              fVar97 = pfVar1[2];
              fVar98 = pfVar1[3];
              pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x10);
              fVar99 = *pfVar1;
              fVar133 = pfVar1[1];
              fVar100 = pfVar1[2];
              fVar101 = pfVar1[3];
              fVar82 = fVar102 * fVar114 + fVar125 * fVar137 + fVar81 * fVar99;
              local_198 = fVar102 * fVar128 + fVar125 * fVar140 + fVar81 * fVar133;
              fVar83 = fVar102 * fVar129 + fVar125 * fVar97 + fVar81 * fVar100;
              fVar125 = fVar102 * fVar131 + fVar125 * fVar98 + fVar81 * fVar101;
              fVar81 = *(float *)(lVar14 + -0x20 + lVar75);
              fVar102 = *(float *)(lVar14 + -0x1c + lVar75);
              fVar112 = *(float *)(lVar14 + -0x18 + lVar75);
              fVar106 = *(float *)(lVar14 + -0x10 + lVar75);
              uVar58 = fVar81 * fVar114 + fVar102 * fVar137 + fVar112 * fVar99;
              uVar120 = fVar81 * fVar128 + fVar102 * fVar140 + fVar112 * fVar133;
              fVar130 = fVar81 * fVar129 + fVar102 * fVar97 + fVar112 * fVar100;
              fVar112 = fVar81 * fVar131 + fVar102 * fVar98 + fVar112 * fVar101;
              fVar96 = *(float *)(lVar14 + -0xc + lVar75);
              fVar108 = *(float *)(lVar14 + -8 + lVar75);
              fVar81 = fVar106 * fVar114 + fVar96 * fVar137 + fVar108 * fVar99;
              fVar102 = fVar106 * fVar128 + fVar96 * fVar140 + fVar108 * fVar133;
              fVar103 = fVar106 * fVar129 + fVar96 * fVar97 + fVar108 * fVar100;
              fVar106 = fVar106 * fVar131 + fVar96 * fVar98 + fVar108 * fVar101;
              fVar107 = *(float *)(lVar14 + lVar75);
              fVar6 = *(float *)(lVar14 + 4 + lVar75);
              fVar117 = *(float *)(lVar14 + 8 + lVar75);
              pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
              fVar96 = fVar107 * fVar114 + fVar6 * fVar137 + fVar117 * fVar99 + *pfVar1;
              fVar108 = fVar107 * fVar128 + fVar6 * fVar140 + fVar117 * fVar133 + pfVar1[1];
              fVar114 = fVar107 * fVar129 + fVar6 * fVar97 + fVar117 * fVar100 + pfVar1[2];
              fVar107 = fVar107 * fVar131 + fVar6 * fVar98 + fVar117 * fVar101 + pfVar1[3];
            }
            else {
              uVar62 = uVar62 & 0xffffffff;
              bVar72 = (byte)uVar62 & bVar57;
              uVar73 = CONCAT71((int7)(uVar62 >> 8),bVar72);
              if (bVar72 == 1) {
                poVar60 = std::operator<<((ostream *)&std::cout,
                                          "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                         );
                std::endl<char,std::char_traits<char>>(poVar60);
                fVar81 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 0xc);
                fVar83 = *(float *)((long)pAVar13 + lVar75 + -0x24);
                fVar102 = *(float *)((long)pAVar13 + lVar75 + -0x14);
                fVar82 = *(float *)((long)pAVar13 + lVar75 + -4);
                auVar9 = *(undefined1 (*) [16])((long)pAVar13 + lVar75 + -0x30);
                pfVar2 = (float *)((long)pAVar13 + lVar75 + -0x20);
                fVar125 = *pfVar2;
                fVar130 = pfVar2[1];
                pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x10);
                fVar112 = *pfVar1;
                fVar103 = pfVar1[1];
                fVar106 = pfVar1[2];
                fVar131 = fVar83 * fVar102 + fVar81 * fVar82;
                fVar108 = fVar83 * fVar102 - fVar81 * fVar82;
                fVar114 = fVar81 * fVar81 + fVar83 * fVar83 + -fVar102 * fVar102 + -fVar82 * fVar82;
                fVar128 = fVar81 * fVar81 - fVar83 * fVar83;
                fVar129 = fVar102 * fVar102 + fVar128 + -fVar82 * fVar82;
                fVar140 = fVar83 * fVar82 - fVar81 * fVar102;
                fVar96 = fVar81 * fVar102 + fVar83 * fVar82;
                fVar137 = fVar102 * fVar82 + fVar81 * fVar83;
                fVar81 = fVar102 * fVar82 - fVar81 * fVar83;
                pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                fVar107 = *pfVar1;
                fVar6 = pfVar1[1];
                fVar117 = pfVar1[2];
                fVar131 = fVar131 + fVar131;
                fVar140 = fVar140 + fVar140;
                fVar108 = fVar108 + fVar108;
                fVar137 = fVar137 + fVar137;
                fVar96 = fVar96 + fVar96;
                fVar81 = fVar81 + fVar81;
                fVar83 = fVar82 * fVar82 + fVar128 + -fVar102 * fVar102;
                fVar115 = fVar114 * 1.0 + fVar131 * 0.0 + fVar140 * 0.0;
                fVar118 = fVar114 * 0.0 + fVar131 * 1.0 + fVar140 * 0.0;
                fVar121 = fVar114 * 0.0 + fVar131 * 0.0 + fVar140 * 1.0;
                fVar123 = fVar114 * 0.0 + fVar131 * 0.0 + fVar140 * 0.0;
                fVar109 = fVar108 * 1.0 + fVar129 * 0.0 + fVar137 * 0.0;
                fVar110 = fVar108 * 0.0 + fVar129 * 1.0 + fVar137 * 0.0;
                fVar111 = fVar108 * 0.0 + fVar129 * 0.0 + fVar137 * 1.0;
                fVar113 = fVar108 * 0.0 + fVar129 * 0.0 + fVar137 * 0.0;
                fVar108 = fVar96 * 1.0 + fVar81 * 0.0 + fVar83 * 0.0;
                fVar114 = fVar96 * 0.0 + fVar81 * 1.0 + fVar83 * 0.0;
                fVar131 = fVar96 * 0.0 + fVar81 * 0.0 + fVar83 * 1.0;
                fVar140 = fVar96 * 0.0 + fVar81 * 0.0 + fVar83 * 0.0;
                local_188 = auVar9._4_4_;
                fStack_184 = auVar9._8_4_;
                local_198 = auVar9._0_4_;
                fVar132 = local_198 * fVar115 + fVar109 * 0.0 + fVar108 * 0.0;
                fVar134 = local_198 * fVar118 + fVar110 * 0.0 + fVar114 * 0.0;
                fVar135 = local_198 * fVar121 + fVar111 * 0.0 + fVar131 * 0.0;
                fVar136 = local_198 * fVar123 + fVar113 * 0.0 + fVar140 * 0.0;
                fVar128 = fVar125 * fVar115 + fVar130 * fVar109 + fVar108 * 0.0;
                fVar129 = fVar125 * fVar118 + fVar130 * fVar110 + fVar114 * 0.0;
                fVar137 = fVar125 * fVar121 + fVar130 * fVar111 + fVar131 * 0.0;
                fVar97 = fVar125 * fVar123 + fVar130 * fVar113 + fVar140 * 0.0;
                local_168.l.vz.field_0.m128[0] =
                     fVar112 * fVar115 + fVar103 * fVar109 + fVar106 * fVar108;
                local_168.l.vz.field_0.m128[1] =
                     fVar112 * fVar118 + fVar103 * fVar110 + fVar106 * fVar114;
                local_168.l.vz.field_0.m128[2] =
                     fVar112 * fVar121 + fVar103 * fVar111 + fVar106 * fVar131;
                local_168.l.vz.field_0.m128[3] =
                     fVar112 * fVar123 + fVar103 * fVar113 + fVar106 * fVar140;
                fVar81 = *(float *)(lVar14 + 0xc + lVar75);
                fVar83 = *(float *)(lVar14 + -0x24 + lVar75);
                fVar102 = *(float *)(lVar14 + -0x14 + lVar75);
                fVar82 = *(float *)(lVar14 + -4 + lVar75);
                fVar133 = fVar83 * fVar102 + fVar81 * fVar82;
                fVar98 = fVar83 * fVar102 - fVar81 * fVar82;
                fVar99 = fVar81 * fVar81 + fVar83 * fVar83 + -fVar102 * fVar102 + -fVar82 * fVar82;
                fVar130 = fVar81 * fVar81 - fVar83 * fVar83;
                fVar139 = fVar102 * fVar102 + fVar130 + -fVar82 * fVar82;
                fVar138 = fVar83 * fVar82 - fVar81 * fVar102;
                fVar104 = fVar81 * fVar102 + fVar83 * fVar82;
                fVar141 = fVar102 * fVar82 + fVar81 * fVar83;
                fVar96 = fVar102 * fVar82 - fVar81 * fVar83;
                pfVar3 = (float *)(lVar14 + -0x30 + lVar75);
                fVar81 = *pfVar3;
                pfVar4 = (float *)(lVar14 + -0x20 + lVar75);
                fVar83 = *pfVar4;
                fVar125 = pfVar4[1];
                fVar124 = fVar82 * fVar82 + fVar130 + -fVar102 * fVar102;
                pfVar1 = (float *)(lVar14 + -0x10 + lVar75);
                fVar102 = *pfVar1;
                fVar82 = pfVar1[1];
                fVar130 = pfVar1[2];
                fVar133 = fVar133 + fVar133;
                fVar138 = fVar138 + fVar138;
                pfVar1 = (float *)(lVar14 + lVar75);
                fVar112 = *pfVar1;
                fVar103 = pfVar1[1];
                fVar106 = pfVar1[2];
                fVar100 = fVar99 * 1.0 + fVar133 * 0.0 + fVar138 * 0.0;
                fVar101 = fVar99 * 0.0 + fVar133 * 1.0 + fVar138 * 0.0;
                fVar138 = fVar99 * 0.0 + fVar133 * 0.0 + fVar138 * 1.0;
                fVar98 = fVar98 + fVar98;
                fVar141 = fVar141 + fVar141;
                fVar104 = fVar104 + fVar104;
                fVar96 = fVar96 + fVar96;
                fVar99 = fVar98 * 1.0 + fVar139 * 0.0 + fVar141 * 0.0;
                fVar133 = fVar98 * 0.0 + fVar139 * 1.0 + fVar141 * 0.0;
                fVar98 = fVar98 * 0.0 + fVar139 * 0.0 + fVar141 * 1.0;
                fVar139 = fVar104 * 1.0 + fVar96 * 0.0 + fVar124 * 0.0;
                fVar141 = fVar104 * 0.0 + fVar96 * 1.0 + fVar124 * 0.0;
                fVar96 = fVar104 * 0.0 + fVar96 * 0.0 + fVar124 * 1.0;
                fVar116 = fVar81 * fVar100 + fVar99 * 0.0 + fVar139 * 0.0;
                fVar119 = fVar81 * fVar101 + fVar133 * 0.0 + fVar141 * 0.0;
                fVar122 = fVar81 * fVar138 + fVar98 * 0.0 + fVar96 * 0.0;
                fVar104 = fVar83 * fVar100 + fVar125 * fVar99 + fVar139 * 0.0;
                fVar124 = fVar83 * fVar101 + fVar125 * fVar133 + fVar141 * 0.0;
                fVar105 = fVar83 * fVar138 + fVar125 * fVar98 + fVar96 * 0.0;
                fVar125 = fVar102 * fVar100 + fVar82 * fVar99 + fVar130 * fVar139;
                fVar126 = fVar102 * fVar101 + fVar82 * fVar133 + fVar130 * fVar141;
                fVar127 = fVar102 * fVar138 + fVar82 * fVar98 + fVar130 * fVar96;
                fVar130 = fVar112 * fVar100 + fVar103 * fVar99 + fVar106 * fVar139 + pfVar3[1] + 0.0
                ;
                fVar99 = fVar112 * fVar101 + fVar103 * fVar133 + fVar106 * fVar141 + pfVar3[2] + 0.0
                ;
                fVar112 = fVar112 * fVar138 + fVar103 * fVar98 + fVar106 * fVar96 + pfVar4[2] + 0.0;
                fVar82 = fVar116 * fVar132 +
                         fVar119 * fVar128 + fVar122 * local_168.l.vz.field_0.m128[0];
                local_198 = fVar116 * fVar134 +
                            fVar119 * fVar129 + fVar122 * local_168.l.vz.field_0.m128[1];
                fVar83 = fVar116 * fVar135 +
                         fVar119 * fVar137 + fVar122 * local_168.l.vz.field_0.m128[2];
                fVar81 = fVar125 * fVar132 +
                         fVar126 * fVar128 + fVar127 * local_168.l.vz.field_0.m128[0];
                fVar102 = fVar125 * fVar134 +
                          fVar126 * fVar129 + fVar127 * local_168.l.vz.field_0.m128[1];
                fVar103 = fVar125 * fVar135 +
                          fVar126 * fVar137 + fVar127 * local_168.l.vz.field_0.m128[2];
                uVar73 = extraout_RDX_20;
                fVar106 = fVar125 * fVar136 +
                          fVar126 * fVar97 + fVar127 * local_168.l.vz.field_0.m128[3];
                fVar125 = fVar116 * fVar136 +
                          fVar119 * fVar97 + fVar122 * local_168.l.vz.field_0.m128[3];
                fVar96 = fVar130 * fVar132 +
                         fVar99 * fVar128 + fVar112 * local_168.l.vz.field_0.m128[0] +
                         fVar107 * fVar115 + fVar6 * fVar109 + fVar117 * fVar108 + local_188 + 0.0;
                fVar108 = fVar130 * fVar134 +
                          fVar99 * fVar129 + fVar112 * local_168.l.vz.field_0.m128[1] +
                          fVar107 * fVar118 + fVar6 * fVar110 + fVar117 * fVar114 + fStack_184 + 0.0
                ;
                fVar114 = fVar130 * fVar135 +
                          fVar99 * fVar137 + fVar112 * local_168.l.vz.field_0.m128[2] +
                          fVar107 * fVar121 + fVar6 * fVar111 + fVar117 * fVar131 + pfVar2[2] + 0.0;
                fVar107 = fVar130 * fVar136 +
                          fVar99 * fVar97 + fVar112 * local_168.l.vz.field_0.m128[3] +
                          fVar107 * fVar123 + fVar6 * fVar113 + fVar117 * fVar140 + 0.0;
                uVar58 = fVar104 * fVar132 +
                         fVar124 * fVar128 + fVar105 * local_168.l.vz.field_0.m128[0];
                uVar120 = fVar104 * fVar134 +
                          fVar124 * fVar129 + fVar105 * local_168.l.vz.field_0.m128[1];
                fVar130 = fVar104 * fVar135 +
                          fVar124 * fVar137 + fVar105 * local_168.l.vz.field_0.m128[2];
                fVar112 = fVar104 * fVar136 +
                          fVar124 * fVar97 + fVar105 * local_168.l.vz.field_0.m128[3];
              }
              else {
                bVar57 = bVar10 ^ 1U | bVar57;
                if (bVar57 == 0) {
                  local_e8 = ZEXT416(*(uint *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 0xc));
                  local_c8 = ZEXT416(*(uint *)((long)pAVar13 + lVar75 + -0x24));
                  local_b8 = ZEXT416(*(uint *)((long)pAVar13 + lVar75 + -0x14));
                  local_f8 = ZEXT416(*(uint *)((long)pAVar13 + lVar75 + -4));
                  pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x20);
                  local_118 = *pfVar1;
                  fStack_114 = pfVar1[1];
                  fStack_d0 = pfVar1[2];
                  fStack_10c = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x10);
                  local_108 = *pfVar1;
                  fStack_104 = pfVar1[1];
                  fStack_100 = pfVar1[2];
                  fStack_fc = pfVar1[3];
                  pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x30);
                  local_98 = *pfVar1;
                  fStack_8c = pfVar1[1];
                  pfVar1 = (float *)(lVar14 + -0x30 + lVar75);
                  fVar81 = *pfVar1;
                  fVar102 = pfVar1[1];
                  fVar125 = pfVar1[2];
                  pfVar1 = (float *)(lVar14 + -0x20 + lVar75);
                  fVar130 = *pfVar1;
                  fVar112 = pfVar1[1];
                  fVar103 = pfVar1[2];
                  puVar76 = (undefined8 *)(lVar14 + -0x10 + lVar75);
                  local_128 = *puVar76;
                  uStack_120 = puVar76[1];
                  pfVar1 = (float *)(lVar14 + lVar75);
                  fVar106 = *pfVar1;
                  fVar96 = pfVar1[1];
                  fVar108 = pfVar1[2];
                  fVar82 = fVar81 * local_98 + fVar102 * local_118 + fVar125 * local_108;
                  fVar114 = fVar81 * 0.0 + fVar102 * fStack_114 + fVar125 * fStack_104;
                  fVar81 = fVar81 * 0.0 + fVar102 * 0.0 + fVar125 * fStack_100;
                  local_168.l.vz.field_0.m128[0] =
                       fVar130 * local_98 + fVar112 * local_118 + fVar103 * local_108;
                  local_168.l.vz.field_0.m128[1] =
                       fVar130 * 0.0 + fVar112 * fStack_114 + fVar103 * fStack_104;
                  local_168.l.vz.field_0.m128[2] =
                       fVar130 * 0.0 + fVar112 * 0.0 + fVar103 * fStack_100;
                  local_168.l.vz.field_0.m128[3] =
                       fVar130 * fStack_8c + fVar112 * fStack_10c + fVar103 * fStack_fc;
                  fStack_110 = 0.0;
                  fStack_94 = 0.0;
                  fStack_90 = 0.0;
                  pfVar1 = (float *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                  local_a8._0_4_ =
                       fVar106 * local_98 + fVar96 * local_118 + fVar108 * local_108 + *pfVar1;
                  local_a8._4_4_ =
                       fVar106 * 0.0 + fVar96 * fStack_114 + fVar108 * fStack_104 + pfVar1[1];
                  fStack_a0 = fVar106 * 0.0 + fVar96 * 0.0 + fVar108 * fStack_100 + pfVar1[2];
                  register0x0000128c =
                       fVar106 * fStack_8c + fVar96 * fStack_10c + fVar108 * fStack_fc + pfVar1[3];
                  local_d8 = local_118;
                  fStack_d4 = fStack_114;
                  fStack_cc = fStack_10c;
                  if (((fVar114 != 0.0) || (NAN(fVar114))) ||
                     ((fVar81 != 0.0 ||
                      (((NAN(fVar81) || (local_168.l.vz.field_0.m128[2] != 0.0)) ||
                       (NAN(local_168.l.vz.field_0.m128[2]))))))) {
                    poVar60 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar60);
                    uVar73 = extraout_RDX_22;
                  }
                  fVar81 = local_98 * (float)local_128 +
                           local_118 * local_128._4_4_ + local_108 * (float)uStack_120;
                  fVar102 = fStack_94 * (float)local_128 +
                            fStack_114 * local_128._4_4_ + fStack_104 * (float)uStack_120;
                  fVar103 = fStack_90 * (float)local_128 +
                            fStack_110 * local_128._4_4_ + fStack_100 * (float)uStack_120;
                  local_168.l.vy.field_0._8_1_ = 1;
                  fVar106 = (float)local_f8._0_4_;
                  fVar125 = (float)local_c8._0_4_;
                  fVar96 = (float)local_a8._0_4_;
                  fVar108 = (float)local_a8._4_4_;
                  fVar114 = fStack_a0;
                  fVar107 = (float)local_e8._0_4_;
                  uVar58 = local_168.l.vz.field_0.m128[0];
                  uVar120 = local_168.l.vz.field_0.m128[1];
                  fVar130 = fStack_d0;
                  fVar112 = (float)local_b8._0_4_;
                }
                else {
                  if (((local_198 != 0.0) || (NAN(local_198))) ||
                     ((fVar83 != 0.0 ||
                      ((NAN(fVar83) ||
                       (uVar61 = *(undefined8 *)((long)pAVar13 + lVar75 + -0x10),
                       auVar27._4_4_ = -(uint)(*(float *)((long)pAVar13 + lVar75 + -0x20) != 0.0),
                       auVar27._0_4_ = -(uint)(*(float *)((long)pAVar13 + lVar75 + -0x18) != 0.0),
                       auVar27._8_4_ = -(uint)((float)uVar61 != 0.0),
                       auVar27._12_4_ = -(uint)((float)((ulong)uVar61 >> 0x20) != 0.0),
                       uVar58 = movmskps((int)CONCAT71(uVar71,bVar57),auVar27), (char)uVar58 != '\0'
                       )))))) {
                    poVar60 = std::operator<<((ostream *)&std::cout,
                                              "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                             );
                    std::endl<char,std::char_traits<char>>(poVar60);
                    uVar73 = extraout_RDX_21;
                  }
                  pfVar2 = (float *)(lVar14 + -0x30 + lVar75);
                  pfVar3 = (float *)(lVar14 + -0x20 + lVar75);
                  pfVar4 = (float *)(lVar14 + -0x10 + lVar75);
                  fVar81 = *pfVar4;
                  fVar102 = pfVar4[1];
                  pfVar1 = (float *)(lVar14 + lVar75);
                  uVar61 = *(undefined8 *)((long)&(pAVar13->l).vx.field_0 + lVar75);
                  fVar82 = *(float *)((long)pAVar13 + lVar75 + -0x30) * *pfVar2;
                  local_198 = pfVar2[1] + (float)uVar61;
                  fVar83 = pfVar2[2] + (float)((ulong)uVar61 >> 0x20);
                  fVar103 = pfVar4[2] * *(float *)((long)pAVar13 + lVar75 + -8);
                  local_168.l.vy.field_0._8_1_ = 1;
                  fVar106 = pfVar4[3];
                  fVar125 = pfVar2[3];
                  fVar96 = *pfVar1;
                  fVar108 = pfVar1[1];
                  fVar114 = pfVar1[2];
                  fVar107 = pfVar1[3];
                  uVar58 = *pfVar3;
                  uVar120 = pfVar3[1] * *(float *)((long)pAVar13 + lVar75 + -0x1c);
                  fVar130 = pfVar3[2] + *(float *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 8);
                  fVar112 = pfVar3[3];
                }
              }
            }
          }
          else {
            pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x24);
            auVar24._4_4_ = -(uint)(pfVar1[1] != 0.0);
            auVar24._0_4_ = -(uint)(*pfVar1 != 0.0);
            auVar24._8_4_ = -(uint)(pfVar1[2] != 1.0);
            auVar24._12_4_ = -(uint)(pfVar1[3] != 0.0);
            uVar77 = movmskps(uVar77,auVar24);
            if ((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) ||
               (((uVar77 & 4) != 0 ||
                (bVar72 = ((byte)uVar77 & 8) >> 3, uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72),
                bVar72 != 0)))) goto LAB_0015ef19;
            pfVar1 = (float *)((long)pAVar13 + lVar75 + -0x14);
            auVar25._4_4_ = -(uint)(pfVar1[1] != 0.0);
            auVar25._0_4_ = -(uint)(*pfVar1 != 0.0);
            auVar25._8_4_ = -(uint)(pfVar1[2] != 0.0);
            auVar25._12_4_ = -(uint)(pfVar1[3] != 1.0);
            uVar77 = movmskps(uVar77,auVar25);
            if (((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) || ((uVar77 & 4) != 0)) ||
               (bVar72 = ((byte)uVar77 & 8) >> 3, uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72),
               bVar72 != 0)) goto LAB_0015ef19;
            pfVar1 = (float *)((long)pAVar13 + lVar75 + -4);
            auVar26._4_4_ = -(uint)(pfVar1[1] != 0.0);
            auVar26._0_4_ = -(uint)(*pfVar1 != 0.0);
            auVar26._8_4_ = -(uint)(pfVar1[2] != 0.0);
            auVar26._12_4_ = -(uint)(pfVar1[3] != 0.0);
            uVar77 = movmskps(uVar77,auVar26);
            if ((((bVar10 & (byte)uVar77) != 0) || ((uVar77 & 2) != 0)) || ((uVar77 & 4) != 0))
            goto LAB_0015ef19;
            bVar72 = ((byte)uVar77 & 8) >> 3;
            uVar77 = CONCAT31((int3)(uVar77 >> 8),bVar72);
            uVar73 = (ulong)uVar77;
            if ((bVar72 != 0) ||
               ((bVar10 != false &&
                ((fVar81 = *(float *)((long)&(pAVar13->l).vx.field_0 + lVar75 + 0xc), fVar81 != 1.0
                 || (NAN(fVar81))))))) goto LAB_0015ef19;
            pfVar1 = (float *)(lVar14 + -0x30 + lVar75);
            fVar82 = *pfVar1;
            local_198 = pfVar1[1];
            fVar83 = pfVar1[2];
            fVar125 = pfVar1[3];
            pfVar1 = (float *)(lVar14 + -0x20 + lVar75);
            uVar58 = *pfVar1;
            uVar120 = pfVar1[1];
            fVar130 = pfVar1[2];
            fVar112 = pfVar1[3];
            pfVar1 = (float *)(lVar14 + -0x10 + lVar75);
            fVar81 = *pfVar1;
            fVar102 = pfVar1[1];
            fVar103 = pfVar1[2];
            fVar106 = pfVar1[3];
            pfVar1 = (float *)(lVar14 + lVar75);
            fVar96 = *pfVar1;
            fVar108 = pfVar1[1];
            fVar114 = pfVar1[2];
            fVar107 = pfVar1[3];
            local_168.l.vy.field_0._8_1_ = bVar57;
          }
LAB_0015f64a:
          pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + -0x30 + lVar75);
          *pfVar1 = fVar82;
          pfVar1[1] = local_198;
          pfVar1[2] = fVar83;
          pfVar1[3] = fVar125;
          pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + -0x20 + lVar75);
          *pfVar1 = (float)uVar58;
          pfVar1[1] = (float)uVar120;
          pfVar1[2] = fVar130;
          pfVar1[3] = fVar112;
          pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + -0x10 + lVar75);
          *pfVar1 = fVar81;
          pfVar1[1] = fVar102;
          pfVar1[2] = fVar103;
          pfVar1[3] = fVar106;
          pfVar1 = (float *)(local_168.l.vy.field_0._0_8_ + lVar75);
          *pfVar1 = fVar96;
          pfVar1[1] = fVar108;
          pfVar1[2] = fVar114;
          pfVar1[3] = fVar107;
          lVar75 = lVar75 + 0x40;
          uVar61 = local_168.l.vy.field_0._0_8_;
        }
      }
      convertGeometries(local_80,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                  *)local_168.p.field_0._8_8_,
                        (Ref<embree::SceneGraph::Node> *)(plVar59 + 0x13),
                        (Transformations *)local_178);
      SceneGraph::Transformations::~Transformations((Transformations *)local_178);
      (**(code **)(*plVar59 + 0x18))(plVar59);
    }
  }
  return;
}

Assistant:

void convertGeometries(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node, const SceneGraph::Transformations& spaces)
    {
      if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        convertGeometries(group,xfmNode->child, spaces*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
        for (size_t i = 0; i < xfmNode->spaces.size(); ++i)
          convertGeometries(group,xfmNode->child, spaces*xfmNode->spaces[i]);
      }
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertGeometries(group,child,spaces);
      }
      else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
        group.push_back(new SceneGraph::TriangleMeshNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) {
        group.push_back(new SceneGraph::QuadMeshNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::GridMeshNode> mesh = node.dynamicCast<SceneGraph::GridMeshNode>()) {
        group.push_back(new SceneGraph::GridMeshNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>()) {
        group.push_back(new SceneGraph::SubdivMeshNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) {
        group.push_back(new SceneGraph::HairSetNode(mesh,spaces));
      }
      else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>()) {
        group.push_back(new SceneGraph::PointSetNode(mesh,spaces));
      }
    }